

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  bool bVar72;
  undefined1 auVar73 [12];
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  byte bVar94;
  ulong uVar95;
  long lVar96;
  uint uVar97;
  long lVar98;
  ulong uVar99;
  ulong uVar100;
  bool bVar101;
  float fVar102;
  float fVar129;
  float fVar130;
  vint4 bi_2;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar132;
  undefined1 auVar118 [32];
  float fVar131;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar133;
  float fVar168;
  float fVar170;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar134;
  float fVar135;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar147 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar153 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar176;
  float fVar200;
  float fVar201;
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar185 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar191 [16];
  undefined1 auVar199 [32];
  float fVar207;
  float fVar220;
  float fVar221;
  vint4 ai_1;
  undefined1 auVar208 [16];
  float fVar222;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [28];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar223;
  float fVar239;
  float fVar241;
  vint4 ai_2;
  undefined1 auVar224 [16];
  float fVar242;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar240;
  float fVar244;
  float fVar245;
  undefined1 auVar234 [28];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar237 [32];
  float fVar243;
  undefined1 auVar238 [64];
  float fVar246;
  float fVar259;
  float fVar261;
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar247;
  float fVar260;
  float fVar262;
  float fVar264;
  undefined1 auVar254 [32];
  undefined1 auVar249 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar268;
  float fVar277;
  float fVar279;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar273 [32];
  float fVar278;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar289;
  float fVar303;
  float fVar304;
  vint4 ai;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar306;
  float fVar308;
  float fVar310;
  float fVar312;
  float fVar314;
  float fVar315;
  undefined1 auVar298 [32];
  float fVar305;
  float fVar307;
  float fVar309;
  float fVar311;
  float fVar313;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  float s;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar331 [16];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar370;
  undefined1 auVar368 [32];
  undefined1 auVar369 [64];
  float t;
  undefined1 auVar371 [16];
  float fVar375;
  undefined1 auVar372 [32];
  float fVar374;
  undefined1 auVar373 [64];
  float fVar376;
  float fVar377;
  float fVar382;
  float fVar384;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  float fVar383;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar396;
  float fVar406;
  float fVar410;
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  float fVar397;
  float fVar412;
  float fVar413;
  float fVar415;
  float fVar417;
  float fVar419;
  undefined1 auVar401 [32];
  float fVar407;
  float fVar411;
  float fVar414;
  float fVar416;
  float fVar418;
  float fVar420;
  undefined1 auVar402 [32];
  float fVar398;
  float fVar408;
  undefined1 auVar403 [32];
  float fVar409;
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float fVar421;
  float fVar425;
  float fVar426;
  undefined1 auVar422 [16];
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  float fVar432;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  undefined1 auVar433 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_bd1;
  float local_ba0;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  float local_ac8;
  float local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 *local_960;
  ulong local_958;
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [8];
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  ulong local_5c0;
  undefined1 auStack_5b8 [24];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar10 = prim[1];
  uVar100 = (ulong)(byte)PVar10;
  lVar96 = uVar100 * 0x25;
  auVar293 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar293 = vinsertps_avx(auVar293,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar133 = *(float *)(prim + lVar96 + 0x12);
  auVar293 = vsubps_avx(auVar293,*(undefined1 (*) [16])(prim + lVar96 + 6));
  auVar136._0_4_ = fVar133 * auVar293._0_4_;
  auVar136._4_4_ = fVar133 * auVar293._4_4_;
  auVar136._8_4_ = fVar133 * auVar293._8_4_;
  auVar136._12_4_ = fVar133 * auVar293._12_4_;
  auVar290._0_4_ = fVar133 * auVar16._0_4_;
  auVar290._4_4_ = fVar133 * auVar16._4_4_;
  auVar290._8_4_ = fVar133 * auVar16._8_4_;
  auVar290._12_4_ = fVar133 * auVar16._12_4_;
  auVar293 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 6)));
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xf + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar100 + 6)));
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x1a + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x1b + 6)));
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x1c + 6)));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vshufps_avx(auVar290,auVar290,0);
  auVar19 = vshufps_avx(auVar290,auVar290,0x55);
  auVar20 = vshufps_avx(auVar290,auVar290,0xaa);
  fVar133 = auVar20._0_4_;
  fVar135 = auVar20._4_4_;
  fVar169 = auVar20._8_4_;
  fVar171 = auVar20._12_4_;
  fVar223 = auVar19._0_4_;
  fVar239 = auVar19._4_4_;
  fVar241 = auVar19._8_4_;
  fVar242 = auVar19._12_4_;
  fVar207 = auVar18._0_4_;
  fVar220 = auVar18._4_4_;
  fVar221 = auVar18._8_4_;
  fVar222 = auVar18._12_4_;
  auVar378._0_4_ = fVar207 * auVar293._0_4_ + fVar223 * auVar16._0_4_ + fVar133 * auVar144._0_4_;
  auVar378._4_4_ = fVar220 * auVar293._4_4_ + fVar239 * auVar16._4_4_ + fVar135 * auVar144._4_4_;
  auVar378._8_4_ = fVar221 * auVar293._8_4_ + fVar241 * auVar16._8_4_ + fVar169 * auVar144._8_4_;
  auVar378._12_4_ = fVar222 * auVar293._12_4_ + fVar242 * auVar16._12_4_ + fVar171 * auVar144._12_4_
  ;
  auVar399._0_4_ = fVar207 * auVar141._0_4_ + fVar223 * auVar113._0_4_ + auVar112._0_4_ * fVar133;
  auVar399._4_4_ = fVar220 * auVar141._4_4_ + fVar239 * auVar113._4_4_ + auVar112._4_4_ * fVar135;
  auVar399._8_4_ = fVar221 * auVar141._8_4_ + fVar241 * auVar113._8_4_ + auVar112._8_4_ * fVar169;
  auVar399._12_4_ =
       fVar222 * auVar141._12_4_ + fVar242 * auVar113._12_4_ + auVar112._12_4_ * fVar171;
  auVar291._0_4_ = fVar207 * auVar187._0_4_ + fVar223 * auVar148._0_4_ + auVar17._0_4_ * fVar133;
  auVar291._4_4_ = fVar220 * auVar187._4_4_ + fVar239 * auVar148._4_4_ + auVar17._4_4_ * fVar135;
  auVar291._8_4_ = fVar221 * auVar187._8_4_ + fVar241 * auVar148._8_4_ + auVar17._8_4_ * fVar169;
  auVar291._12_4_ = fVar222 * auVar187._12_4_ + fVar242 * auVar148._12_4_ + auVar17._12_4_ * fVar171
  ;
  auVar18 = vshufps_avx(auVar136,auVar136,0);
  auVar19 = vshufps_avx(auVar136,auVar136,0x55);
  auVar20 = vshufps_avx(auVar136,auVar136,0xaa);
  fVar133 = auVar20._0_4_;
  fVar135 = auVar20._4_4_;
  fVar169 = auVar20._8_4_;
  fVar171 = auVar20._12_4_;
  fVar223 = auVar19._0_4_;
  fVar239 = auVar19._4_4_;
  fVar241 = auVar19._8_4_;
  fVar242 = auVar19._12_4_;
  fVar207 = auVar18._0_4_;
  fVar220 = auVar18._4_4_;
  fVar221 = auVar18._8_4_;
  fVar222 = auVar18._12_4_;
  auVar177._0_4_ = fVar207 * auVar293._0_4_ + fVar223 * auVar16._0_4_ + fVar133 * auVar144._0_4_;
  auVar177._4_4_ = fVar220 * auVar293._4_4_ + fVar239 * auVar16._4_4_ + fVar135 * auVar144._4_4_;
  auVar177._8_4_ = fVar221 * auVar293._8_4_ + fVar241 * auVar16._8_4_ + fVar169 * auVar144._8_4_;
  auVar177._12_4_ = fVar222 * auVar293._12_4_ + fVar242 * auVar16._12_4_ + fVar171 * auVar144._12_4_
  ;
  auVar137._0_4_ = fVar207 * auVar141._0_4_ + auVar112._0_4_ * fVar133 + fVar223 * auVar113._0_4_;
  auVar137._4_4_ = fVar220 * auVar141._4_4_ + auVar112._4_4_ * fVar135 + fVar239 * auVar113._4_4_;
  auVar137._8_4_ = fVar221 * auVar141._8_4_ + auVar112._8_4_ * fVar169 + fVar241 * auVar113._8_4_;
  auVar137._12_4_ =
       fVar222 * auVar141._12_4_ + auVar112._12_4_ * fVar171 + fVar242 * auVar113._12_4_;
  auVar103._0_4_ = fVar207 * auVar187._0_4_ + fVar223 * auVar148._0_4_ + auVar17._0_4_ * fVar133;
  auVar103._4_4_ = fVar220 * auVar187._4_4_ + fVar239 * auVar148._4_4_ + auVar17._4_4_ * fVar135;
  auVar103._8_4_ = fVar221 * auVar187._8_4_ + fVar241 * auVar148._8_4_ + auVar17._8_4_ * fVar169;
  auVar103._12_4_ = fVar222 * auVar187._12_4_ + fVar242 * auVar148._12_4_ + auVar17._12_4_ * fVar171
  ;
  auVar269._8_4_ = 0x7fffffff;
  auVar269._0_8_ = 0x7fffffff7fffffff;
  auVar269._12_4_ = 0x7fffffff;
  auVar293 = vandps_avx(auVar378,auVar269);
  auVar224._8_4_ = 0x219392ef;
  auVar224._0_8_ = 0x219392ef219392ef;
  auVar224._12_4_ = 0x219392ef;
  auVar293 = vcmpps_avx(auVar293,auVar224,1);
  auVar16 = vblendvps_avx(auVar378,auVar224,auVar293);
  auVar293 = vandps_avx(auVar399,auVar269);
  auVar293 = vcmpps_avx(auVar293,auVar224,1);
  auVar144 = vblendvps_avx(auVar399,auVar224,auVar293);
  auVar293 = vandps_avx(auVar291,auVar269);
  auVar293 = vcmpps_avx(auVar293,auVar224,1);
  auVar293 = vblendvps_avx(auVar291,auVar224,auVar293);
  auVar141 = vrcpps_avx(auVar16);
  fVar207 = auVar141._0_4_;
  auVar208._0_4_ = fVar207 * auVar16._0_4_;
  fVar220 = auVar141._4_4_;
  auVar208._4_4_ = fVar220 * auVar16._4_4_;
  fVar221 = auVar141._8_4_;
  auVar208._8_4_ = fVar221 * auVar16._8_4_;
  fVar222 = auVar141._12_4_;
  auVar208._12_4_ = fVar222 * auVar16._12_4_;
  auVar292._8_4_ = 0x3f800000;
  auVar292._0_8_ = &DAT_3f8000003f800000;
  auVar292._12_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar292,auVar208);
  fVar207 = fVar207 + fVar207 * auVar16._0_4_;
  fVar220 = fVar220 + fVar220 * auVar16._4_4_;
  fVar221 = fVar221 + fVar221 * auVar16._8_4_;
  fVar222 = fVar222 + fVar222 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar144);
  fVar223 = auVar16._0_4_;
  auVar248._0_4_ = fVar223 * auVar144._0_4_;
  fVar239 = auVar16._4_4_;
  auVar248._4_4_ = fVar239 * auVar144._4_4_;
  fVar241 = auVar16._8_4_;
  auVar248._8_4_ = fVar241 * auVar144._8_4_;
  fVar242 = auVar16._12_4_;
  auVar248._12_4_ = fVar242 * auVar144._12_4_;
  auVar16 = vsubps_avx(auVar292,auVar248);
  fVar223 = fVar223 + fVar223 * auVar16._0_4_;
  fVar239 = fVar239 + fVar239 * auVar16._4_4_;
  fVar241 = fVar241 + fVar241 * auVar16._8_4_;
  fVar242 = fVar242 + fVar242 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar293);
  fVar246 = auVar16._0_4_;
  auVar270._0_4_ = fVar246 * auVar293._0_4_;
  fVar259 = auVar16._4_4_;
  auVar270._4_4_ = fVar259 * auVar293._4_4_;
  fVar261 = auVar16._8_4_;
  auVar270._8_4_ = fVar261 * auVar293._8_4_;
  fVar263 = auVar16._12_4_;
  auVar270._12_4_ = fVar263 * auVar293._12_4_;
  auVar293 = vsubps_avx(auVar292,auVar270);
  fVar246 = fVar246 + fVar246 * auVar293._0_4_;
  fVar259 = fVar259 + fVar259 * auVar293._4_4_;
  fVar261 = fVar261 + fVar261 * auVar293._8_4_;
  fVar263 = fVar263 + fVar263 * auVar293._12_4_;
  auVar293 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar96 + 0x16)) *
                           *(float *)(prim + lVar96 + 0x1a)));
  auVar144 = vshufps_avx(auVar293,auVar293,0);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *(ulong *)(prim + uVar100 * 7 + 6);
  auVar293 = vpmovsxwd_avx(auVar293);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar100 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar293);
  fVar133 = auVar144._0_4_;
  fVar135 = auVar144._4_4_;
  fVar169 = auVar144._8_4_;
  fVar171 = auVar144._12_4_;
  auVar294._0_4_ = auVar16._0_4_ * fVar133 + auVar293._0_4_;
  auVar294._4_4_ = auVar16._4_4_ * fVar135 + auVar293._4_4_;
  auVar294._8_4_ = auVar16._8_4_ * fVar169 + auVar293._8_4_;
  auVar294._12_4_ = auVar16._12_4_ * fVar171 + auVar293._12_4_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar100 * 9 + 6);
  auVar293 = vpmovsxwd_avx(auVar144);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar100 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar141);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar293);
  auVar316._0_4_ = auVar16._0_4_ * fVar133 + auVar293._0_4_;
  auVar316._4_4_ = auVar16._4_4_ * fVar135 + auVar293._4_4_;
  auVar316._8_4_ = auVar16._8_4_ * fVar169 + auVar293._8_4_;
  auVar316._12_4_ = auVar16._12_4_ * fVar171 + auVar293._12_4_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar100 * 0x12 + 6);
  auVar293 = vpmovsxwd_avx(auVar113);
  auVar293 = vcvtdq2ps_avx(auVar293);
  uVar93 = (ulong)(uint)((int)(uVar100 * 5) << 2);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar100 * 2 + uVar93 + 6);
  auVar16 = vpmovsxwd_avx(auVar112);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar293);
  auVar331._0_4_ = auVar16._0_4_ * fVar133 + auVar293._0_4_;
  auVar331._4_4_ = auVar16._4_4_ * fVar135 + auVar293._4_4_;
  auVar331._8_4_ = auVar16._8_4_ * fVar169 + auVar293._8_4_;
  auVar331._12_4_ = auVar16._12_4_ * fVar171 + auVar293._12_4_;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar293 = vpmovsxwd_avx(auVar187);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar100 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar148);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar293);
  auVar365._0_4_ = auVar16._0_4_ * fVar133 + auVar293._0_4_;
  auVar365._4_4_ = auVar16._4_4_ * fVar135 + auVar293._4_4_;
  auVar365._8_4_ = auVar16._8_4_ * fVar169 + auVar293._8_4_;
  auVar365._12_4_ = auVar16._12_4_ * fVar171 + auVar293._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar100 * 0x1d + 6);
  auVar293 = vpmovsxwd_avx(auVar17);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar100 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar144 = vsubps_avx(auVar16,auVar293);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar100) + 6);
  auVar16 = vpmovsxwd_avx(auVar19);
  auVar371._0_4_ = auVar144._0_4_ * fVar133 + auVar293._0_4_;
  auVar371._4_4_ = auVar144._4_4_ * fVar135 + auVar293._4_4_;
  auVar371._8_4_ = auVar144._8_4_ * fVar169 + auVar293._8_4_;
  auVar371._12_4_ = auVar144._12_4_ * fVar171 + auVar293._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar100 * 0x23 + 6);
  auVar144 = vpmovsxwd_avx(auVar20);
  auVar293 = vcvtdq2ps_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar144);
  auVar16 = vsubps_avx(auVar16,auVar293);
  auVar271._0_4_ = auVar293._0_4_ + auVar16._0_4_ * fVar133;
  auVar271._4_4_ = auVar293._4_4_ + auVar16._4_4_ * fVar135;
  auVar271._8_4_ = auVar293._8_4_ + auVar16._8_4_ * fVar169;
  auVar271._12_4_ = auVar293._12_4_ + auVar16._12_4_ * fVar171;
  auVar293 = vsubps_avx(auVar294,auVar177);
  auVar295._0_4_ = fVar207 * auVar293._0_4_;
  auVar295._4_4_ = fVar220 * auVar293._4_4_;
  auVar295._8_4_ = fVar221 * auVar293._8_4_;
  auVar295._12_4_ = fVar222 * auVar293._12_4_;
  auVar293 = vsubps_avx(auVar316,auVar177);
  auVar178._0_4_ = fVar207 * auVar293._0_4_;
  auVar178._4_4_ = fVar220 * auVar293._4_4_;
  auVar178._8_4_ = fVar221 * auVar293._8_4_;
  auVar178._12_4_ = fVar222 * auVar293._12_4_;
  auVar293 = vsubps_avx(auVar331,auVar137);
  auVar209._0_4_ = fVar223 * auVar293._0_4_;
  auVar209._4_4_ = fVar239 * auVar293._4_4_;
  auVar209._8_4_ = fVar241 * auVar293._8_4_;
  auVar209._12_4_ = fVar242 * auVar293._12_4_;
  auVar293 = vsubps_avx(auVar365,auVar137);
  auVar138._0_4_ = fVar223 * auVar293._0_4_;
  auVar138._4_4_ = fVar239 * auVar293._4_4_;
  auVar138._8_4_ = fVar241 * auVar293._8_4_;
  auVar138._12_4_ = fVar242 * auVar293._12_4_;
  auVar293 = vsubps_avx(auVar371,auVar103);
  auVar225._0_4_ = fVar246 * auVar293._0_4_;
  auVar225._4_4_ = fVar259 * auVar293._4_4_;
  auVar225._8_4_ = fVar261 * auVar293._8_4_;
  auVar225._12_4_ = fVar263 * auVar293._12_4_;
  auVar293 = vsubps_avx(auVar271,auVar103);
  auVar104._0_4_ = fVar246 * auVar293._0_4_;
  auVar104._4_4_ = fVar259 * auVar293._4_4_;
  auVar104._8_4_ = fVar261 * auVar293._8_4_;
  auVar104._12_4_ = fVar263 * auVar293._12_4_;
  auVar293 = vpminsd_avx(auVar295,auVar178);
  auVar16 = vpminsd_avx(auVar209,auVar138);
  auVar293 = vmaxps_avx(auVar293,auVar16);
  auVar16 = vpminsd_avx(auVar225,auVar104);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar317._4_4_ = uVar8;
  auVar317._0_4_ = uVar8;
  auVar317._8_4_ = uVar8;
  auVar317._12_4_ = uVar8;
  auVar16 = vmaxps_avx(auVar16,auVar317);
  auVar293 = vmaxps_avx(auVar293,auVar16);
  local_490._0_4_ = auVar293._0_4_ * 0.99999964;
  local_490._4_4_ = auVar293._4_4_ * 0.99999964;
  local_490._8_4_ = auVar293._8_4_ * 0.99999964;
  local_490._12_4_ = auVar293._12_4_ * 0.99999964;
  auVar293 = vpmaxsd_avx(auVar295,auVar178);
  auVar16 = vpmaxsd_avx(auVar209,auVar138);
  auVar293 = vminps_avx(auVar293,auVar16);
  auVar16 = vpmaxsd_avx(auVar225,auVar104);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar179._4_4_ = uVar8;
  auVar179._0_4_ = uVar8;
  auVar179._8_4_ = uVar8;
  auVar179._12_4_ = uVar8;
  auVar16 = vminps_avx(auVar16,auVar179);
  auVar293 = vminps_avx(auVar293,auVar16);
  auVar105._0_4_ = auVar293._0_4_ * 1.0000004;
  auVar105._4_4_ = auVar293._4_4_ * 1.0000004;
  auVar105._8_4_ = auVar293._8_4_ * 1.0000004;
  auVar105._12_4_ = auVar293._12_4_ * 1.0000004;
  auVar293 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar16 = vpcmpgtd_avx(auVar293,_DAT_01ff0cf0);
  auVar293 = vcmpps_avx(local_490,auVar105,2);
  auVar293 = vandps_avx(auVar293,auVar16);
  uVar91 = vmovmskps_avx(auVar293);
  local_bd1 = uVar91 != 0;
  if (uVar91 == 0) {
    return local_bd1;
  }
  uVar91 = uVar91 & 0xff;
  auVar125._16_16_ = mm_lookupmask_ps._240_16_;
  auVar125._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar125,ZEXT832(0) << 0x20,0x80);
  local_960 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7f0 = prim;
LAB_010700f2:
  local_7e8 = (ulong)uVar91;
  lVar96 = 0;
  if (local_7e8 != 0) {
    for (; (uVar91 >> lVar96 & 1) == 0; lVar96 = lVar96 + 1) {
    }
  }
  uVar95 = (ulong)*(uint *)(local_7f0 + 2);
  pGVar11 = (context->scene->geometries).items[uVar95].ptr;
  uVar100 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                            (ulong)*(uint *)(local_7f0 + lVar96 * 4 + 6) *
                            pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar133 = (pGVar11->time_range).lower;
  fVar133 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar133) / ((pGVar11->time_range).upper - fVar133));
  auVar293 = vroundss_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),9);
  auVar293 = vminss_avx(auVar293,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar293 = vmaxss_avx(ZEXT816(0) << 0x20,auVar293);
  fVar133 = fVar133 - auVar293._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar98 = (long)(int)auVar293._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + lVar98);
  lVar14 = *(long *)(_Var12 + 0x10 + lVar98);
  auVar293 = vshufps_avx(ZEXT416((uint)(1.0 - fVar133)),ZEXT416((uint)(1.0 - fVar133)),0);
  pfVar1 = (float *)(lVar13 + lVar14 * uVar100);
  fVar207 = auVar293._0_4_;
  fVar220 = auVar293._4_4_;
  fVar221 = auVar293._8_4_;
  fVar222 = auVar293._12_4_;
  pfVar2 = (float *)(lVar13 + lVar14 * (uVar100 + 1));
  pfVar3 = (float *)(lVar13 + lVar14 * (uVar100 + 2));
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar100 + 3));
  lVar13 = *(long *)(_Var12 + 0x38 + lVar98);
  lVar14 = *(long *)(_Var12 + 0x48 + lVar98);
  auVar293 = vshufps_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),0);
  pfVar5 = (float *)(lVar13 + uVar100 * lVar14);
  fVar223 = auVar293._0_4_;
  fVar239 = auVar293._4_4_;
  fVar241 = auVar293._8_4_;
  fVar242 = auVar293._12_4_;
  pfVar6 = (float *)(lVar13 + (uVar100 + 1) * lVar14);
  pfVar7 = (float *)(lVar13 + (uVar100 + 2) * lVar14);
  auVar210._0_4_ = fVar223 * *pfVar5 + fVar207 * *pfVar1;
  auVar210._4_4_ = fVar239 * pfVar5[1] + fVar220 * pfVar1[1];
  auVar210._8_4_ = fVar241 * pfVar5[2] + fVar221 * pfVar1[2];
  auVar210._12_4_ = fVar242 * pfVar5[3] + fVar222 * pfVar1[3];
  auVar293 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar16 = vinsertps_avx(auVar293,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar133 = *(float *)(ray + k * 4 + 0x40);
  auVar379._4_4_ = fVar133;
  auVar379._0_4_ = fVar133;
  auVar379._8_4_ = fVar133;
  auVar379._12_4_ = fVar133;
  fStack_9f0 = fVar133;
  _local_a00 = auVar379;
  fStack_9ec = fVar133;
  fStack_9e8 = fVar133;
  fStack_9e4 = fVar133;
  fVar135 = *(float *)(ray + k * 4 + 0x50);
  auVar400._4_4_ = fVar135;
  auVar400._0_4_ = fVar135;
  auVar400._8_4_ = fVar135;
  auVar400._12_4_ = fVar135;
  fStack_850 = fVar135;
  _local_860 = auVar400;
  fStack_84c = fVar135;
  fStack_848 = fVar135;
  fStack_844 = fVar135;
  auVar180._0_4_ = fVar207 * *pfVar2 + fVar223 * *pfVar6;
  auVar180._4_4_ = fVar220 * pfVar2[1] + fVar239 * pfVar6[1];
  auVar180._8_4_ = fVar221 * pfVar2[2] + fVar241 * pfVar6[2];
  auVar180._12_4_ = fVar222 * pfVar2[3] + fVar242 * pfVar6[3];
  auVar293 = vunpcklps_avx(auVar379,auVar400);
  fVar169 = *(float *)(ray + k * 4 + 0x60);
  auVar422._4_4_ = fVar169;
  auVar422._0_4_ = fVar169;
  auVar422._8_4_ = fVar169;
  auVar422._12_4_ = fVar169;
  fStack_830 = fVar169;
  _local_840 = auVar422;
  fStack_82c = fVar169;
  fStack_828 = fVar169;
  fStack_824 = fVar169;
  _local_8d0 = vinsertps_avx(auVar293,auVar422,0x28);
  auVar106._0_4_ = (auVar210._0_4_ + auVar180._0_4_) * 0.5;
  auVar106._4_4_ = (auVar210._4_4_ + auVar180._4_4_) * 0.5;
  auVar106._8_4_ = (auVar210._8_4_ + auVar180._8_4_) * 0.5;
  auVar106._12_4_ = (auVar210._12_4_ + auVar180._12_4_) * 0.5;
  auVar293 = vsubps_avx(auVar106,auVar16);
  auVar293 = vdpps_avx(auVar293,_local_8d0,0x7f);
  local_8e0 = vdpps_avx(_local_8d0,_local_8d0,0x7f);
  auVar373 = ZEXT1664(local_8e0);
  auVar139._0_4_ = fVar207 * *pfVar3 + fVar223 * *pfVar7;
  auVar139._4_4_ = fVar220 * pfVar3[1] + fVar239 * pfVar7[1];
  auVar139._8_4_ = fVar221 * pfVar3[2] + fVar241 * pfVar7[2];
  auVar139._12_4_ = fVar222 * pfVar3[3] + fVar242 * pfVar7[3];
  auVar144 = vrcpss_avx(local_8e0,local_8e0);
  fVar171 = auVar293._0_4_ * auVar144._0_4_ * (2.0 - local_8e0._0_4_ * auVar144._0_4_);
  auVar144 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
  auVar272._0_4_ = auVar16._0_4_ + local_8d0._0_4_ * auVar144._0_4_;
  auVar272._4_4_ = auVar16._4_4_ + local_8d0._4_4_ * auVar144._4_4_;
  auVar272._8_4_ = auVar16._8_4_ + local_8d0._8_4_ * auVar144._8_4_;
  auVar272._12_4_ = auVar16._12_4_ + local_8d0._12_4_ * auVar144._12_4_;
  auVar293 = vblendps_avx(auVar272,_DAT_01feba10,8);
  _local_a10 = vsubps_avx(auVar210,auVar293);
  _local_a20 = vsubps_avx(auVar139,auVar293);
  auVar324 = ZEXT1664(_local_a20);
  pfVar1 = (float *)(lVar13 + lVar14 * (uVar100 + 3));
  auVar140._0_4_ = fVar207 * *pfVar4 + fVar223 * *pfVar1;
  auVar140._4_4_ = fVar220 * pfVar4[1] + fVar239 * pfVar1[1];
  auVar140._8_4_ = fVar221 * pfVar4[2] + fVar241 * pfVar1[2];
  auVar140._12_4_ = fVar222 * pfVar4[3] + fVar242 * pfVar1[3];
  auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  _local_a30 = vsubps_avx(auVar180,auVar293);
  _local_a40 = vsubps_avx(auVar140,auVar293);
  auVar293 = vshufps_avx(_local_a10,_local_a10,0);
  register0x00001250 = auVar293;
  _local_300 = auVar293;
  auVar293 = vshufps_avx(_local_a10,_local_a10,0x55);
  register0x00001250 = auVar293;
  _local_1a0 = auVar293;
  auVar293 = vshufps_avx(_local_a10,_local_a10,0xaa);
  register0x00001250 = auVar293;
  _local_1c0 = auVar293;
  auVar293 = vshufps_avx(_local_a10,_local_a10,0xff);
  register0x00001290 = auVar293;
  _local_1e0 = auVar293;
  auVar293 = vshufps_avx(_local_a30,_local_a30,0);
  register0x00001290 = auVar293;
  _local_320 = auVar293;
  auVar293 = vshufps_avx(_local_a30,_local_a30,0x55);
  register0x00001290 = auVar293;
  _local_340 = auVar293;
  auVar293 = vshufps_avx(_local_a30,_local_a30,0xaa);
  register0x00001290 = auVar293;
  _local_360 = auVar293;
  auVar293 = vshufps_avx(_local_a30,_local_a30,0xff);
  register0x00001290 = auVar293;
  _local_380 = auVar293;
  auVar293 = vshufps_avx(_local_a20,_local_a20,0);
  auVar16 = vshufps_avx(_local_a20,_local_a20,0x55);
  register0x00001290 = auVar16;
  _local_3a0 = auVar16;
  auVar16 = vshufps_avx(_local_a20,_local_a20,0xaa);
  register0x00001290 = auVar16;
  _local_3c0 = auVar16;
  auVar16 = vshufps_avx(_local_a20,_local_a20,0xff);
  register0x00001290 = auVar16;
  _local_3e0 = auVar16;
  auVar16 = vshufps_avx(_local_a40,_local_a40,0);
  local_7a0._16_16_ = auVar16;
  local_7a0._0_16_ = auVar16;
  auVar369 = ZEXT3264(local_7a0);
  auVar16 = vshufps_avx(_local_a40,_local_a40,0x55);
  auVar141 = vshufps_avx(_local_a40,_local_a40,0xaa);
  register0x00001290 = auVar141;
  _local_400 = auVar141;
  auVar141 = vshufps_avx(_local_a40,_local_a40,0xff);
  register0x00001290 = auVar141;
  _local_200 = auVar141;
  auVar141 = ZEXT416((uint)(fVar133 * fVar133 + fVar135 * fVar135 + fVar169 * fVar169));
  auVar141 = vshufps_avx(auVar141,auVar141,0);
  local_220._16_16_ = auVar141;
  local_220._0_16_ = auVar141;
  fVar133 = *(float *)(ray + k * 4 + 0x30);
  local_810 = ZEXT416((uint)fVar171);
  auVar141 = vshufps_avx(ZEXT416((uint)(fVar133 - fVar171)),ZEXT416((uint)(fVar133 - fVar171)),0);
  local_260._16_16_ = auVar141;
  local_260._0_16_ = auVar141;
  local_710 = vpshufd_avx(ZEXT416(*(uint *)(local_7f0 + 2)),0);
  local_720 = vpshufd_avx(ZEXT416(*(uint *)(local_7f0 + lVar96 * 4 + 6)),0);
  register0x00001210 = auVar144;
  _local_900 = auVar144;
  uVar93 = 0;
  uVar99 = 0;
  uVar100 = 1;
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_220,auVar118);
  auVar144 = vsqrtss_avx(local_8e0,local_8e0);
  local_ac4 = auVar144._0_4_;
  auVar144 = vsqrtss_avx(local_8e0,local_8e0);
  local_ac8 = auVar144._0_4_;
  local_800 = ZEXT816(0x3f80000000000000);
  local_958 = uVar95;
  do {
    auVar144 = vmovshdup_avx(local_800);
    fVar223 = auVar144._0_4_ - local_800._0_4_;
    auVar144 = vshufps_avx(local_800,local_800,0);
    local_920._16_16_ = auVar144;
    local_920._0_16_ = auVar144;
    auVar141 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
    local_880._16_16_ = auVar141;
    local_880._0_16_ = auVar141;
    fVar134 = auVar141._0_4_;
    fVar168 = auVar141._4_4_;
    fVar170 = auVar141._8_4_;
    fVar172 = auVar141._12_4_;
    fVar102 = auVar144._0_4_;
    auVar216._0_4_ = fVar102 + fVar134 * 0.0;
    fVar129 = auVar144._4_4_;
    auVar216._4_4_ = fVar129 + fVar168 * 0.14285715;
    fVar130 = auVar144._8_4_;
    auVar216._8_4_ = fVar130 + fVar170 * 0.2857143;
    fStack_b64 = auVar144._12_4_;
    auVar216._12_4_ = fStack_b64 + fVar172 * 0.42857146;
    auVar216._16_4_ = fVar102 + fVar134 * 0.5714286;
    auVar216._20_4_ = fVar129 + fVar168 * 0.71428573;
    auVar216._24_4_ = fVar130 + fVar170 * 0.8571429;
    auVar216._28_4_ = fStack_b64 + fVar172;
    auVar125 = vsubps_avx(auVar238._0_32_,auVar216);
    local_b80._4_4_ = auVar216._4_4_ * auVar216._4_4_;
    local_b80._0_4_ = auVar216._0_4_ * auVar216._0_4_;
    fStack_b78 = auVar216._8_4_ * auVar216._8_4_;
    fStack_b74 = auVar216._12_4_ * auVar216._12_4_;
    fStack_b70 = auVar216._16_4_ * auVar216._16_4_;
    fStack_b6c = auVar216._20_4_ * auVar216._20_4_;
    fStack_b68 = auVar216._24_4_ * auVar216._24_4_;
    fVar241 = auVar216._0_4_ * 3.0;
    fVar242 = auVar216._4_4_ * 3.0;
    fVar259 = auVar216._8_4_ * 3.0;
    fVar261 = auVar216._12_4_ * 3.0;
    fVar263 = auVar216._16_4_ * 3.0;
    fVar243 = auVar216._20_4_ * 3.0;
    fVar245 = auVar216._24_4_ * 3.0;
    fVar314 = auVar238._28_4_ + -5.0;
    fVar135 = auVar125._0_4_;
    auVar325._0_4_ = fVar135 * fVar135;
    fVar169 = auVar125._4_4_;
    auVar325._4_4_ = fVar169 * fVar169;
    fVar171 = auVar125._8_4_;
    auVar325._8_4_ = fVar171 * fVar171;
    fVar207 = auVar125._12_4_;
    auVar325._12_4_ = fVar207 * fVar207;
    fVar220 = auVar125._16_4_;
    auVar325._16_4_ = fVar220 * fVar220;
    fVar221 = auVar125._20_4_;
    auVar325._20_4_ = fVar221 * fVar221;
    fVar222 = auVar125._24_4_;
    auVar325._28_36_ = auVar324._28_36_;
    auVar325._24_4_ = fVar222 * fVar222;
    fVar239 = auVar125._28_4_;
    fVar246 = (auVar325._0_4_ * (fVar135 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar277 = (auVar325._4_4_ * (fVar169 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar279 = (auVar325._8_4_ * (fVar171 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar281 = (auVar325._12_4_ * (fVar207 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar283 = (auVar325._16_4_ * (fVar220 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar285 = (auVar325._20_4_ * (fVar221 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar287 = (auVar325._24_4_ * (fVar222 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar326 = -fVar135 * auVar216._0_4_ * auVar216._0_4_ * 0.5;
    fVar332 = -fVar169 * auVar216._4_4_ * auVar216._4_4_ * 0.5;
    fVar337 = -fVar171 * auVar216._8_4_ * auVar216._8_4_ * 0.5;
    fVar342 = -fVar207 * auVar216._12_4_ * auVar216._12_4_ * 0.5;
    fVar347 = -fVar220 * auVar216._16_4_ * auVar216._16_4_ * 0.5;
    fVar352 = -fVar221 * auVar216._20_4_ * auVar216._20_4_ * 0.5;
    fVar357 = -fVar222 * auVar216._24_4_ * auVar216._24_4_ * 0.5;
    fVar409 = auVar16._0_4_;
    fVar240 = auVar16._4_4_;
    fVar384 = auVar16._8_4_;
    fVar387 = auVar16._12_4_;
    fVar244 = auVar293._0_4_;
    fVar131 = auVar293._4_4_;
    fVar132 = auVar293._8_4_;
    fVar412 = auVar293._12_4_;
    fVar370 = auVar369._28_4_ + fVar412;
    fVar375 = auVar373._28_4_ + fVar412;
    fVar396 = (auVar216._0_4_ * auVar216._0_4_ * (fVar241 + -5.0) + 2.0) * 0.5;
    fVar406 = (auVar216._4_4_ * auVar216._4_4_ * (fVar242 + -5.0) + 2.0) * 0.5;
    fVar410 = (auVar216._8_4_ * auVar216._8_4_ * (fVar259 + -5.0) + 2.0) * 0.5;
    fVar413 = (auVar216._12_4_ * auVar216._12_4_ * (fVar261 + -5.0) + 2.0) * 0.5;
    fVar415 = (auVar216._16_4_ * auVar216._16_4_ * (fVar263 + -5.0) + 2.0) * 0.5;
    fVar417 = (auVar216._20_4_ * auVar216._20_4_ * (fVar243 + -5.0) + 2.0) * 0.5;
    fVar419 = (auVar216._24_4_ * auVar216._24_4_ * (fVar245 + -5.0) + 2.0) * 0.5;
    fVar376 = -auVar216._0_4_ * fVar135 * fVar135 * 0.5;
    fVar382 = -auVar216._4_4_ * fVar169 * fVar169 * 0.5;
    fVar385 = -auVar216._8_4_ * fVar171 * fVar171 * 0.5;
    fVar388 = -auVar216._12_4_ * fVar207 * fVar207 * 0.5;
    fVar390 = -auVar216._16_4_ * fVar220 * fVar220 * 0.5;
    fVar392 = -auVar216._20_4_ * fVar221 * fVar221 * 0.5;
    fVar394 = -auVar216._24_4_ * fVar222 * fVar222 * 0.5;
    fVar327 = fVar376 * (float)local_300._0_4_ +
              fVar396 * (float)local_320._0_4_ + auVar369._0_4_ * fVar326 + fVar244 * fVar246;
    fVar333 = fVar382 * (float)local_300._4_4_ +
              fVar406 * (float)local_320._4_4_ + auVar369._4_4_ * fVar332 + fVar131 * fVar277;
    fVar338 = fVar385 * fStack_2f8 +
              fVar410 * fStack_318 + auVar369._8_4_ * fVar337 + fVar132 * fVar279;
    fVar343 = fVar388 * fStack_2f4 +
              fVar413 * fStack_314 + auVar369._12_4_ * fVar342 + fVar412 * fVar281;
    fVar348 = fVar390 * fStack_2f0 +
              fVar415 * fStack_310 + auVar369._16_4_ * fVar347 + fVar244 * fVar283;
    fVar353 = fVar392 * fStack_2ec +
              fVar417 * fStack_30c + auVar369._20_4_ * fVar352 + fVar131 * fVar285;
    fVar358 = fVar394 * fStack_2e8 +
              fVar419 * fStack_308 + auVar369._24_4_ * fVar357 + fVar132 * fVar287;
    fVar362 = fVar412 + 2.0 + -fVar239 + fVar370;
    fVar328 = (float)local_1a0._0_4_ * fVar376 +
              fVar396 * (float)local_340._0_4_ +
              fVar409 * fVar326 + fVar246 * (float)local_3a0._0_4_;
    fVar334 = (float)local_1a0._4_4_ * fVar382 +
              fVar406 * (float)local_340._4_4_ +
              fVar240 * fVar332 + fVar277 * (float)local_3a0._4_4_;
    fVar339 = fStack_198 * fVar385 + fVar410 * fStack_338 + fVar384 * fVar337 + fVar279 * fStack_398
    ;
    fVar344 = fStack_194 * fVar388 + fVar413 * fStack_334 + fVar387 * fVar342 + fVar281 * fStack_394
    ;
    fVar349 = fStack_190 * fVar390 + fVar415 * fStack_330 + fVar409 * fVar347 + fVar283 * fStack_390
    ;
    fVar354 = fStack_18c * fVar392 + fVar417 * fStack_32c + fVar240 * fVar352 + fVar285 * fStack_38c
    ;
    fVar359 = fStack_188 * fVar394 + fVar419 * fStack_328 + fVar384 * fVar357 + fVar287 * fStack_388
    ;
    fVar363 = fVar362 + fVar370 + fVar375;
    fVar176 = (float)local_1c0._0_4_ * fVar376 +
              fVar396 * (float)local_360._0_4_ +
              fVar326 * (float)local_400._0_4_ + fVar246 * (float)local_3c0._0_4_;
    fVar200 = (float)local_1c0._4_4_ * fVar382 +
              fVar406 * (float)local_360._4_4_ +
              fVar332 * (float)local_400._4_4_ + fVar277 * (float)local_3c0._4_4_;
    fVar201 = fStack_1b8 * fVar385 +
              fVar410 * fStack_358 + fVar337 * fStack_3f8 + fVar279 * fStack_3b8;
    fVar202 = fStack_1b4 * fVar388 +
              fVar413 * fStack_354 + fVar342 * fStack_3f4 + fVar281 * fStack_3b4;
    fVar203 = fStack_1b0 * fVar390 +
              fVar415 * fStack_350 + fVar347 * fStack_3f0 + fVar283 * fStack_3b0;
    fVar204 = fStack_1ac * fVar392 +
              fVar417 * fStack_34c + fVar352 * fStack_3ec + fVar285 * fStack_3ac;
    fVar205 = fStack_1a8 * fVar394 +
              fVar419 * fStack_348 + fVar357 * fStack_3e8 + fVar287 * fStack_3a8;
    fVar206 = fVar363 + fVar375 + fVar387 + fVar412;
    local_8a0._0_4_ =
         (float)local_1e0._0_4_ * fVar376 +
         fVar396 * (float)local_380._0_4_ +
         fVar326 * (float)local_200._0_4_ + fVar246 * (float)local_3e0._0_4_;
    local_8a0._4_4_ =
         (float)local_1e0._4_4_ * fVar382 +
         fVar406 * (float)local_380._4_4_ +
         fVar332 * (float)local_200._4_4_ + fVar277 * (float)local_3e0._4_4_;
    local_8a0._8_4_ =
         fStack_1d8 * fVar385 + fVar410 * fStack_378 + fVar337 * fStack_1f8 + fVar279 * fStack_3d8;
    local_8a0._12_4_ =
         fStack_1d4 * fVar388 + fVar413 * fStack_374 + fVar342 * fStack_1f4 + fVar281 * fStack_3d4;
    local_8a0._16_4_ =
         fStack_1d0 * fVar390 + fVar415 * fStack_370 + fVar347 * fStack_1f0 + fVar283 * fStack_3d0;
    local_8a0._20_4_ =
         fStack_1cc * fVar392 + fVar417 * fStack_36c + fVar352 * fStack_1ec + fVar285 * fStack_3cc;
    local_8a0._24_4_ =
         fStack_1c8 * fVar394 + fVar419 * fStack_368 + fVar357 * fStack_1e8 + fVar287 * fStack_3c8;
    local_8a0._28_4_ = fVar363 + fVar412 + 2.0 + -fVar239 + -3.0;
    fVar364 = fVar239 + fVar239;
    auVar21._4_4_ = (fVar169 + fVar169) * auVar216._4_4_;
    auVar21._0_4_ = (fVar135 + fVar135) * auVar216._0_4_;
    auVar21._8_4_ = (fVar171 + fVar171) * auVar216._8_4_;
    auVar21._12_4_ = (fVar207 + fVar207) * auVar216._12_4_;
    auVar21._16_4_ = (fVar220 + fVar220) * auVar216._16_4_;
    auVar21._20_4_ = (fVar221 + fVar221) * auVar216._20_4_;
    auVar21._24_4_ = (fVar222 + fVar222) * auVar216._24_4_;
    auVar21._28_4_ = auVar216._28_4_ + auVar216._28_4_;
    auVar125 = vsubps_avx(auVar21,auVar325._0_32_);
    fVar326 = auVar238._28_4_ + 2.0;
    auVar256._4_4_ = (fVar169 + fVar169) * (fVar242 + 2.0);
    auVar256._0_4_ = (fVar135 + fVar135) * (fVar241 + 2.0);
    auVar256._8_4_ = (fVar171 + fVar171) * (fVar259 + 2.0);
    auVar256._12_4_ = (fVar207 + fVar207) * (fVar261 + 2.0);
    auVar256._16_4_ = (fVar220 + fVar220) * (fVar263 + 2.0);
    auVar256._20_4_ = (fVar221 + fVar221) * (fVar243 + 2.0);
    auVar256._24_4_ = (fVar222 + fVar222) * (fVar245 + 2.0);
    auVar256._28_4_ = fVar326;
    auVar276._4_4_ = fVar169 * fVar169 * 3.0;
    auVar276._0_4_ = fVar135 * fVar135 * 3.0;
    auVar276._8_4_ = fVar171 * fVar171 * 3.0;
    auVar276._12_4_ = fVar207 * fVar207 * 3.0;
    auVar276._16_4_ = fVar220 * fVar220 * 3.0;
    auVar276._20_4_ = fVar221 * fVar221 * 3.0;
    auVar276._24_4_ = fVar222 * fVar222 * 3.0;
    auVar276._28_4_ = fVar239;
    auVar118 = vsubps_avx(auVar256,auVar276);
    auVar21 = vsubps_avx(_local_b80,auVar21);
    fVar342 = auVar125._0_4_ * 0.5;
    fVar347 = auVar125._4_4_ * 0.5;
    fVar352 = auVar125._8_4_ * 0.5;
    fVar357 = auVar125._12_4_ * 0.5;
    fVar370 = auVar125._16_4_ * 0.5;
    fVar375 = auVar125._20_4_ * 0.5;
    fVar376 = auVar125._24_4_ * 0.5;
    fVar246 = (auVar216._0_4_ * fVar241 + (auVar216._0_4_ + auVar216._0_4_) * (fVar241 + -5.0)) *
              0.5;
    fVar281 = (auVar216._4_4_ * fVar242 + (auVar216._4_4_ + auVar216._4_4_) * (fVar242 + -5.0)) *
              0.5;
    fVar283 = (auVar216._8_4_ * fVar259 + (auVar216._8_4_ + auVar216._8_4_) * (fVar259 + -5.0)) *
              0.5;
    fVar285 = (auVar216._12_4_ * fVar261 + (auVar216._12_4_ + auVar216._12_4_) * (fVar261 + -5.0)) *
              0.5;
    fVar287 = (auVar216._16_4_ * fVar263 + (auVar216._16_4_ + auVar216._16_4_) * (fVar263 + -5.0)) *
              0.5;
    fVar332 = (auVar216._20_4_ * fVar243 + (auVar216._20_4_ + auVar216._20_4_) * (fVar243 + -5.0)) *
              0.5;
    fVar337 = (auVar216._24_4_ * fVar245 + (auVar216._24_4_ + auVar216._24_4_) * (fVar245 + -5.0)) *
              0.5;
    fVar135 = auVar118._0_4_ * 0.5;
    fVar169 = auVar118._4_4_ * 0.5;
    fVar171 = auVar118._8_4_ * 0.5;
    fVar207 = auVar118._12_4_ * 0.5;
    fVar220 = auVar118._16_4_ * 0.5;
    fVar239 = auVar118._20_4_ * 0.5;
    fVar241 = auVar118._24_4_ * 0.5;
    fVar221 = auVar21._0_4_ * 0.5;
    fVar222 = auVar21._4_4_ * 0.5;
    fVar242 = auVar21._8_4_ * 0.5;
    fVar261 = auVar21._12_4_ * 0.5;
    fVar263 = auVar21._16_4_ * 0.5;
    fVar243 = auVar21._20_4_ * 0.5;
    fVar245 = auVar21._24_4_ * 0.5;
    fVar315 = fVar364 + auVar125._28_4_ + fVar364 + fVar314;
    fVar326 = fVar326 + auVar216._28_4_ + fVar314 + auVar118._28_4_ + auVar21._28_4_;
    auVar144 = vpermilps_avx(ZEXT416((uint)(fVar223 * 0.04761905)),0);
    fVar277 = auVar144._0_4_;
    fVar289 = fVar277 * (fVar342 * (float)local_300._0_4_ +
                        fVar246 * (float)local_320._0_4_ +
                        fVar135 * fVar244 + auVar369._0_4_ * fVar221);
    fVar279 = auVar144._4_4_;
    fVar303 = fVar279 * (fVar347 * (float)local_300._4_4_ +
                        fVar281 * (float)local_320._4_4_ +
                        fVar169 * fVar131 + auVar369._4_4_ * fVar222);
    auVar320._4_4_ = fVar303;
    auVar320._0_4_ = fVar289;
    fVar314 = auVar144._8_4_;
    fVar304 = fVar314 * (fVar352 * fStack_2f8 +
                        fVar283 * fStack_318 + fVar171 * fVar132 + auVar369._8_4_ * fVar242);
    auVar320._8_4_ = fVar304;
    fVar259 = auVar144._12_4_;
    fVar306 = fVar259 * (fVar357 * fStack_2f4 +
                        fVar285 * fStack_314 + fVar207 * fVar412 + auVar369._12_4_ * fVar261);
    auVar320._12_4_ = fVar306;
    fVar308 = fVar277 * (fVar370 * fStack_2f0 +
                        fVar287 * fStack_310 + fVar220 * fVar244 + auVar369._16_4_ * fVar263);
    auVar320._16_4_ = fVar308;
    fVar310 = fVar279 * (fVar375 * fStack_2ec +
                        fVar332 * fStack_30c + fVar239 * fVar131 + auVar369._20_4_ * fVar243);
    auVar320._20_4_ = fVar310;
    fVar312 = fVar314 * (fVar376 * fStack_2e8 +
                        fVar337 * fStack_308 + fVar241 * fVar132 + auVar369._24_4_ * fVar245);
    auVar320._24_4_ = fVar312;
    auVar320._28_4_ = fVar315;
    fVar329 = fVar277 * ((float)local_1a0._0_4_ * fVar342 +
                        fVar246 * (float)local_340._0_4_ +
                        fVar135 * (float)local_3a0._0_4_ + fVar221 * fVar409);
    fVar335 = fVar279 * ((float)local_1a0._4_4_ * fVar347 +
                        fVar281 * (float)local_340._4_4_ +
                        fVar169 * (float)local_3a0._4_4_ + fVar222 * fVar240);
    local_8c0._4_4_ = fVar335;
    local_8c0._0_4_ = fVar329;
    fVar340 = fVar314 * (fStack_198 * fVar352 +
                        fVar283 * fStack_338 + fVar171 * fStack_398 + fVar242 * fVar384);
    local_8c0._8_4_ = fVar340;
    fVar345 = fVar259 * (fStack_194 * fVar357 +
                        fVar285 * fStack_334 + fVar207 * fStack_394 + fVar261 * fVar387);
    local_8c0._12_4_ = fVar345;
    fVar350 = fVar277 * (fStack_190 * fVar370 +
                        fVar287 * fStack_330 + fVar220 * fStack_390 + fVar263 * fVar409);
    local_8c0._16_4_ = fVar350;
    fVar355 = fVar279 * (fStack_18c * fVar375 +
                        fVar332 * fStack_32c + fVar239 * fStack_38c + fVar243 * fVar240);
    local_8c0._20_4_ = fVar355;
    fVar360 = fVar314 * (fStack_188 * fVar376 +
                        fVar337 * fStack_328 + fVar241 * fStack_388 + fVar245 * fVar384);
    local_8c0._24_4_ = fVar360;
    local_8c0._28_4_ = fVar364;
    fVar377 = fVar277 * ((float)local_1c0._0_4_ * fVar342 +
                        fVar135 * (float)local_3c0._0_4_ + fVar221 * (float)local_400._0_4_ +
                        fVar246 * (float)local_360._0_4_);
    fVar383 = fVar279 * ((float)local_1c0._4_4_ * fVar347 +
                        fVar169 * (float)local_3c0._4_4_ + fVar222 * (float)local_400._4_4_ +
                        fVar281 * (float)local_360._4_4_);
    auVar25._4_4_ = fVar383;
    auVar25._0_4_ = fVar377;
    fVar386 = fVar314 * (fStack_1b8 * fVar352 +
                        fVar171 * fStack_3b8 + fVar242 * fStack_3f8 + fVar283 * fStack_358);
    auVar25._8_4_ = fVar386;
    fVar389 = fVar259 * (fStack_1b4 * fVar357 +
                        fVar207 * fStack_3b4 + fVar261 * fStack_3f4 + fVar285 * fStack_354);
    auVar25._12_4_ = fVar389;
    fVar391 = fVar277 * (fStack_1b0 * fVar370 +
                        fVar220 * fStack_3b0 + fVar263 * fStack_3f0 + fVar287 * fStack_350);
    auVar25._16_4_ = fVar391;
    fVar393 = fVar279 * (fStack_1ac * fVar375 +
                        fVar239 * fStack_3ac + fVar243 * fStack_3ec + fVar332 * fStack_34c);
    auVar25._20_4_ = fVar393;
    fVar395 = fVar314 * (fStack_1a8 * fVar376 +
                        fVar241 * fStack_3a8 + fVar245 * fStack_3e8 + fVar337 * fStack_348);
    auVar25._24_4_ = fVar395;
    auVar25._28_4_ = -auVar216._28_4_;
    fVar221 = fVar277 * ((float)local_1e0._0_4_ * fVar342 +
                        fVar246 * (float)local_380._0_4_ +
                        fVar135 * (float)local_3e0._0_4_ + (float)local_200._0_4_ * fVar221);
    fVar222 = fVar279 * ((float)local_1e0._4_4_ * fVar347 +
                        fVar281 * (float)local_380._4_4_ +
                        fVar169 * (float)local_3e0._4_4_ + (float)local_200._4_4_ * fVar222);
    auVar22._4_4_ = fVar222;
    auVar22._0_4_ = fVar221;
    fVar246 = fVar314 * (fStack_1d8 * fVar352 +
                        fVar283 * fStack_378 + fVar171 * fStack_3d8 + fStack_1f8 * fVar242);
    auVar22._8_4_ = fVar246;
    fVar259 = fVar259 * (fStack_1d4 * fVar357 +
                        fVar285 * fStack_374 + fVar207 * fStack_3d4 + fStack_1f4 * fVar261);
    auVar22._12_4_ = fVar259;
    fVar277 = fVar277 * (fStack_1d0 * fVar370 +
                        fVar287 * fStack_370 + fVar220 * fStack_3d0 + fStack_1f0 * fVar263);
    auVar22._16_4_ = fVar277;
    fVar279 = fVar279 * (fStack_1cc * fVar375 +
                        fVar332 * fStack_36c + fVar239 * fStack_3cc + fStack_1ec * fVar243);
    auVar22._20_4_ = fVar279;
    fVar314 = fVar314 * (fStack_1c8 * fVar376 +
                        fVar337 * fStack_368 + fVar241 * fStack_3c8 + fStack_1e8 * fVar245);
    auVar22._24_4_ = fVar314;
    auVar22._28_4_ = fVar326;
    auVar80._4_4_ = fVar334;
    auVar80._0_4_ = fVar328;
    auVar80._8_4_ = fVar339;
    auVar80._12_4_ = fVar344;
    auVar80._16_4_ = fVar349;
    auVar80._20_4_ = fVar354;
    auVar80._24_4_ = fVar359;
    auVar80._28_4_ = fVar363;
    auVar125 = vperm2f128_avx(auVar80,auVar80,1);
    auVar125 = vshufps_avx(auVar125,auVar80,0x30);
    local_9c0 = vshufps_avx(auVar80,auVar125,0x29);
    auVar82._4_4_ = fVar200;
    auVar82._0_4_ = fVar176;
    auVar82._8_4_ = fVar201;
    auVar82._12_4_ = fVar202;
    auVar82._16_4_ = fVar203;
    auVar82._20_4_ = fVar204;
    auVar82._24_4_ = fVar205;
    auVar82._28_4_ = fVar206;
    auVar125 = vperm2f128_avx(auVar82,auVar82,1);
    auVar125 = vshufps_avx(auVar125,auVar82,0x30);
    _local_9e0 = vshufps_avx(auVar82,auVar125,0x29);
    auVar118 = vsubps_avx(local_8a0,auVar22);
    auVar125 = vperm2f128_avx(auVar118,auVar118,1);
    auVar125 = vshufps_avx(auVar125,auVar118,0x30);
    _local_760 = vshufps_avx(auVar118,auVar125,0x29);
    auVar21 = vsubps_avx(local_9c0,auVar80);
    auVar256 = vsubps_avx(_local_9e0,auVar82);
    fVar169 = auVar21._0_4_;
    fVar223 = auVar21._4_4_;
    auVar23._4_4_ = fVar383 * fVar223;
    auVar23._0_4_ = fVar377 * fVar169;
    fVar261 = auVar21._8_4_;
    auVar23._8_4_ = fVar386 * fVar261;
    fVar281 = auVar21._12_4_;
    auVar23._12_4_ = fVar389 * fVar281;
    fVar332 = auVar21._16_4_;
    auVar23._16_4_ = fVar391 * fVar332;
    fVar370 = auVar21._20_4_;
    auVar23._20_4_ = fVar393 * fVar370;
    fVar384 = auVar21._24_4_;
    auVar23._24_4_ = fVar395 * fVar384;
    auVar23._28_4_ = auVar118._28_4_;
    fVar171 = auVar256._0_4_;
    fVar239 = auVar256._4_4_;
    auVar319._4_4_ = fVar335 * fVar239;
    auVar319._0_4_ = fVar329 * fVar171;
    fVar263 = auVar256._8_4_;
    auVar319._8_4_ = fVar340 * fVar263;
    fVar283 = auVar256._12_4_;
    auVar319._12_4_ = fVar345 * fVar283;
    fVar337 = auVar256._16_4_;
    auVar319._16_4_ = fVar350 * fVar337;
    fVar375 = auVar256._20_4_;
    auVar319._20_4_ = fVar355 * fVar375;
    fVar385 = auVar256._24_4_;
    auVar319._24_4_ = fVar360 * fVar385;
    auVar319._28_4_ = auVar125._28_4_;
    auVar21 = vsubps_avx(auVar319,auVar23);
    auVar84._4_4_ = fVar333;
    auVar84._0_4_ = fVar327;
    auVar84._8_4_ = fVar338;
    auVar84._12_4_ = fVar343;
    auVar84._16_4_ = fVar348;
    auVar84._20_4_ = fVar353;
    auVar84._24_4_ = fVar358;
    auVar84._28_4_ = fVar362;
    auVar125 = vperm2f128_avx(auVar84,auVar84,1);
    auVar125 = vshufps_avx(auVar125,auVar84,0x30);
    auVar256 = vshufps_avx(auVar84,auVar125,0x29);
    auVar276 = vsubps_avx(auVar256,auVar84);
    auVar405._4_4_ = fVar239 * fVar303;
    auVar405._0_4_ = fVar171 * fVar289;
    auVar405._8_4_ = fVar263 * fVar304;
    auVar405._12_4_ = fVar283 * fVar306;
    auVar405._16_4_ = fVar337 * fVar308;
    auVar405._20_4_ = fVar375 * fVar310;
    auVar405._24_4_ = fVar385 * fVar312;
    auVar405._28_4_ = auVar256._28_4_;
    fVar207 = auVar276._0_4_;
    fVar241 = auVar276._4_4_;
    auVar24._4_4_ = fVar383 * fVar241;
    auVar24._0_4_ = fVar377 * fVar207;
    fVar243 = auVar276._8_4_;
    auVar24._8_4_ = fVar386 * fVar243;
    fVar285 = auVar276._12_4_;
    auVar24._12_4_ = fVar389 * fVar285;
    fVar342 = auVar276._16_4_;
    auVar24._16_4_ = fVar391 * fVar342;
    fVar376 = auVar276._20_4_;
    auVar24._20_4_ = fVar393 * fVar376;
    fVar388 = auVar276._24_4_;
    auVar24._24_4_ = fVar395 * fVar388;
    auVar24._28_4_ = local_9e0._28_4_;
    auVar22 = vsubps_avx(auVar24,auVar405);
    auVar26._4_4_ = fVar335 * fVar241;
    auVar26._0_4_ = fVar329 * fVar207;
    auVar26._8_4_ = fVar340 * fVar243;
    auVar26._12_4_ = fVar345 * fVar285;
    auVar26._16_4_ = fVar350 * fVar342;
    auVar26._20_4_ = fVar355 * fVar376;
    auVar26._24_4_ = fVar360 * fVar388;
    auVar26._28_4_ = local_9e0._28_4_;
    auVar27._4_4_ = fVar303 * fVar223;
    auVar27._0_4_ = fVar289 * fVar169;
    auVar27._8_4_ = fVar304 * fVar261;
    auVar27._12_4_ = fVar306 * fVar281;
    auVar27._16_4_ = fVar308 * fVar332;
    auVar27._20_4_ = fVar310 * fVar370;
    auVar27._24_4_ = fVar312 * fVar384;
    auVar27._28_4_ = fVar206;
    auVar23 = vsubps_avx(auVar27,auVar26);
    fVar135 = auVar23._28_4_;
    fVar352 = auVar22._28_4_ + fVar135;
    auVar217._0_4_ = fVar207 * fVar207 + fVar169 * fVar169 + fVar171 * fVar171;
    auVar217._4_4_ = fVar241 * fVar241 + fVar223 * fVar223 + fVar239 * fVar239;
    auVar217._8_4_ = fVar243 * fVar243 + fVar261 * fVar261 + fVar263 * fVar263;
    auVar217._12_4_ = fVar285 * fVar285 + fVar281 * fVar281 + fVar283 * fVar283;
    auVar217._16_4_ = fVar342 * fVar342 + fVar332 * fVar332 + fVar337 * fVar337;
    auVar217._20_4_ = fVar376 * fVar376 + fVar370 * fVar370 + fVar375 * fVar375;
    auVar217._24_4_ = fVar388 * fVar388 + fVar384 * fVar384 + fVar385 * fVar385;
    auVar217._28_4_ = fVar135 + fVar135 + fVar352;
    auVar125 = vrcpps_avx(auVar217);
    fVar357 = auVar125._0_4_;
    fVar240 = auVar125._4_4_;
    auVar28._4_4_ = fVar240 * auVar217._4_4_;
    auVar28._0_4_ = fVar357 * auVar217._0_4_;
    fVar382 = auVar125._8_4_;
    auVar28._8_4_ = fVar382 * auVar217._8_4_;
    fVar392 = auVar125._12_4_;
    auVar28._12_4_ = fVar392 * auVar217._12_4_;
    fVar394 = auVar125._16_4_;
    auVar28._16_4_ = fVar394 * auVar217._16_4_;
    fVar244 = auVar125._20_4_;
    auVar28._20_4_ = fVar244 * auVar217._20_4_;
    fVar396 = auVar125._24_4_;
    auVar28._24_4_ = fVar396 * auVar217._24_4_;
    auVar28._28_4_ = fVar206;
    auVar401._8_4_ = 0x3f800000;
    auVar401._0_8_ = &DAT_3f8000003f800000;
    auVar401._12_4_ = 0x3f800000;
    auVar401._16_4_ = 0x3f800000;
    auVar401._20_4_ = 0x3f800000;
    auVar401._24_4_ = 0x3f800000;
    auVar401._28_4_ = 0x3f800000;
    auVar319 = vsubps_avx(auVar401,auVar28);
    fVar357 = auVar319._0_4_ * fVar357 + fVar357;
    fVar240 = auVar319._4_4_ * fVar240 + fVar240;
    fVar382 = auVar319._8_4_ * fVar382 + fVar382;
    fVar392 = auVar319._12_4_ * fVar392 + fVar392;
    fVar394 = auVar319._16_4_ * fVar394 + fVar394;
    fVar244 = auVar319._20_4_ * fVar244 + fVar244;
    fVar396 = auVar319._24_4_ * fVar396 + fVar396;
    auVar118 = vperm2f128_avx(local_8c0,local_8c0,1);
    auVar118 = vshufps_avx(auVar118,local_8c0,0x30);
    local_a80 = vshufps_avx(local_8c0,auVar118,0x29);
    auVar118 = vperm2f128_avx(auVar25,auVar25,1);
    auVar118 = vshufps_avx(auVar118,auVar25,0x30);
    local_740 = vshufps_avx(auVar25,auVar118,0x29);
    fVar397 = local_740._0_4_;
    fVar407 = local_740._4_4_;
    auVar29._4_4_ = fVar407 * fVar223;
    auVar29._0_4_ = fVar397 * fVar169;
    fVar411 = local_740._8_4_;
    auVar29._8_4_ = fVar411 * fVar261;
    fVar414 = local_740._12_4_;
    auVar29._12_4_ = fVar414 * fVar281;
    fVar416 = local_740._16_4_;
    auVar29._16_4_ = fVar416 * fVar332;
    fVar418 = local_740._20_4_;
    auVar29._20_4_ = fVar418 * fVar370;
    fVar420 = local_740._24_4_;
    auVar29._24_4_ = fVar420 * fVar384;
    auVar29._28_4_ = auVar118._28_4_;
    fVar330 = local_a80._0_4_;
    fVar336 = local_a80._4_4_;
    auVar30._4_4_ = fVar336 * fVar239;
    auVar30._0_4_ = fVar330 * fVar171;
    fVar341 = local_a80._8_4_;
    auVar30._8_4_ = fVar341 * fVar263;
    fVar346 = local_a80._12_4_;
    auVar30._12_4_ = fVar346 * fVar283;
    fVar351 = local_a80._16_4_;
    auVar30._16_4_ = fVar351 * fVar337;
    fVar356 = local_a80._20_4_;
    auVar30._20_4_ = fVar356 * fVar375;
    fVar361 = local_a80._24_4_;
    auVar30._24_4_ = fVar361 * fVar385;
    auVar30._28_4_ = -auVar216._28_4_;
    auVar405 = vsubps_avx(auVar30,auVar29);
    auVar118 = vperm2f128_avx(auVar320,auVar320,1);
    auVar118 = vshufps_avx(auVar118,auVar320,0x30);
    local_aa0 = vshufps_avx(auVar320,auVar118,0x29);
    fVar220 = local_aa0._0_4_;
    fVar242 = local_aa0._4_4_;
    auVar31._4_4_ = fVar239 * fVar242;
    auVar31._0_4_ = fVar171 * fVar220;
    fVar245 = local_aa0._8_4_;
    auVar31._8_4_ = fVar263 * fVar245;
    fVar287 = local_aa0._12_4_;
    auVar31._12_4_ = fVar283 * fVar287;
    fVar347 = local_aa0._16_4_;
    auVar31._16_4_ = fVar337 * fVar347;
    fVar409 = local_aa0._20_4_;
    auVar31._20_4_ = fVar375 * fVar409;
    fVar390 = local_aa0._24_4_;
    auVar31._24_4_ = fVar385 * fVar390;
    auVar31._28_4_ = auVar118._28_4_;
    auVar32._4_4_ = fVar407 * fVar241;
    auVar32._0_4_ = fVar397 * fVar207;
    auVar32._8_4_ = fVar411 * fVar243;
    auVar32._12_4_ = fVar414 * fVar285;
    auVar32._16_4_ = fVar416 * fVar342;
    auVar32._20_4_ = fVar418 * fVar376;
    uVar91 = local_740._28_4_;
    auVar32._24_4_ = fVar420 * fVar388;
    auVar32._28_4_ = uVar91;
    auVar320 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ = fVar336 * fVar241;
    auVar33._0_4_ = fVar330 * fVar207;
    auVar33._8_4_ = fVar341 * fVar243;
    auVar33._12_4_ = fVar346 * fVar285;
    auVar33._16_4_ = fVar351 * fVar342;
    auVar33._20_4_ = fVar356 * fVar376;
    auVar33._24_4_ = fVar361 * fVar388;
    auVar33._28_4_ = uVar91;
    auVar34._4_4_ = fVar242 * fVar223;
    auVar34._0_4_ = fVar220 * fVar169;
    auVar34._8_4_ = fVar245 * fVar261;
    auVar34._12_4_ = fVar287 * fVar281;
    auVar34._16_4_ = fVar347 * fVar332;
    auVar34._20_4_ = fVar409 * fVar370;
    auVar34._24_4_ = fVar390 * fVar384;
    auVar34._28_4_ = fStack_1c4;
    auVar118 = vsubps_avx(auVar34,auVar33);
    fVar135 = auVar118._28_4_;
    auVar35._4_4_ =
         (auVar21._4_4_ * auVar21._4_4_ +
         auVar22._4_4_ * auVar22._4_4_ + auVar23._4_4_ * auVar23._4_4_) * fVar240;
    auVar35._0_4_ =
         (auVar21._0_4_ * auVar21._0_4_ +
         auVar22._0_4_ * auVar22._0_4_ + auVar23._0_4_ * auVar23._0_4_) * fVar357;
    auVar35._8_4_ =
         (auVar21._8_4_ * auVar21._8_4_ +
         auVar22._8_4_ * auVar22._8_4_ + auVar23._8_4_ * auVar23._8_4_) * fVar382;
    auVar35._12_4_ =
         (auVar21._12_4_ * auVar21._12_4_ +
         auVar22._12_4_ * auVar22._12_4_ + auVar23._12_4_ * auVar23._12_4_) * fVar392;
    auVar35._16_4_ =
         (auVar21._16_4_ * auVar21._16_4_ +
         auVar22._16_4_ * auVar22._16_4_ + auVar23._16_4_ * auVar23._16_4_) * fVar394;
    auVar35._20_4_ =
         (auVar21._20_4_ * auVar21._20_4_ +
         auVar22._20_4_ * auVar22._20_4_ + auVar23._20_4_ * auVar23._20_4_) * fVar244;
    auVar35._24_4_ =
         (auVar21._24_4_ * auVar21._24_4_ +
         auVar22._24_4_ * auVar22._24_4_ + auVar23._24_4_ * auVar23._24_4_) * fVar396;
    auVar35._28_4_ = auVar21._28_4_ + fVar352;
    auVar36._4_4_ =
         (auVar405._4_4_ * auVar405._4_4_ +
         auVar320._4_4_ * auVar320._4_4_ + auVar118._4_4_ * auVar118._4_4_) * fVar240;
    auVar36._0_4_ =
         (auVar405._0_4_ * auVar405._0_4_ +
         auVar320._0_4_ * auVar320._0_4_ + auVar118._0_4_ * auVar118._0_4_) * fVar357;
    auVar36._8_4_ =
         (auVar405._8_4_ * auVar405._8_4_ +
         auVar320._8_4_ * auVar320._8_4_ + auVar118._8_4_ * auVar118._8_4_) * fVar382;
    auVar36._12_4_ =
         (auVar405._12_4_ * auVar405._12_4_ +
         auVar320._12_4_ * auVar320._12_4_ + auVar118._12_4_ * auVar118._12_4_) * fVar392;
    auVar36._16_4_ =
         (auVar405._16_4_ * auVar405._16_4_ +
         auVar320._16_4_ * auVar320._16_4_ + auVar118._16_4_ * auVar118._16_4_) * fVar394;
    auVar36._20_4_ =
         (auVar405._20_4_ * auVar405._20_4_ +
         auVar320._20_4_ * auVar320._20_4_ + auVar118._20_4_ * auVar118._20_4_) * fVar244;
    auVar36._24_4_ =
         (auVar405._24_4_ * auVar405._24_4_ +
         auVar320._24_4_ * auVar320._24_4_ + auVar118._24_4_ * auVar118._24_4_) * fVar396;
    auVar36._28_4_ = auVar319._28_4_ + auVar125._28_4_;
    auVar125 = vmaxps_avx(auVar35,auVar36);
    auVar118 = vperm2f128_avx(local_8a0,local_8a0,1);
    auVar118 = vshufps_avx(auVar118,local_8a0,0x30);
    local_780 = vshufps_avx(local_8a0,auVar118,0x29);
    auVar154._0_4_ = (float)local_8a0._0_4_ + fVar221;
    auVar154._4_4_ = local_8a0._4_4_ + fVar222;
    auVar154._8_4_ = local_8a0._8_4_ + fVar246;
    auVar154._12_4_ = local_8a0._12_4_ + fVar259;
    auVar154._16_4_ = local_8a0._16_4_ + fVar277;
    auVar154._20_4_ = local_8a0._20_4_ + fVar279;
    auVar154._24_4_ = local_8a0._24_4_ + fVar314;
    auVar154._28_4_ = local_8a0._28_4_ + fVar326;
    auVar118 = vmaxps_avx(local_8a0,auVar154);
    auVar21 = vmaxps_avx(_local_760,local_780);
    auVar118 = vmaxps_avx(auVar118,auVar21);
    auVar21 = vrsqrtps_avx(auVar217);
    fVar221 = auVar21._0_4_;
    fVar222 = auVar21._4_4_;
    fVar246 = auVar21._8_4_;
    fVar259 = auVar21._12_4_;
    fVar277 = auVar21._16_4_;
    fVar279 = auVar21._20_4_;
    fVar314 = auVar21._24_4_;
    auVar37._4_4_ = fVar222 * fVar222 * fVar222 * auVar217._4_4_ * 0.5;
    auVar37._0_4_ = fVar221 * fVar221 * fVar221 * auVar217._0_4_ * 0.5;
    auVar37._8_4_ = fVar246 * fVar246 * fVar246 * auVar217._8_4_ * 0.5;
    auVar37._12_4_ = fVar259 * fVar259 * fVar259 * auVar217._12_4_ * 0.5;
    auVar37._16_4_ = fVar277 * fVar277 * fVar277 * auVar217._16_4_ * 0.5;
    auVar37._20_4_ = fVar279 * fVar279 * fVar279 * auVar217._20_4_ * 0.5;
    auVar37._24_4_ = fVar314 * fVar314 * fVar314 * auVar217._24_4_ * 0.5;
    auVar37._28_4_ = auVar217._28_4_;
    auVar38._4_4_ = fVar222 * 1.5;
    auVar38._0_4_ = fVar221 * 1.5;
    auVar38._8_4_ = fVar246 * 1.5;
    auVar38._12_4_ = fVar259 * 1.5;
    auVar38._16_4_ = fVar277 * 1.5;
    auVar38._20_4_ = fVar279 * 1.5;
    auVar38._24_4_ = fVar314 * 1.5;
    auVar38._28_4_ = auVar21._28_4_;
    local_460 = vsubps_avx(auVar38,auVar37);
    auVar81._4_4_ = fVar334;
    auVar81._0_4_ = fVar328;
    auVar81._8_4_ = fVar339;
    auVar81._12_4_ = fVar344;
    auVar81._16_4_ = fVar349;
    auVar81._20_4_ = fVar354;
    auVar81._24_4_ = fVar359;
    auVar81._28_4_ = fVar363;
    local_ac0 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    auVar83._4_4_ = fVar200;
    auVar83._0_4_ = fVar176;
    auVar83._8_4_ = fVar201;
    auVar83._12_4_ = fVar202;
    auVar83._16_4_ = fVar203;
    auVar83._20_4_ = fVar204;
    auVar83._24_4_ = fVar205;
    auVar83._28_4_ = fVar206;
    local_980 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
    fVar221 = local_980._0_4_;
    fVar246 = local_980._4_4_;
    fVar277 = local_980._8_4_;
    fVar314 = local_980._12_4_;
    fVar352 = local_980._16_4_;
    fVar240 = local_980._20_4_;
    fVar392 = local_980._24_4_;
    fVar222 = local_ac0._0_4_;
    fVar259 = local_ac0._4_4_;
    fVar279 = local_ac0._8_4_;
    fVar326 = local_ac0._12_4_;
    fVar357 = local_ac0._16_4_;
    fVar382 = local_ac0._20_4_;
    fVar394 = local_ac0._24_4_;
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar84);
    fVar432 = local_9a0._0_4_;
    fVar434 = local_9a0._4_4_;
    fVar435 = local_9a0._8_4_;
    fVar436 = local_9a0._12_4_;
    fVar437 = local_9a0._16_4_;
    fVar438 = local_9a0._20_4_;
    fVar439 = local_9a0._24_4_;
    auVar380._0_4_ =
         fVar432 * (float)local_a00._0_4_ +
         (float)local_860._0_4_ * fVar222 + (float)local_840._0_4_ * fVar221;
    auVar380._4_4_ =
         fVar434 * (float)local_a00._4_4_ +
         (float)local_860._4_4_ * fVar259 + (float)local_840._4_4_ * fVar246;
    auVar380._8_4_ = fVar435 * fStack_9f8 + fStack_858 * fVar279 + fStack_838 * fVar277;
    auVar380._12_4_ = fVar436 * fStack_9f4 + fStack_854 * fVar326 + fStack_834 * fVar314;
    auVar380._16_4_ = fVar437 * fStack_9f0 + fStack_850 * fVar357 + fStack_830 * fVar352;
    auVar380._20_4_ = fVar438 * fStack_9ec + fStack_84c * fVar382 + fStack_82c * fVar240;
    auVar380._24_4_ = fVar439 * fStack_9e8 + fStack_848 * fVar394 + fStack_828 * fVar392;
    auVar380._28_4_ = fVar135 + fVar135 + auVar320._28_4_ + fVar135;
    auVar402._0_4_ = fVar432 * fVar432 + fVar222 * fVar222 + fVar221 * fVar221;
    auVar402._4_4_ = fVar434 * fVar434 + fVar259 * fVar259 + fVar246 * fVar246;
    auVar402._8_4_ = fVar435 * fVar435 + fVar279 * fVar279 + fVar277 * fVar277;
    auVar402._12_4_ = fVar436 * fVar436 + fVar326 * fVar326 + fVar314 * fVar314;
    auVar402._16_4_ = fVar437 * fVar437 + fVar357 * fVar357 + fVar352 * fVar352;
    auVar402._20_4_ = fVar438 * fVar438 + fVar382 * fVar382 + fVar240 * fVar240;
    auVar402._24_4_ = fVar439 * fVar439 + fVar394 * fVar394 + fVar392 * fVar392;
    auVar402._28_4_ = fStack_1c4 + fStack_1c4 + fVar135;
    fVar247 = local_460._0_4_;
    fVar260 = local_460._4_4_;
    fVar262 = local_460._8_4_;
    fVar264 = local_460._12_4_;
    fVar265 = local_460._16_4_;
    fVar266 = local_460._20_4_;
    fVar267 = local_460._24_4_;
    fVar244 = (float)local_a00._0_4_ * fVar207 * fVar247 +
              fVar247 * fVar169 * (float)local_860._0_4_ +
              fVar171 * fVar247 * (float)local_840._0_4_;
    fVar396 = (float)local_a00._4_4_ * fVar241 * fVar260 +
              fVar260 * fVar223 * (float)local_860._4_4_ +
              fVar239 * fVar260 * (float)local_840._4_4_;
    fVar131 = fStack_9f8 * fVar243 * fVar262 +
              fVar262 * fVar261 * fStack_858 + fVar263 * fVar262 * fStack_838;
    fVar406 = fStack_9f4 * fVar285 * fVar264 +
              fVar264 * fVar281 * fStack_854 + fVar283 * fVar264 * fStack_834;
    fVar132 = fStack_9f0 * fVar342 * fVar265 +
              fVar265 * fVar332 * fStack_850 + fVar337 * fVar265 * fStack_830;
    fVar410 = fStack_9ec * fVar376 * fVar266 +
              fVar266 * fVar370 * fStack_84c + fVar375 * fVar266 * fStack_82c;
    fVar413 = fStack_9e8 * fVar388 * fVar267 +
              fVar267 * fVar384 * fStack_848 + fVar385 * fVar267 * fStack_828;
    fVar135 = fStack_9e4 + fStack_844 + fStack_824;
    fVar421 = fVar432 * fVar207 * fVar247 +
              fVar247 * fVar169 * fVar222 + fVar171 * fVar247 * fVar221;
    fVar425 = fVar434 * fVar241 * fVar260 +
              fVar260 * fVar223 * fVar259 + fVar239 * fVar260 * fVar246;
    fVar426 = fVar435 * fVar243 * fVar262 +
              fVar262 * fVar261 * fVar279 + fVar263 * fVar262 * fVar277;
    fVar427 = fVar436 * fVar285 * fVar264 +
              fVar264 * fVar281 * fVar326 + fVar283 * fVar264 * fVar314;
    fVar428 = fVar437 * fVar342 * fVar265 +
              fVar265 * fVar332 * fVar357 + fVar337 * fVar265 * fVar352;
    fVar429 = fVar438 * fVar376 * fVar266 +
              fVar266 * fVar370 * fVar382 + fVar375 * fVar266 * fVar240;
    fVar430 = fVar439 * fVar388 * fVar267 +
              fVar267 * fVar384 * fVar394 + fVar385 * fVar267 * fVar392;
    fVar431 = fStack_844 + fVar135;
    auVar39._4_4_ = fVar425 * fVar396;
    auVar39._0_4_ = fVar421 * fVar244;
    auVar39._8_4_ = fVar426 * fVar131;
    auVar39._12_4_ = fVar427 * fVar406;
    auVar39._16_4_ = fVar428 * fVar132;
    auVar39._20_4_ = fVar429 * fVar410;
    auVar39._24_4_ = fVar430 * fVar413;
    auVar39._28_4_ = fVar135;
    auVar22 = vsubps_avx(auVar380,auVar39);
    auVar40._4_4_ = fVar425 * fVar425;
    auVar40._0_4_ = fVar421 * fVar421;
    auVar40._8_4_ = fVar426 * fVar426;
    auVar40._12_4_ = fVar427 * fVar427;
    auVar40._16_4_ = fVar428 * fVar428;
    auVar40._20_4_ = fVar429 * fVar429;
    auVar40._24_4_ = fVar430 * fVar430;
    auVar40._28_4_ = fStack_844;
    auVar23 = vsubps_avx(auVar402,auVar40);
    auVar21 = vsqrtps_avx(auVar125);
    fVar135 = (auVar21._0_4_ + auVar118._0_4_) * 1.0000002;
    fVar415 = (auVar21._4_4_ + auVar118._4_4_) * 1.0000002;
    fVar417 = (auVar21._8_4_ + auVar118._8_4_) * 1.0000002;
    fVar419 = (auVar21._12_4_ + auVar118._12_4_) * 1.0000002;
    fVar173 = (auVar21._16_4_ + auVar118._16_4_) * 1.0000002;
    fVar174 = (auVar21._20_4_ + auVar118._20_4_) * 1.0000002;
    fVar175 = (auVar21._24_4_ + auVar118._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar415 * fVar415;
    auVar41._0_4_ = fVar135 * fVar135;
    auVar41._8_4_ = fVar417 * fVar417;
    auVar41._12_4_ = fVar419 * fVar419;
    auVar41._16_4_ = fVar173 * fVar173;
    auVar41._20_4_ = fVar174 * fVar174;
    auVar41._24_4_ = fVar175 * fVar175;
    auVar41._28_4_ = auVar21._28_4_ + auVar118._28_4_;
    fVar398 = auVar22._0_4_ + auVar22._0_4_;
    fVar408 = auVar22._4_4_ + auVar22._4_4_;
    local_240._0_8_ = CONCAT44(fVar408,fVar398);
    local_240._8_4_ = auVar22._8_4_ + auVar22._8_4_;
    local_240._12_4_ = auVar22._12_4_ + auVar22._12_4_;
    local_240._16_4_ = auVar22._16_4_ + auVar22._16_4_;
    local_240._20_4_ = auVar22._20_4_ + auVar22._20_4_;
    local_240._24_4_ = auVar22._24_4_ + auVar22._24_4_;
    local_240._28_4_ = auVar22._28_4_ + auVar22._28_4_;
    auVar118 = vsubps_avx(auVar23,auVar41);
    auVar42._4_4_ = fVar396 * fVar396;
    auVar42._0_4_ = fVar244 * fVar244;
    auVar42._8_4_ = fVar131 * fVar131;
    auVar42._12_4_ = fVar406 * fVar406;
    auVar42._16_4_ = fVar132 * fVar132;
    auVar42._20_4_ = fVar410 * fVar410;
    auVar42._24_4_ = fVar413 * fVar413;
    auVar42._28_4_ = auVar276._28_4_;
    auVar324 = ZEXT3264(auVar42);
    local_480 = vsubps_avx(local_220,auVar42);
    auVar373 = ZEXT3264(local_480);
    auVar43._4_4_ = fVar408 * fVar408;
    auVar43._0_4_ = fVar398 * fVar398;
    auVar43._8_4_ = local_240._8_4_ * local_240._8_4_;
    auVar43._12_4_ = local_240._12_4_ * local_240._12_4_;
    auVar43._16_4_ = local_240._16_4_ * local_240._16_4_;
    auVar43._20_4_ = local_240._20_4_ * local_240._20_4_;
    auVar43._24_4_ = local_240._24_4_ * local_240._24_4_;
    auVar43._28_4_ = local_220._28_4_;
    fVar415 = local_480._0_4_;
    fVar417 = local_480._4_4_;
    fVar419 = local_480._8_4_;
    fVar173 = local_480._12_4_;
    fVar174 = local_480._16_4_;
    fVar175 = local_480._20_4_;
    fVar374 = local_480._24_4_;
    auVar44._4_4_ = fVar417 * 4.0 * auVar118._4_4_;
    auVar44._0_4_ = fVar415 * 4.0 * auVar118._0_4_;
    auVar44._8_4_ = fVar419 * 4.0 * auVar118._8_4_;
    auVar44._12_4_ = fVar173 * 4.0 * auVar118._12_4_;
    auVar44._16_4_ = fVar174 * 4.0 * auVar118._16_4_;
    auVar44._20_4_ = fVar175 * 4.0 * auVar118._20_4_;
    auVar44._24_4_ = fVar374 * 4.0 * auVar118._24_4_;
    auVar44._28_4_ = 0x40800000;
    auVar22 = vsubps_avx(auVar43,auVar44);
    auVar125 = vcmpps_avx(auVar22,ZEXT432(0) << 0x20,5);
    fVar135 = local_480._28_4_;
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0x7f,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar125 >> 0xbf,0) == '\0') &&
        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar125[0x1f])
    {
      auVar119._8_4_ = 0x7f800000;
      auVar119._0_8_ = 0x7f8000007f800000;
      auVar119._12_4_ = 0x7f800000;
      auVar119._16_4_ = 0x7f800000;
      auVar119._20_4_ = 0x7f800000;
      auVar119._24_4_ = 0x7f800000;
      auVar119._28_4_ = 0x7f800000;
      auVar423._8_4_ = 0xff800000;
      auVar423._0_8_ = 0xff800000ff800000;
      auVar423._12_4_ = 0xff800000;
      auVar423._16_4_ = 0xff800000;
      auVar423._20_4_ = 0xff800000;
      auVar423._24_4_ = 0xff800000;
      auVar423._28_4_ = 0xff800000;
    }
    else {
      auVar320 = vsqrtps_avx(auVar22);
      auVar273._0_4_ = fVar415 + fVar415;
      auVar273._4_4_ = fVar417 + fVar417;
      auVar273._8_4_ = fVar419 + fVar419;
      auVar273._12_4_ = fVar173 + fVar173;
      auVar273._16_4_ = fVar174 + fVar174;
      auVar273._20_4_ = fVar175 + fVar175;
      auVar273._24_4_ = fVar374 + fVar374;
      auVar273._28_4_ = fVar135 + fVar135;
      auVar405 = vrcpps_avx(auVar273);
      auVar319 = vcmpps_avx(auVar22,ZEXT432(0) << 0x20,5);
      fVar268 = auVar405._0_4_;
      fVar278 = auVar405._4_4_;
      auVar45._4_4_ = auVar273._4_4_ * fVar278;
      auVar45._0_4_ = auVar273._0_4_ * fVar268;
      fVar280 = auVar405._8_4_;
      auVar45._8_4_ = auVar273._8_4_ * fVar280;
      fVar282 = auVar405._12_4_;
      auVar45._12_4_ = auVar273._12_4_ * fVar282;
      fVar284 = auVar405._16_4_;
      auVar45._16_4_ = auVar273._16_4_ * fVar284;
      fVar286 = auVar405._20_4_;
      auVar45._20_4_ = auVar273._20_4_ * fVar286;
      fVar288 = auVar405._24_4_;
      auVar45._24_4_ = auVar273._24_4_ * fVar288;
      auVar45._28_4_ = auVar273._28_4_;
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = &DAT_3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar120._16_4_ = 0x3f800000;
      auVar120._20_4_ = 0x3f800000;
      auVar120._24_4_ = 0x3f800000;
      auVar120._28_4_ = 0x3f800000;
      auVar22 = vsubps_avx(auVar120,auVar45);
      fVar268 = fVar268 + fVar268 * auVar22._0_4_;
      fVar278 = fVar278 + fVar278 * auVar22._4_4_;
      fVar280 = fVar280 + fVar280 * auVar22._8_4_;
      fVar282 = fVar282 + fVar282 * auVar22._12_4_;
      fVar284 = fVar284 + fVar284 * auVar22._16_4_;
      fVar286 = fVar286 + fVar286 * auVar22._20_4_;
      fVar288 = fVar288 + fVar288 * auVar22._24_4_;
      auVar298._0_8_ = CONCAT44(fVar408,fVar398) ^ 0x8000000080000000;
      auVar298._8_4_ = -local_240._8_4_;
      auVar298._12_4_ = -local_240._12_4_;
      auVar298._16_4_ = -local_240._16_4_;
      auVar298._20_4_ = -local_240._20_4_;
      auVar298._24_4_ = -local_240._24_4_;
      auVar298._28_4_ = -local_240._28_4_;
      auVar24 = vsubps_avx(auVar298,auVar320);
      fVar398 = auVar24._0_4_ * fVar268;
      fVar408 = auVar24._4_4_ * fVar278;
      auVar46._4_4_ = fVar408;
      auVar46._0_4_ = fVar398;
      fVar305 = auVar24._8_4_ * fVar280;
      auVar46._8_4_ = fVar305;
      fVar307 = auVar24._12_4_ * fVar282;
      auVar46._12_4_ = fVar307;
      fVar309 = auVar24._16_4_ * fVar284;
      auVar46._16_4_ = fVar309;
      fVar311 = auVar24._20_4_ * fVar286;
      auVar46._20_4_ = fVar311;
      fVar313 = auVar24._24_4_ * fVar288;
      auVar46._24_4_ = fVar313;
      auVar46._28_4_ = auVar24._28_4_;
      auVar320 = vsubps_avx(auVar320,local_240);
      fVar268 = auVar320._0_4_ * fVar268;
      fVar278 = auVar320._4_4_ * fVar278;
      auVar47._4_4_ = fVar278;
      auVar47._0_4_ = fVar268;
      fVar280 = auVar320._8_4_ * fVar280;
      auVar47._8_4_ = fVar280;
      fVar282 = auVar320._12_4_ * fVar282;
      auVar47._12_4_ = fVar282;
      fVar284 = auVar320._16_4_ * fVar284;
      auVar47._16_4_ = fVar284;
      fVar286 = auVar320._20_4_ * fVar286;
      auVar47._20_4_ = fVar286;
      fVar288 = auVar320._24_4_ * fVar288;
      auVar47._24_4_ = fVar288;
      auVar47._28_4_ = auVar320._28_4_;
      fStack_4a4 = fVar431 + auVar405._28_4_ + auVar22._28_4_;
      local_4c0[0] = fVar247 * (fVar421 + fVar244 * fVar398);
      local_4c0[1] = fVar260 * (fVar425 + fVar396 * fVar408);
      local_4c0[2] = fVar262 * (fVar426 + fVar131 * fVar305);
      local_4c0[3] = fVar264 * (fVar427 + fVar406 * fVar307);
      fStack_4b0 = fVar265 * (fVar428 + fVar132 * fVar309);
      fStack_4ac = fVar266 * (fVar429 + fVar410 * fVar311);
      fStack_4a8 = fVar267 * (fVar430 + fVar413 * fVar313);
      local_4e0[0] = fVar247 * (fVar421 + fVar244 * fVar268);
      local_4e0[1] = fVar260 * (fVar425 + fVar396 * fVar278);
      local_4e0[2] = fVar262 * (fVar426 + fVar131 * fVar280);
      local_4e0[3] = fVar264 * (fVar427 + fVar406 * fVar282);
      fStack_4d0 = fVar265 * (fVar428 + fVar132 * fVar284);
      fStack_4cc = fVar266 * (fVar429 + fVar410 * fVar286);
      fStack_4c8 = fVar267 * (fVar430 + fVar413 * fVar288);
      fStack_4c4 = fVar431 + fStack_4a4;
      auVar274._8_4_ = 0x7f800000;
      auVar274._0_8_ = 0x7f8000007f800000;
      auVar274._12_4_ = 0x7f800000;
      auVar274._16_4_ = 0x7f800000;
      auVar274._20_4_ = 0x7f800000;
      auVar274._24_4_ = 0x7f800000;
      auVar274._28_4_ = 0x7f800000;
      auVar119 = vblendvps_avx(auVar274,auVar46,auVar319);
      auVar299._8_4_ = 0x7fffffff;
      auVar299._0_8_ = 0x7fffffff7fffffff;
      auVar299._12_4_ = 0x7fffffff;
      auVar299._16_4_ = 0x7fffffff;
      auVar299._20_4_ = 0x7fffffff;
      auVar299._24_4_ = 0x7fffffff;
      auVar299._28_4_ = 0x7fffffff;
      auVar22 = vandps_avx(auVar42,auVar299);
      auVar22 = vmaxps_avx(local_440,auVar22);
      auVar324 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar48._4_4_ = auVar22._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar22._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar22._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar22._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar22._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar22._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar22._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar22._28_4_;
      auVar22 = vandps_avx(local_480,auVar299);
      auVar22 = vcmpps_avx(auVar22,auVar48,1);
      auVar275._8_4_ = 0xff800000;
      auVar275._0_8_ = 0xff800000ff800000;
      auVar275._12_4_ = 0xff800000;
      auVar275._16_4_ = 0xff800000;
      auVar275._20_4_ = 0xff800000;
      auVar275._24_4_ = 0xff800000;
      auVar275._28_4_ = 0xff800000;
      auVar423 = vblendvps_avx(auVar275,auVar47,auVar319);
      auVar405 = auVar319 & auVar22;
      if ((((((((auVar405 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar405 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar405 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar405 >> 0x7f,0) != '\0') ||
            (auVar405 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar405 >> 0xbf,0) != '\0') ||
          (auVar405 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar405[0x1f] < '\0') {
        auVar125 = vandps_avx(auVar22,auVar319);
        auVar144 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar73 = ZEXT812(0);
        auVar324 = ZEXT1264(auVar73) << 0x20;
        auVar22 = vcmpps_avx(auVar118,ZEXT1232(auVar73) << 0x20,2);
        auVar368._8_4_ = 0xff800000;
        auVar368._0_8_ = 0xff800000ff800000;
        auVar368._12_4_ = 0xff800000;
        auVar368._16_4_ = 0xff800000;
        auVar368._20_4_ = 0xff800000;
        auVar368._24_4_ = 0xff800000;
        auVar368._28_4_ = 0xff800000;
        auVar404._8_4_ = 0x7f800000;
        auVar404._0_8_ = 0x7f8000007f800000;
        auVar404._12_4_ = 0x7f800000;
        auVar404._16_4_ = 0x7f800000;
        auVar404._20_4_ = 0x7f800000;
        auVar404._24_4_ = 0x7f800000;
        auVar404._28_4_ = 0x7f800000;
        auVar118 = vblendvps_avx(auVar404,auVar368,auVar22);
        auVar141 = vpmovsxwd_avx(auVar144);
        auVar144 = vpunpckhwd_avx(auVar144,auVar144);
        auVar258._16_16_ = auVar144;
        auVar258._0_16_ = auVar141;
        auVar119 = vblendvps_avx(auVar119,auVar118,auVar258);
        auVar118 = vblendvps_avx(auVar368,auVar404,auVar22);
        auVar423 = vblendvps_avx(auVar423,auVar118,auVar258);
        auVar118 = vcmpps_avx(ZEXT1232(auVar73) << 0x20,ZEXT1232(auVar73) << 0x20,0xf);
        auVar166._0_4_ = auVar125._0_4_ ^ auVar118._0_4_;
        auVar166._4_4_ = auVar125._4_4_ ^ auVar118._4_4_;
        auVar166._8_4_ = auVar125._8_4_ ^ auVar118._8_4_;
        auVar166._12_4_ = auVar125._12_4_ ^ auVar118._12_4_;
        auVar166._16_4_ = auVar125._16_4_ ^ auVar118._16_4_;
        auVar166._20_4_ = auVar125._20_4_ ^ auVar118._20_4_;
        auVar166._24_4_ = auVar125._24_4_ ^ auVar118._24_4_;
        auVar166._28_4_ = auVar125._28_4_ ^ auVar118._28_4_;
        auVar125 = vorps_avx(auVar22,auVar166);
        auVar125 = vandps_avx(auVar319,auVar125);
      }
    }
    auVar118 = local_420 & auVar125;
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar118 >> 0x7f,0) == '\0') &&
          (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar118 >> 0xbf,0) == '\0') &&
        (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar118[0x1f])
    {
LAB_01070cdd:
      auVar369 = ZEXT3264(local_7a0);
      auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      auVar144 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_810._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_810._0_4_)),0);
      auVar192._16_16_ = auVar144;
      auVar192._0_16_ = auVar144;
      auVar405 = vminps_avx(auVar192,auVar423);
      fVar284 = local_ac0._28_4_;
      auVar121._0_4_ =
           (float)local_a00._0_4_ * fVar289 +
           (float)local_860._0_4_ * fVar329 + (float)local_840._0_4_ * fVar377;
      auVar121._4_4_ =
           (float)local_a00._4_4_ * fVar303 +
           (float)local_860._4_4_ * fVar335 + (float)local_840._4_4_ * fVar383;
      auVar121._8_4_ = fStack_9f8 * fVar304 + fStack_858 * fVar340 + fStack_838 * fVar386;
      auVar121._12_4_ = fStack_9f4 * fVar306 + fStack_854 * fVar345 + fStack_834 * fVar389;
      auVar121._16_4_ = fStack_9f0 * fVar308 + fStack_850 * fVar350 + fStack_830 * fVar391;
      auVar121._20_4_ = fStack_9ec * fVar310 + fStack_84c * fVar355 + fStack_82c * fVar393;
      auVar121._24_4_ = fStack_9e8 * fVar312 + fStack_848 * fVar360 + fStack_828 * fVar395;
      auVar121._28_4_ = fVar315 + fVar364 + fVar284;
      auVar118 = vrcpps_avx(auVar121);
      fVar315 = auVar118._0_4_;
      fVar398 = auVar118._4_4_;
      auVar49._4_4_ = auVar121._4_4_ * fVar398;
      auVar49._0_4_ = auVar121._0_4_ * fVar315;
      fVar408 = auVar118._8_4_;
      auVar49._8_4_ = auVar121._8_4_ * fVar408;
      fVar268 = auVar118._12_4_;
      auVar49._12_4_ = auVar121._12_4_ * fVar268;
      fVar278 = auVar118._16_4_;
      auVar49._16_4_ = auVar121._16_4_ * fVar278;
      fVar280 = auVar118._20_4_;
      auVar49._20_4_ = auVar121._20_4_ * fVar280;
      fVar282 = auVar118._24_4_;
      auVar49._24_4_ = auVar121._24_4_ * fVar282;
      auVar49._28_4_ = fVar364;
      auVar318._8_4_ = 0x3f800000;
      auVar318._0_8_ = &DAT_3f8000003f800000;
      auVar318._12_4_ = 0x3f800000;
      auVar318._16_4_ = 0x3f800000;
      auVar318._20_4_ = 0x3f800000;
      auVar318._24_4_ = 0x3f800000;
      auVar318._28_4_ = 0x3f800000;
      auVar319 = vsubps_avx(auVar318,auVar49);
      auVar300._8_4_ = 0x7fffffff;
      auVar300._0_8_ = 0x7fffffff7fffffff;
      auVar300._12_4_ = 0x7fffffff;
      auVar300._16_4_ = 0x7fffffff;
      auVar300._20_4_ = 0x7fffffff;
      auVar300._24_4_ = 0x7fffffff;
      auVar300._28_4_ = 0x7fffffff;
      auVar118 = vandps_avx(auVar121,auVar300);
      auVar403._8_4_ = 0x219392ef;
      auVar403._0_8_ = 0x219392ef219392ef;
      auVar403._12_4_ = 0x219392ef;
      auVar403._16_4_ = 0x219392ef;
      auVar403._20_4_ = 0x219392ef;
      auVar403._24_4_ = 0x219392ef;
      auVar403._28_4_ = 0x219392ef;
      auVar22 = vcmpps_avx(auVar118,auVar403,1);
      auVar50._4_4_ =
           (fVar398 + fVar398 * auVar319._4_4_) *
           -(fVar303 * fVar434 + fVar335 * fVar259 + fVar383 * fVar246);
      auVar50._0_4_ =
           (fVar315 + fVar315 * auVar319._0_4_) *
           -(fVar289 * fVar432 + fVar329 * fVar222 + fVar377 * fVar221);
      auVar50._8_4_ =
           (fVar408 + fVar408 * auVar319._8_4_) *
           -(fVar304 * fVar435 + fVar340 * fVar279 + fVar386 * fVar277);
      auVar50._12_4_ =
           (fVar268 + fVar268 * auVar319._12_4_) *
           -(fVar306 * fVar436 + fVar345 * fVar326 + fVar389 * fVar314);
      auVar50._16_4_ =
           (fVar278 + fVar278 * auVar319._16_4_) *
           -(fVar308 * fVar437 + fVar350 * fVar357 + fVar391 * fVar352);
      auVar50._20_4_ =
           (fVar280 + fVar280 * auVar319._20_4_) *
           -(fVar310 * fVar438 + fVar355 * fVar382 + fVar393 * fVar240);
      auVar50._24_4_ =
           (fVar282 + fVar282 * auVar319._24_4_) *
           -(fVar312 * fVar439 + fVar360 * fVar394 + fVar395 * fVar392);
      auVar50._28_4_ = -(fVar284 + local_980._28_4_ + fVar284);
      auVar319 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar118 = vcmpps_avx(auVar121,auVar319,1);
      auVar118 = vorps_avx(auVar22,auVar118);
      auVar372._8_4_ = 0xff800000;
      auVar372._0_8_ = 0xff800000ff800000;
      auVar372._12_4_ = 0xff800000;
      auVar372._16_4_ = 0xff800000;
      auVar372._20_4_ = 0xff800000;
      auVar372._24_4_ = 0xff800000;
      auVar372._28_4_ = 0xff800000;
      auVar373 = ZEXT3264(auVar372);
      auVar118 = vblendvps_avx(auVar50,auVar372,auVar118);
      auVar319 = vcmpps_avx(auVar121,auVar319,6);
      auVar22 = vorps_avx(auVar22,auVar319);
      auVar381._8_4_ = 0x7f800000;
      auVar381._0_8_ = 0x7f8000007f800000;
      auVar381._12_4_ = 0x7f800000;
      auVar381._16_4_ = 0x7f800000;
      auVar381._20_4_ = 0x7f800000;
      auVar381._24_4_ = 0x7f800000;
      auVar381._28_4_ = 0x7f800000;
      auVar22 = vblendvps_avx(auVar50,auVar381,auVar22);
      auVar319 = vmaxps_avx(local_260,auVar119);
      auVar319 = vmaxps_avx(auVar319,auVar118);
      auVar22 = vminps_avx(auVar405,auVar22);
      auVar320 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar118 = vsubps_avx(auVar320,local_9c0);
      auVar405 = vsubps_avx(auVar320,_local_9e0);
      auVar51._4_4_ = auVar405._4_4_ * -fVar407;
      auVar51._0_4_ = auVar405._0_4_ * -fVar397;
      auVar51._8_4_ = auVar405._8_4_ * -fVar411;
      auVar51._12_4_ = auVar405._12_4_ * -fVar414;
      auVar51._16_4_ = auVar405._16_4_ * -fVar416;
      auVar51._20_4_ = auVar405._20_4_ * -fVar418;
      auVar51._24_4_ = auVar405._24_4_ * -fVar420;
      auVar51._28_4_ = auVar405._28_4_;
      auVar52._4_4_ = fVar336 * auVar118._4_4_;
      auVar52._0_4_ = fVar330 * auVar118._0_4_;
      auVar52._8_4_ = fVar341 * auVar118._8_4_;
      auVar52._12_4_ = fVar346 * auVar118._12_4_;
      auVar52._16_4_ = fVar351 * auVar118._16_4_;
      auVar52._20_4_ = fVar356 * auVar118._20_4_;
      auVar52._24_4_ = fVar361 * auVar118._24_4_;
      auVar52._28_4_ = auVar118._28_4_;
      auVar118 = vsubps_avx(auVar51,auVar52);
      auVar256 = vsubps_avx(auVar320,auVar256);
      auVar321._8_4_ = 0x3f800000;
      auVar321._0_8_ = &DAT_3f8000003f800000;
      auVar321._12_4_ = 0x3f800000;
      auVar321._16_4_ = 0x3f800000;
      auVar321._20_4_ = 0x3f800000;
      auVar321._24_4_ = 0x3f800000;
      auVar321._28_4_ = 0x3f800000;
      auVar324 = ZEXT3264(auVar321);
      auVar53._4_4_ = fVar242 * auVar256._4_4_;
      auVar53._0_4_ = fVar220 * auVar256._0_4_;
      auVar53._8_4_ = fVar245 * auVar256._8_4_;
      auVar53._12_4_ = fVar287 * auVar256._12_4_;
      auVar53._16_4_ = fVar347 * auVar256._16_4_;
      auVar53._20_4_ = fVar409 * auVar256._20_4_;
      uVar8 = auVar256._28_4_;
      auVar53._24_4_ = fVar390 * auVar256._24_4_;
      auVar53._28_4_ = uVar8;
      auVar405 = vsubps_avx(auVar118,auVar53);
      auVar54._4_4_ = (float)local_840._4_4_ * -fVar407;
      auVar54._0_4_ = (float)local_840._0_4_ * -fVar397;
      auVar54._8_4_ = fStack_838 * -fVar411;
      auVar54._12_4_ = fStack_834 * -fVar414;
      auVar54._16_4_ = fStack_830 * -fVar416;
      auVar54._20_4_ = fStack_82c * -fVar418;
      auVar54._24_4_ = fStack_828 * -fVar420;
      auVar54._28_4_ = uVar91 ^ 0x80000000;
      auVar55._4_4_ = (float)local_860._4_4_ * fVar336;
      auVar55._0_4_ = (float)local_860._0_4_ * fVar330;
      auVar55._8_4_ = fStack_858 * fVar341;
      auVar55._12_4_ = fStack_854 * fVar346;
      auVar55._16_4_ = fStack_850 * fVar351;
      auVar55._20_4_ = fStack_84c * fVar356;
      auVar55._24_4_ = fStack_848 * fVar361;
      auVar55._28_4_ = uVar8;
      auVar118 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = (float)local_a00._4_4_ * fVar242;
      auVar56._0_4_ = (float)local_a00._0_4_ * fVar220;
      auVar56._8_4_ = fStack_9f8 * fVar245;
      auVar56._12_4_ = fStack_9f4 * fVar287;
      auVar56._16_4_ = fStack_9f0 * fVar347;
      auVar56._20_4_ = fStack_9ec * fVar409;
      auVar56._24_4_ = fStack_9e8 * fVar390;
      auVar56._28_4_ = uVar8;
      auVar320 = vsubps_avx(auVar118,auVar56);
      auVar118 = vrcpps_avx(auVar320);
      fVar220 = auVar118._0_4_;
      fVar221 = auVar118._4_4_;
      auVar57._4_4_ = auVar320._4_4_ * fVar221;
      auVar57._0_4_ = auVar320._0_4_ * fVar220;
      fVar222 = auVar118._8_4_;
      auVar57._8_4_ = auVar320._8_4_ * fVar222;
      fVar242 = auVar118._12_4_;
      auVar57._12_4_ = auVar320._12_4_ * fVar242;
      fVar246 = auVar118._16_4_;
      auVar57._16_4_ = auVar320._16_4_ * fVar246;
      fVar259 = auVar118._20_4_;
      auVar57._20_4_ = auVar320._20_4_ * fVar259;
      fVar245 = auVar118._24_4_;
      auVar57._24_4_ = auVar320._24_4_ * fVar245;
      auVar57._28_4_ = fStack_9e4;
      auVar24 = vsubps_avx(auVar321,auVar57);
      auVar122._8_4_ = 0x7fffffff;
      auVar122._0_8_ = 0x7fffffff7fffffff;
      auVar122._12_4_ = 0x7fffffff;
      auVar122._16_4_ = 0x7fffffff;
      auVar122._20_4_ = 0x7fffffff;
      auVar122._24_4_ = 0x7fffffff;
      auVar122._28_4_ = 0x7fffffff;
      auVar118 = vandps_avx(auVar320,auVar122);
      auVar256 = vcmpps_avx(auVar118,auVar403,1);
      auVar58._4_4_ = (fVar221 + fVar221 * auVar24._4_4_) * -auVar405._4_4_;
      auVar58._0_4_ = (fVar220 + fVar220 * auVar24._0_4_) * -auVar405._0_4_;
      auVar58._8_4_ = (fVar222 + fVar222 * auVar24._8_4_) * -auVar405._8_4_;
      auVar58._12_4_ = (fVar242 + fVar242 * auVar24._12_4_) * -auVar405._12_4_;
      auVar58._16_4_ = (fVar246 + fVar246 * auVar24._16_4_) * -auVar405._16_4_;
      auVar58._20_4_ = (fVar259 + fVar259 * auVar24._20_4_) * -auVar405._20_4_;
      auVar58._24_4_ = (fVar245 + fVar245 * auVar24._24_4_) * -auVar405._24_4_;
      auVar58._28_4_ = auVar405._28_4_ ^ 0x80000000;
      auVar118 = vcmpps_avx(auVar320,ZEXT832(0) << 0x20,1);
      auVar118 = vorps_avx(auVar256,auVar118);
      auVar118 = vblendvps_avx(auVar58,auVar372,auVar118);
      _local_560 = vmaxps_avx(auVar319,auVar118);
      auVar118 = vcmpps_avx(auVar320,ZEXT832(0) << 0x20,6);
      auVar118 = vorps_avx(auVar256,auVar118);
      auVar118 = vblendvps_avx(auVar58,auVar381,auVar118);
      auVar125 = vandps_avx(auVar125,local_420);
      local_280 = vminps_avx(auVar22,auVar118);
      auVar118 = vcmpps_avx(_local_560,local_280,2);
      auVar256 = auVar125 & auVar118;
      if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar256 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar256 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar256 >> 0x7f,0) == '\0') &&
            (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar256 >> 0xbf,0) == '\0') &&
          (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar256[0x1f]) {
        auVar238 = ZEXT3264(auVar321);
        auVar369 = ZEXT3264(local_7a0);
      }
      else {
        auVar256 = vminps_avx(local_8a0,auVar154);
        auVar22 = vminps_avx(_local_760,local_780);
        auVar256 = vminps_avx(auVar256,auVar22);
        auVar21 = vsubps_avx(auVar256,auVar21);
        auVar125 = vandps_avx(auVar118,auVar125);
        auVar90._4_4_ = local_4c0[1];
        auVar90._0_4_ = local_4c0[0];
        auVar90._8_4_ = local_4c0[2];
        auVar90._12_4_ = local_4c0[3];
        auVar90._16_4_ = fStack_4b0;
        auVar90._20_4_ = fStack_4ac;
        auVar90._24_4_ = fStack_4a8;
        auVar90._28_4_ = fStack_4a4;
        auVar118 = vminps_avx(auVar90,auVar321);
        auVar118 = vmaxps_avx(auVar118,ZEXT832(0) << 0x20);
        local_4c0[0] = fVar102 + fVar134 * (auVar118._0_4_ + 0.0) * 0.125;
        local_4c0[1] = fVar129 + fVar168 * (auVar118._4_4_ + 1.0) * 0.125;
        local_4c0[2] = fVar130 + fVar170 * (auVar118._8_4_ + 2.0) * 0.125;
        local_4c0[3] = fStack_b64 + fVar172 * (auVar118._12_4_ + 3.0) * 0.125;
        fStack_4b0 = fVar102 + fVar134 * (auVar118._16_4_ + 4.0) * 0.125;
        fStack_4ac = fVar129 + fVar168 * (auVar118._20_4_ + 5.0) * 0.125;
        fStack_4a8 = fVar130 + fVar170 * (auVar118._24_4_ + 6.0) * 0.125;
        fStack_4a4 = fStack_b64 + auVar118._28_4_ + 7.0;
        auVar89._4_4_ = local_4e0[1];
        auVar89._0_4_ = local_4e0[0];
        auVar89._8_4_ = local_4e0[2];
        auVar89._12_4_ = local_4e0[3];
        auVar89._16_4_ = fStack_4d0;
        auVar89._20_4_ = fStack_4cc;
        auVar89._24_4_ = fStack_4c8;
        auVar89._28_4_ = fStack_4c4;
        auVar118 = vminps_avx(auVar89,auVar321);
        auVar118 = vmaxps_avx(auVar118,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar102 + fVar134 * (auVar118._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar129 + fVar168 * (auVar118._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar130 + fVar170 * (auVar118._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fStack_b64 + fVar172 * (auVar118._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar102 + fVar134 * (auVar118._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar129 + fVar168 * (auVar118._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar130 + fVar170 * (auVar118._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fStack_b64 + auVar118._28_4_ + 7.0;
        auVar59._4_4_ = auVar21._4_4_ * 0.99999976;
        auVar59._0_4_ = auVar21._0_4_ * 0.99999976;
        auVar59._8_4_ = auVar21._8_4_ * 0.99999976;
        auVar59._12_4_ = auVar21._12_4_ * 0.99999976;
        auVar59._16_4_ = auVar21._16_4_ * 0.99999976;
        auVar59._20_4_ = auVar21._20_4_ * 0.99999976;
        auVar59._24_4_ = auVar21._24_4_ * 0.99999976;
        auVar59._28_4_ = 0x3f7ffffc;
        auVar118 = vmaxps_avx(ZEXT832(0) << 0x20,auVar59);
        auVar60._4_4_ = auVar118._4_4_ * auVar118._4_4_;
        auVar60._0_4_ = auVar118._0_4_ * auVar118._0_4_;
        auVar60._8_4_ = auVar118._8_4_ * auVar118._8_4_;
        auVar60._12_4_ = auVar118._12_4_ * auVar118._12_4_;
        auVar60._16_4_ = auVar118._16_4_ * auVar118._16_4_;
        auVar60._20_4_ = auVar118._20_4_ * auVar118._20_4_;
        auVar60._24_4_ = auVar118._24_4_ * auVar118._24_4_;
        auVar60._28_4_ = auVar118._28_4_;
        auVar21 = vsubps_avx(auVar23,auVar60);
        auVar61._4_4_ = auVar21._4_4_ * fVar417 * 4.0;
        auVar61._0_4_ = auVar21._0_4_ * fVar415 * 4.0;
        auVar61._8_4_ = auVar21._8_4_ * fVar419 * 4.0;
        auVar61._12_4_ = auVar21._12_4_ * fVar173 * 4.0;
        auVar61._16_4_ = auVar21._16_4_ * fVar174 * 4.0;
        auVar61._20_4_ = auVar21._20_4_ * fVar175 * 4.0;
        auVar61._24_4_ = auVar21._24_4_ * fVar374 * 4.0;
        auVar61._28_4_ = auVar118._28_4_;
        auVar256 = vsubps_avx(auVar43,auVar61);
        _local_7e0 = ZEXT432(0) << 0x20;
        local_a60 = vcmpps_avx(auVar256,ZEXT832(0) << 0x20,5);
        auVar118 = local_a60;
        if ((((((((local_a60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a60 >> 0x7f,0) == '\0') &&
              (local_a60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a60 >> 0xbf,0) == '\0') &&
            (local_a60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a60[0x1f]) {
          _local_600 = ZEXT832(0) << 0x20;
          auVar215 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar234 = ZEXT828(0) << 0x20;
          auVar324 = ZEXT864(0) << 0x20;
          auVar194._8_4_ = 0x7f800000;
          auVar194._0_8_ = 0x7f8000007f800000;
          auVar194._12_4_ = 0x7f800000;
          auVar194._16_4_ = 0x7f800000;
          auVar194._20_4_ = 0x7f800000;
          auVar194._24_4_ = 0x7f800000;
          auVar194._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          local_a60 = auVar25;
          _local_5e0 = _local_600;
        }
        else {
          auVar23 = vsqrtps_avx(auVar256);
          auVar235._0_4_ = fVar415 + fVar415;
          auVar235._4_4_ = fVar417 + fVar417;
          auVar235._8_4_ = fVar419 + fVar419;
          auVar235._12_4_ = fVar173 + fVar173;
          auVar235._16_4_ = fVar174 + fVar174;
          auVar235._20_4_ = fVar175 + fVar175;
          auVar235._24_4_ = fVar374 + fVar374;
          auVar235._28_4_ = fVar135 + fVar135;
          auVar22 = vrcpps_avx(auVar235);
          fVar135 = auVar22._0_4_;
          fVar220 = auVar22._4_4_;
          auVar62._4_4_ = auVar235._4_4_ * fVar220;
          auVar62._0_4_ = auVar235._0_4_ * fVar135;
          fVar221 = auVar22._8_4_;
          auVar62._8_4_ = auVar235._8_4_ * fVar221;
          fVar222 = auVar22._12_4_;
          auVar62._12_4_ = auVar235._12_4_ * fVar222;
          fVar242 = auVar22._16_4_;
          auVar62._16_4_ = auVar235._16_4_ * fVar242;
          fVar246 = auVar22._20_4_;
          auVar62._20_4_ = auVar235._20_4_ * fVar246;
          fVar259 = auVar22._24_4_;
          auVar62._24_4_ = auVar235._24_4_ * fVar259;
          auVar62._28_4_ = auVar235._28_4_;
          auVar319 = vsubps_avx(auVar321,auVar62);
          fVar135 = fVar135 + fVar135 * auVar319._0_4_;
          fVar220 = fVar220 + fVar220 * auVar319._4_4_;
          fVar221 = fVar221 + fVar221 * auVar319._8_4_;
          fVar222 = fVar222 + fVar222 * auVar319._12_4_;
          fVar242 = fVar242 + fVar242 * auVar319._16_4_;
          fVar246 = fVar246 + fVar246 * auVar319._20_4_;
          fVar259 = fVar259 + fVar259 * auVar319._24_4_;
          fVar245 = auVar22._28_4_ + auVar319._28_4_;
          auVar252._0_8_ = local_240._0_8_ ^ 0x8000000080000000;
          auVar252._8_4_ = -local_240._8_4_;
          auVar252._12_4_ = -local_240._12_4_;
          auVar252._16_4_ = -local_240._16_4_;
          auVar252._20_4_ = -local_240._20_4_;
          auVar252._24_4_ = -local_240._24_4_;
          auVar252._28_4_ = -local_240._28_4_;
          auVar22 = vsubps_avx(auVar252,auVar23);
          fVar357 = auVar22._0_4_ * fVar135;
          fVar409 = auVar22._4_4_ * fVar220;
          auVar63._4_4_ = fVar409;
          auVar63._0_4_ = fVar357;
          fVar240 = auVar22._8_4_ * fVar221;
          auVar63._8_4_ = fVar240;
          fVar382 = auVar22._12_4_ * fVar222;
          auVar63._12_4_ = fVar382;
          fVar390 = auVar22._16_4_ * fVar242;
          auVar63._16_4_ = fVar390;
          fVar392 = auVar22._20_4_ * fVar246;
          auVar63._20_4_ = fVar392;
          fVar394 = auVar22._24_4_ * fVar259;
          auVar63._24_4_ = fVar394;
          auVar63._28_4_ = fVar412;
          auVar23 = vsubps_avx(auVar23,local_240);
          fVar135 = auVar23._0_4_ * fVar135;
          fVar220 = auVar23._4_4_ * fVar220;
          auVar64._4_4_ = fVar220;
          auVar64._0_4_ = fVar135;
          fVar221 = auVar23._8_4_ * fVar221;
          auVar64._8_4_ = fVar221;
          fVar222 = auVar23._12_4_ * fVar222;
          auVar64._12_4_ = fVar222;
          fVar242 = auVar23._16_4_ * fVar242;
          auVar64._16_4_ = fVar242;
          fVar246 = auVar23._20_4_ * fVar246;
          auVar64._20_4_ = fVar246;
          fVar259 = auVar23._24_4_ * fVar259;
          auVar64._24_4_ = fVar259;
          auVar64._28_4_ = fVar387;
          fVar277 = (fVar357 * fVar244 + fVar421) * fVar247;
          fVar279 = (fVar409 * fVar396 + fVar425) * fVar260;
          fVar287 = (fVar240 * fVar131 + fVar426) * fVar262;
          fVar314 = (fVar382 * fVar406 + fVar427) * fVar264;
          fVar326 = (fVar390 * fVar132 + fVar428) * fVar265;
          fVar347 = (fVar392 * fVar410 + fVar429) * fVar266;
          fVar352 = (fVar394 * fVar413 + fVar430) * fVar267;
          auVar219._0_4_ = fVar327 + fVar207 * fVar277;
          auVar219._4_4_ = fVar333 + fVar241 * fVar279;
          auVar219._8_4_ = fVar338 + fVar243 * fVar287;
          auVar219._12_4_ = fVar343 + fVar285 * fVar314;
          auVar219._16_4_ = fVar348 + fVar342 * fVar326;
          auVar219._20_4_ = fVar353 + fVar376 * fVar347;
          auVar219._24_4_ = fVar358 + fVar388 * fVar352;
          auVar219._28_4_ = fVar362 + auVar23._28_4_ + fVar431;
          auVar65._4_4_ = (float)local_a00._4_4_ * fVar409;
          auVar65._0_4_ = (float)local_a00._0_4_ * fVar357;
          auVar65._8_4_ = fStack_9f8 * fVar240;
          auVar65._12_4_ = fStack_9f4 * fVar382;
          auVar65._16_4_ = fStack_9f0 * fVar390;
          auVar65._20_4_ = fStack_9ec * fVar392;
          auVar65._24_4_ = fStack_9e8 * fVar394;
          auVar65._28_4_ = fVar245;
          _local_9e0 = vsubps_avx(auVar65,auVar219);
          auVar236._0_4_ = fVar328 + fVar169 * fVar277;
          auVar236._4_4_ = fVar334 + fVar223 * fVar279;
          auVar236._8_4_ = fVar339 + fVar261 * fVar287;
          auVar236._12_4_ = fVar344 + fVar281 * fVar314;
          auVar236._16_4_ = fVar349 + fVar332 * fVar326;
          auVar236._20_4_ = fVar354 + fVar370 * fVar347;
          auVar236._24_4_ = fVar359 + fVar384 * fVar352;
          auVar236._28_4_ = fVar363 + fVar245;
          auVar66._4_4_ = (float)local_860._4_4_ * fVar409;
          auVar66._0_4_ = (float)local_860._0_4_ * fVar357;
          auVar66._8_4_ = fStack_858 * fVar240;
          auVar66._12_4_ = fStack_854 * fVar382;
          auVar66._16_4_ = fStack_850 * fVar390;
          auVar66._20_4_ = fStack_84c * fVar392;
          auVar66._24_4_ = fStack_848 * fVar394;
          auVar66._28_4_ = fStack_b64;
          auVar319 = vsubps_avx(auVar66,auVar236);
          auVar253._0_4_ = fVar176 + fVar171 * fVar277;
          auVar253._4_4_ = fVar200 + fVar239 * fVar279;
          auVar253._8_4_ = fVar201 + fVar263 * fVar287;
          auVar253._12_4_ = fVar202 + fVar283 * fVar314;
          auVar253._16_4_ = fVar203 + fVar337 * fVar326;
          auVar253._20_4_ = fVar204 + fVar375 * fVar347;
          auVar253._24_4_ = fVar205 + fVar385 * fVar352;
          auVar253._28_4_ = fVar206 + auVar22._28_4_;
          auVar67._4_4_ = (float)local_840._4_4_ * fVar409;
          auVar67._0_4_ = (float)local_840._0_4_ * fVar357;
          auVar67._8_4_ = fStack_838 * fVar240;
          auVar67._12_4_ = fStack_834 * fVar382;
          auVar67._16_4_ = fStack_830 * fVar390;
          auVar67._20_4_ = fStack_82c * fVar392;
          auVar67._24_4_ = fStack_828 * fVar394;
          auVar67._28_4_ = fStack_b64;
          local_8c0 = vsubps_avx(auVar67,auVar253);
          fVar247 = (fVar135 * fVar244 + fVar421) * fVar247;
          fVar260 = (fVar220 * fVar396 + fVar425) * fVar260;
          fVar262 = (fVar221 * fVar131 + fVar426) * fVar262;
          fVar264 = (fVar222 * fVar406 + fVar427) * fVar264;
          fVar265 = (fVar242 * fVar132 + fVar428) * fVar265;
          fVar266 = (fVar246 * fVar410 + fVar429) * fVar266;
          fVar267 = (fVar259 * fVar413 + fVar430) * fVar267;
          auVar301._0_4_ = fVar327 + fVar207 * fVar247;
          auVar301._4_4_ = fVar333 + fVar241 * fVar260;
          auVar301._8_4_ = fVar338 + fVar243 * fVar262;
          auVar301._12_4_ = fVar343 + fVar285 * fVar264;
          auVar301._16_4_ = fVar348 + fVar342 * fVar265;
          auVar301._20_4_ = fVar353 + fVar376 * fVar266;
          auVar301._24_4_ = fVar358 + fVar388 * fVar267;
          auVar301._28_4_ = fVar362 + fStack_b64;
          auVar68._4_4_ = (float)local_a00._4_4_ * fVar220;
          auVar68._0_4_ = (float)local_a00._0_4_ * fVar135;
          auVar68._8_4_ = fStack_9f8 * fVar221;
          auVar68._12_4_ = fStack_9f4 * fVar222;
          auVar68._16_4_ = fStack_9f0 * fVar242;
          auVar68._20_4_ = fStack_9ec * fVar246;
          auVar68._24_4_ = fStack_9e8 * fVar259;
          auVar68._28_4_ = fStack_9e4;
          _local_7e0 = vsubps_avx(auVar68,auVar301);
          auVar302._0_4_ = fVar328 + fVar169 * fVar247;
          auVar302._4_4_ = fVar334 + fVar223 * fVar260;
          auVar302._8_4_ = fVar339 + fVar261 * fVar262;
          auVar302._12_4_ = fVar344 + fVar281 * fVar264;
          auVar302._16_4_ = fVar349 + fVar332 * fVar265;
          auVar302._20_4_ = fVar354 + fVar370 * fVar266;
          auVar302._24_4_ = fVar359 + fVar384 * fVar267;
          auVar302._28_4_ = fVar363 + local_7e0._28_4_;
          auVar69._4_4_ = (float)local_860._4_4_ * fVar220;
          auVar69._0_4_ = (float)local_860._0_4_ * fVar135;
          auVar69._8_4_ = fStack_858 * fVar221;
          auVar69._12_4_ = fStack_854 * fVar222;
          auVar69._16_4_ = fStack_850 * fVar242;
          auVar69._20_4_ = fStack_84c * fVar246;
          auVar69._24_4_ = fStack_848 * fVar259;
          auVar69._28_4_ = fStack_9e4;
          _local_5e0 = vsubps_avx(auVar69,auVar302);
          auVar254._0_4_ = fVar176 + fVar171 * fVar247;
          auVar254._4_4_ = fVar200 + fVar239 * fVar260;
          auVar254._8_4_ = fVar201 + fVar263 * fVar262;
          auVar254._12_4_ = fVar202 + fVar283 * fVar264;
          auVar254._16_4_ = fVar203 + fVar337 * fVar265;
          auVar254._20_4_ = fVar204 + fVar375 * fVar266;
          auVar254._24_4_ = fVar205 + fVar385 * fVar267;
          auVar254._28_4_ = fVar206 + local_8c0._28_4_ + fVar431;
          auVar70._4_4_ = (float)local_840._4_4_ * fVar220;
          auVar70._0_4_ = (float)local_840._0_4_ * fVar135;
          auVar70._8_4_ = fStack_838 * fVar221;
          auVar70._12_4_ = fStack_834 * fVar222;
          auVar70._16_4_ = fStack_830 * fVar242;
          auVar70._20_4_ = fStack_82c * fVar246;
          auVar70._24_4_ = fStack_828 * fVar259;
          auVar70._28_4_ = local_5e0._28_4_;
          _local_600 = vsubps_avx(auVar70,auVar254);
          auVar22 = vcmpps_avx(auVar256,ZEXT832(0) << 0x20,5);
          auVar195._8_4_ = 0x7f800000;
          auVar195._0_8_ = 0x7f8000007f800000;
          auVar195._12_4_ = 0x7f800000;
          auVar195._16_4_ = 0x7f800000;
          auVar195._20_4_ = 0x7f800000;
          auVar195._24_4_ = 0x7f800000;
          auVar195._28_4_ = 0x7f800000;
          auVar194 = vblendvps_avx(auVar195,auVar63,auVar22);
          auVar322._8_4_ = 0x7fffffff;
          auVar322._0_8_ = 0x7fffffff7fffffff;
          auVar322._12_4_ = 0x7fffffff;
          auVar322._16_4_ = 0x7fffffff;
          auVar322._20_4_ = 0x7fffffff;
          auVar322._24_4_ = 0x7fffffff;
          auVar322._28_4_ = 0x7fffffff;
          auVar256 = vandps_avx(auVar322,auVar42);
          auVar256 = vmaxps_avx(local_440,auVar256);
          auVar71._4_4_ = auVar256._4_4_ * 1.9073486e-06;
          auVar71._0_4_ = auVar256._0_4_ * 1.9073486e-06;
          auVar71._8_4_ = auVar256._8_4_ * 1.9073486e-06;
          auVar71._12_4_ = auVar256._12_4_ * 1.9073486e-06;
          auVar71._16_4_ = auVar256._16_4_ * 1.9073486e-06;
          auVar71._20_4_ = auVar256._20_4_ * 1.9073486e-06;
          auVar71._24_4_ = auVar256._24_4_ * 1.9073486e-06;
          auVar71._28_4_ = auVar256._28_4_;
          auVar256 = vandps_avx(auVar322,local_480);
          auVar23 = vcmpps_avx(auVar256,auVar71,1);
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar251 = vblendvps_avx(auVar255,auVar64,auVar22);
          auVar405 = auVar22 & auVar23;
          auVar256 = auVar276;
          if ((((((((auVar405 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar405 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar405 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar405 >> 0x7f,0) != '\0') ||
                (auVar405 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar405 >> 0xbf,0) != '\0') ||
              (auVar405 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar405[0x1f] < '\0') {
            auVar118 = vandps_avx(auVar23,auVar22);
            auVar144 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar405 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar23 = vcmpps_avx(auVar21,auVar405,2);
            auVar424._8_4_ = 0xff800000;
            auVar424._0_8_ = 0xff800000ff800000;
            auVar424._12_4_ = 0xff800000;
            auVar424._16_4_ = 0xff800000;
            auVar424._20_4_ = 0xff800000;
            auVar424._24_4_ = 0xff800000;
            auVar424._28_4_ = 0xff800000;
            auVar433._8_4_ = 0x7f800000;
            auVar433._0_8_ = 0x7f8000007f800000;
            auVar433._12_4_ = 0x7f800000;
            auVar433._16_4_ = 0x7f800000;
            auVar433._20_4_ = 0x7f800000;
            auVar433._24_4_ = 0x7f800000;
            auVar433._28_4_ = 0x7f800000;
            auVar21 = vblendvps_avx(auVar433,auVar424,auVar23);
            auVar141 = vpmovsxwd_avx(auVar144);
            auVar144 = vpunpckhwd_avx(auVar144,auVar144);
            auVar323._16_16_ = auVar144;
            auVar323._0_16_ = auVar141;
            auVar194 = vblendvps_avx(auVar194,auVar21,auVar323);
            auVar256 = vblendvps_avx(auVar424,auVar433,auVar23);
            auVar251 = vblendvps_avx(auVar251,auVar256,auVar323);
            auVar21 = vcmpps_avx(auVar405,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar167._0_4_ = auVar21._0_4_ ^ auVar118._0_4_;
            auVar167._4_4_ = auVar21._4_4_ ^ auVar118._4_4_;
            auVar167._8_4_ = auVar21._8_4_ ^ auVar118._8_4_;
            auVar167._12_4_ = auVar21._12_4_ ^ auVar118._12_4_;
            auVar167._16_4_ = auVar21._16_4_ ^ auVar118._16_4_;
            auVar167._20_4_ = auVar21._20_4_ ^ auVar118._20_4_;
            auVar167._24_4_ = auVar21._24_4_ ^ auVar118._24_4_;
            auVar167._28_4_ = auVar21._28_4_ ^ auVar118._28_4_;
            auVar118 = vorps_avx(auVar23,auVar167);
            auVar118 = vandps_avx(auVar22,auVar118);
          }
          auVar373 = ZEXT3264(auVar256);
          auVar215 = local_9e0._0_28_;
          auVar234 = auVar319._0_28_;
          auVar324 = ZEXT3264(local_8c0);
          local_9c0 = auVar125;
        }
        _local_2e0 = _local_560;
        local_2c0 = vminps_avx(local_280,auVar194);
        _local_2a0 = vmaxps_avx(_local_560,auVar251);
        auVar21 = vcmpps_avx(_local_560,local_2c0,2);
        local_620 = vandps_avx(auVar21,auVar125);
        auVar21 = vcmpps_avx(_local_2a0,local_280,2);
        local_5a0 = vandps_avx(auVar21,auVar125);
        auVar125 = vorps_avx(local_5a0,local_620);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0x7f,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0xbf,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar125[0x1f]) goto LAB_01070cdd;
        local_660 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
        local_520._0_4_ = auVar118._0_4_ ^ local_660._0_4_;
        local_520._4_4_ = auVar118._4_4_ ^ local_660._4_4_;
        local_520._8_4_ = auVar118._8_4_ ^ local_660._8_4_;
        local_520._12_4_ = auVar118._12_4_ ^ local_660._12_4_;
        local_520._16_4_ = auVar118._16_4_ ^ local_660._16_4_;
        local_520._20_4_ = auVar118._20_4_ ^ local_660._20_4_;
        local_520._24_4_ = auVar118._24_4_ ^ local_660._24_4_;
        local_520._28_4_ = auVar118._28_4_ ^ (uint)local_660._28_4_;
        auVar124._0_4_ =
             (float)local_a00._0_4_ * auVar215._0_4_ +
             (float)local_860._0_4_ * auVar234._0_4_ + (float)local_840._0_4_ * auVar324._0_4_;
        auVar124._4_4_ =
             (float)local_a00._4_4_ * auVar215._4_4_ +
             (float)local_860._4_4_ * auVar234._4_4_ + (float)local_840._4_4_ * auVar324._4_4_;
        auVar124._8_4_ =
             fStack_9f8 * auVar215._8_4_ + fStack_858 * auVar234._8_4_ + fStack_838 * auVar324._8_4_
        ;
        auVar124._12_4_ =
             fStack_9f4 * auVar215._12_4_ +
             fStack_854 * auVar234._12_4_ + fStack_834 * auVar324._12_4_;
        auVar124._16_4_ =
             fStack_9f0 * auVar215._16_4_ +
             fStack_850 * auVar234._16_4_ + fStack_830 * auVar324._16_4_;
        auVar124._20_4_ =
             fStack_9ec * auVar215._20_4_ +
             fStack_84c * auVar234._20_4_ + fStack_82c * auVar324._20_4_;
        auVar124._24_4_ =
             fStack_9e8 * auVar215._24_4_ +
             fStack_848 * auVar234._24_4_ + fStack_828 * auVar324._24_4_;
        auVar124._28_4_ = local_660._28_4_ + fStack_9e4 + local_620._28_4_;
        auVar155._8_4_ = 0x7fffffff;
        auVar155._0_8_ = 0x7fffffff7fffffff;
        auVar155._12_4_ = 0x7fffffff;
        auVar155._16_4_ = 0x7fffffff;
        auVar155._20_4_ = 0x7fffffff;
        auVar155._24_4_ = 0x7fffffff;
        auVar155._28_4_ = 0x7fffffff;
        auVar125 = vandps_avx(auVar124,auVar155);
        auVar156._8_4_ = 0x3e99999a;
        auVar156._0_8_ = 0x3e99999a3e99999a;
        auVar156._12_4_ = 0x3e99999a;
        auVar156._16_4_ = 0x3e99999a;
        auVar156._20_4_ = 0x3e99999a;
        auVar156._24_4_ = 0x3e99999a;
        auVar156._28_4_ = 0x3e99999a;
        auVar125 = vcmpps_avx(auVar125,auVar156,1);
        auVar125 = vorps_avx(auVar125,local_520);
        auVar157._8_4_ = 3;
        auVar157._0_8_ = 0x300000003;
        auVar157._12_4_ = 3;
        auVar157._16_4_ = 3;
        auVar157._20_4_ = 3;
        auVar157._24_4_ = 3;
        auVar157._28_4_ = 3;
        auVar196._8_4_ = 2;
        auVar196._0_8_ = 0x200000002;
        auVar196._12_4_ = 2;
        auVar196._16_4_ = 2;
        auVar196._20_4_ = 2;
        auVar196._24_4_ = 2;
        auVar196._28_4_ = 2;
        auVar125 = vblendvps_avx(auVar196,auVar157,auVar125);
        local_500 = ZEXT432((uint)uVar100);
        local_540 = vpshufd_avx(ZEXT416((uint)uVar100),0);
        auVar144 = vpcmpgtd_avx(auVar125._16_16_,local_540);
        auStack_530 = auVar276._16_16_;
        auVar141 = vpcmpgtd_avx(auVar125._0_16_,local_540);
        auVar158._16_16_ = auVar144;
        auVar158._0_16_ = auVar141;
        auVar125 = vblendps_avx(ZEXT1632(auVar141),auVar158,0xf0);
        local_580 = vandnps_avx(auVar125,local_620);
        auVar238 = ZEXT3264(local_580);
        auVar118 = local_620 & ~auVar125;
        auStack_5b8 = auVar154._8_24_;
        local_5c0 = uVar100;
        local_640 = auVar125;
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0x7f,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar118 >> 0xbf,0) == '\0') &&
            (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar118[0x1f]) {
          auVar369 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar256 = _local_2a0;
          auVar276 = local_5a0;
          fVar169 = (float)local_860._0_4_;
          fVar171 = (float)local_860._4_4_;
          fVar207 = fStack_858;
          fVar220 = fStack_854;
          fVar223 = fStack_850;
          fVar239 = fStack_84c;
          fVar241 = fStack_848;
          fVar277 = (float)local_a00._0_4_;
          fVar279 = (float)local_a00._4_4_;
          fVar281 = fStack_9f8;
          fVar283 = fStack_9f4;
          fVar285 = fStack_9f0;
          fVar287 = fStack_9ec;
          fVar314 = fStack_9e8;
          fVar242 = (float)local_840._0_4_;
          fVar246 = (float)local_840._4_4_;
          fVar259 = fStack_838;
          fVar261 = fStack_834;
          fVar263 = fStack_830;
          fVar243 = fStack_82c;
          fVar245 = fStack_828;
        }
        else {
          local_7c0._4_4_ = (float)local_560._4_4_ + (float)local_900._4_4_;
          local_7c0._0_4_ = (float)local_560._0_4_ + (float)local_900._0_4_;
          fStack_7b8 = fStack_558 + fStack_8f8;
          fStack_7b4 = fStack_554 + fStack_8f4;
          fStack_7b0 = fStack_550 + fStack_8f0;
          fStack_7ac = fStack_54c + fStack_8ec;
          fStack_7a8 = fStack_548 + fStack_8e8;
          fStack_7a4 = fStack_544 + fStack_8e4;
          auVar369 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_ac0 = _local_2a0;
          local_980 = local_5a0;
          do {
            auVar226 = auVar369._0_16_;
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar125 = auVar238._0_32_;
            auVar118 = vblendvps_avx(auVar159,_local_560,auVar125);
            auVar21 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar21 = vminps_avx(auVar118,auVar21);
            auVar256 = vshufpd_avx(auVar21,auVar21,5);
            auVar21 = vminps_avx(auVar21,auVar256);
            auVar256 = vperm2f128_avx(auVar21,auVar21,1);
            auVar21 = vminps_avx(auVar21,auVar256);
            auVar118 = vcmpps_avx(auVar118,auVar21,0);
            auVar21 = auVar125 & auVar118;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              auVar125 = vandps_avx(auVar118,auVar125);
            }
            local_780._0_8_ = uVar99;
            uVar92 = vmovmskps_avx(auVar125);
            uVar91 = 0;
            if (uVar92 != 0) {
              for (; (uVar92 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
              }
            }
            uVar100 = (ulong)uVar91;
            *(undefined4 *)(local_580 + uVar100 * 4) = 0;
            fVar135 = local_4c0[uVar100];
            uVar91 = *(uint *)(local_2e0 + uVar100 * 4);
            fVar169 = local_ac4;
            if ((float)local_8e0._0_4_ < 0.0) {
              fVar169 = sqrtf((float)local_8e0._0_4_);
              auVar226._8_4_ = 0x7fffffff;
              auVar226._0_8_ = 0x7fffffff7fffffff;
              auVar226._12_4_ = 0x7fffffff;
            }
            auVar373 = ZEXT464((uint)fVar135);
            auVar238 = ZEXT464(uVar91);
            auVar141 = vminps_avx(_local_a10,_local_a30);
            auVar144 = vmaxps_avx(_local_a10,_local_a30);
            auVar113 = vminps_avx(_local_a20,_local_a40);
            auVar112 = vminps_avx(auVar141,auVar113);
            auVar141 = vmaxps_avx(_local_a20,_local_a40);
            auVar113 = vmaxps_avx(auVar144,auVar141);
            auVar144 = vandps_avx(auVar112,auVar226);
            auVar141 = vandps_avx(auVar113,auVar226);
            auVar144 = vmaxps_avx(auVar144,auVar141);
            auVar141 = vmovshdup_avx(auVar144);
            auVar141 = vmaxss_avx(auVar141,auVar144);
            auVar144 = vshufpd_avx(auVar144,auVar144,1);
            auVar144 = vmaxss_avx(auVar144,auVar141);
            local_9c0._0_4_ = auVar144._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar169 * 1.9073486e-06;
            _local_760 = vshufps_avx(auVar113,auVar113,0xff);
            lVar96 = 5;
            do {
              local_ba0 = auVar238._0_4_;
              auVar144 = vshufps_avx(auVar238._0_16_,auVar238._0_16_,0);
              auVar107._0_4_ = auVar144._0_4_ * (float)local_8d0._0_4_ + 0.0;
              auVar107._4_4_ = auVar144._4_4_ * (float)local_8d0._4_4_ + 0.0;
              auVar107._8_4_ = auVar144._8_4_ * fStack_8c8 + 0.0;
              auVar107._12_4_ = auVar144._12_4_ * fStack_8c4 + 0.0;
              fVar221 = auVar373._0_4_;
              fVar220 = 1.0 - fVar221;
              fVar171 = fVar221 * 3.0;
              fVar135 = fVar171 + -5.0;
              fVar207 = fVar220 * fVar220;
              auVar144 = ZEXT416((uint)(fVar221 * fVar221 * -fVar220 * 0.5));
              auVar144 = vshufps_avx(auVar144,auVar144,0);
              auVar141 = ZEXT416((uint)((fVar207 * (fVar220 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar113 = ZEXT416((uint)((fVar221 * fVar221 * fVar135 + 2.0) * 0.5));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar112 = ZEXT416((uint)(fVar220 * fVar220 * -fVar221 * 0.5));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar181._0_4_ =
                   auVar112._0_4_ * (float)local_a10._0_4_ +
                   auVar113._0_4_ * (float)local_a30._0_4_ +
                   auVar141._0_4_ * (float)local_a20._0_4_ + auVar144._0_4_ * (float)local_a40._0_4_
              ;
              auVar181._4_4_ =
                   auVar112._4_4_ * (float)local_a10._4_4_ +
                   auVar113._4_4_ * (float)local_a30._4_4_ +
                   auVar141._4_4_ * (float)local_a20._4_4_ + auVar144._4_4_ * (float)local_a40._4_4_
              ;
              auVar181._8_4_ =
                   auVar112._8_4_ * fStack_a08 +
                   auVar113._8_4_ * fStack_a28 +
                   auVar141._8_4_ * fStack_a18 + auVar144._8_4_ * fStack_a38;
              auVar181._12_4_ =
                   auVar112._12_4_ * fStack_a04 +
                   auVar113._12_4_ * fStack_a24 +
                   auVar141._12_4_ * fStack_a14 + auVar144._12_4_ * fStack_a34;
              local_8c0._0_16_ = auVar181;
              auVar144 = vsubps_avx(auVar107,auVar181);
              _local_9e0 = auVar144;
              auVar144 = vdpps_avx(auVar144,auVar144,0x7f);
              fVar169 = fVar221 * -9.0 + 4.0;
              fVar222 = auVar144._0_4_;
              local_a60._0_4_ = fVar207;
              if (fVar222 < 0.0) {
                local_a80._0_16_ = ZEXT416((uint)fVar220);
                local_aa0._0_4_ = fVar171;
                local_9a0._0_4_ = fVar221 * 9.0;
                local_920._0_4_ = fVar135;
                local_880._0_16_ = ZEXT416((uint)fVar169);
                local_8a0._0_4_ = fVar220 * -2.0;
                fVar207 = sqrtf(fVar222);
                fVar135 = (float)local_920._0_4_;
                fVar239 = (float)local_9a0._0_4_;
                fVar223 = (float)local_8a0._0_4_;
                auVar141 = local_880._0_16_;
                fVar220 = (float)local_a80._0_4_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar144,auVar144);
                fVar207 = auVar141._0_4_;
                fVar239 = fVar221 * 9.0;
                fVar223 = fVar220 * -2.0;
                local_aa0._0_4_ = fVar171;
                auVar141 = ZEXT416((uint)fVar169);
              }
              auVar113 = ZEXT416((uint)((fVar221 * fVar221 + fVar221 * fVar223) * 0.5));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar112 = ZEXT416((uint)(((fVar220 + fVar220) * ((float)local_aa0._0_4_ + 2.0) +
                                        fVar220 * fVar220 * -3.0) * 0.5));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar187 = ZEXT416((uint)((fVar135 * (fVar221 + fVar221) +
                                        fVar221 * (float)local_aa0._0_4_) * 0.5));
              auVar187 = vshufps_avx(auVar187,auVar187,0);
              auVar148 = ZEXT416((uint)((fVar221 * (fVar220 + fVar220) - (float)local_a60._0_4_) *
                                       0.5));
              auVar148 = vshufps_avx(auVar148,auVar148,0);
              auVar366._0_4_ =
                   (float)local_a10._0_4_ * auVar148._0_4_ +
                   (float)local_a30._0_4_ * auVar187._0_4_ +
                   (float)local_a40._0_4_ * auVar113._0_4_ + (float)local_a20._0_4_ * auVar112._0_4_
              ;
              auVar366._4_4_ =
                   (float)local_a10._4_4_ * auVar148._4_4_ +
                   (float)local_a30._4_4_ * auVar187._4_4_ +
                   (float)local_a40._4_4_ * auVar113._4_4_ + (float)local_a20._4_4_ * auVar112._4_4_
              ;
              auVar366._8_4_ =
                   fStack_a08 * auVar148._8_4_ +
                   fStack_a28 * auVar187._8_4_ +
                   fStack_a38 * auVar113._8_4_ + fStack_a18 * auVar112._8_4_;
              auVar366._12_4_ =
                   fStack_a04 * auVar148._12_4_ +
                   fStack_a24 * auVar187._12_4_ +
                   fStack_a34 * auVar113._12_4_ + fStack_a14 * auVar112._12_4_;
              auVar148 = vpermilps_avx(ZEXT416((uint)(fVar171 + -1.0)),0);
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar112 = vshufps_avx(ZEXT416((uint)(fVar239 + -5.0)),ZEXT416((uint)(fVar239 + -5.0))
                                     ,0);
              auVar113 = ZEXT416((uint)(fVar221 * -3.0 + 2.0));
              auVar187 = vshufps_avx(auVar113,auVar113,0);
              auVar113 = vdpps_avx(auVar366,auVar366,0x7f);
              auVar142._0_4_ =
                   (float)local_a10._0_4_ * auVar187._0_4_ +
                   (float)local_a30._0_4_ * auVar112._0_4_ +
                   (float)local_a20._0_4_ * auVar141._0_4_ + (float)local_a40._0_4_ * auVar148._0_4_
              ;
              auVar142._4_4_ =
                   (float)local_a10._4_4_ * auVar187._4_4_ +
                   (float)local_a30._4_4_ * auVar112._4_4_ +
                   (float)local_a20._4_4_ * auVar141._4_4_ + (float)local_a40._4_4_ * auVar148._4_4_
              ;
              auVar142._8_4_ =
                   fStack_a08 * auVar187._8_4_ +
                   fStack_a28 * auVar112._8_4_ +
                   fStack_a18 * auVar141._8_4_ + fStack_a38 * auVar148._8_4_;
              auVar142._12_4_ =
                   fStack_a04 * auVar187._12_4_ +
                   fStack_a24 * auVar112._12_4_ +
                   fStack_a14 * auVar141._12_4_ + fStack_a34 * auVar148._12_4_;
              auVar141 = vblendps_avx(auVar113,_DAT_01feba10,0xe);
              auVar112 = vrsqrtss_avx(auVar141,auVar141);
              fVar169 = auVar112._0_4_;
              fVar135 = auVar113._0_4_;
              auVar112 = vdpps_avx(auVar366,auVar142,0x7f);
              auVar187 = vshufps_avx(auVar113,auVar113,0);
              auVar143._0_4_ = auVar142._0_4_ * auVar187._0_4_;
              auVar143._4_4_ = auVar142._4_4_ * auVar187._4_4_;
              auVar143._8_4_ = auVar142._8_4_ * auVar187._8_4_;
              auVar143._12_4_ = auVar142._12_4_ * auVar187._12_4_;
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar227._0_4_ = auVar366._0_4_ * auVar112._0_4_;
              auVar227._4_4_ = auVar366._4_4_ * auVar112._4_4_;
              auVar227._8_4_ = auVar366._8_4_ * auVar112._8_4_;
              auVar227._12_4_ = auVar366._12_4_ * auVar112._12_4_;
              auVar148 = vsubps_avx(auVar143,auVar227);
              auVar112 = vrcpss_avx(auVar141,auVar141);
              auVar141 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                    ZEXT416((uint)((float)local_740._0_4_ * local_ba0)));
              auVar112 = ZEXT416((uint)(auVar112._0_4_ * (2.0 - fVar135 * auVar112._0_4_)));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              uVar100 = CONCAT44(auVar366._4_4_,auVar366._0_4_);
              auVar296._0_8_ = uVar100 ^ 0x8000000080000000;
              auVar296._8_4_ = -auVar366._8_4_;
              auVar296._12_4_ = -auVar366._12_4_;
              auVar187 = ZEXT416((uint)(fVar169 * 1.5 + fVar135 * -0.5 * fVar169 * fVar169 * fVar169
                                       ));
              auVar187 = vshufps_avx(auVar187,auVar187,0);
              auVar211._0_4_ = auVar187._0_4_ * auVar148._0_4_ * auVar112._0_4_;
              auVar211._4_4_ = auVar187._4_4_ * auVar148._4_4_ * auVar112._4_4_;
              auVar211._8_4_ = auVar187._8_4_ * auVar148._8_4_ * auVar112._8_4_;
              auVar211._12_4_ = auVar187._12_4_ * auVar148._12_4_ * auVar112._12_4_;
              local_aa0._0_4_ = auVar366._0_4_ * auVar187._0_4_;
              local_aa0._4_4_ = auVar366._4_4_ * auVar187._4_4_;
              local_aa0._8_4_ = auVar366._8_4_ * auVar187._8_4_;
              local_aa0._12_4_ = auVar366._12_4_ * auVar187._12_4_;
              local_a60._0_4_ = auVar141._0_4_;
              if (fVar135 < 0.0) {
                local_a80._0_16_ = auVar296;
                local_9a0._0_16_ = auVar211;
                fVar169 = sqrtf(fVar135);
                auVar211 = local_9a0._0_16_;
                auVar296 = local_a80._0_16_;
                fVar135 = (float)local_a60._0_4_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                fVar169 = auVar113._0_4_;
                fVar135 = auVar141._0_4_;
              }
              auVar141 = vdpps_avx(_local_9e0,local_aa0._0_16_,0x7f);
              local_a80._0_4_ =
                   ((float)local_9c0._0_4_ / fVar169) * (fVar207 + 1.0) +
                   fVar135 + fVar207 * (float)local_9c0._0_4_;
              auVar113 = vdpps_avx(auVar296,local_aa0._0_16_,0x7f);
              auVar112 = vdpps_avx(_local_9e0,auVar211,0x7f);
              auVar187 = vdpps_avx(_local_8d0,local_aa0._0_16_,0x7f);
              auVar148 = vdpps_avx(_local_9e0,auVar296,0x7f);
              fVar169 = auVar113._0_4_ + auVar112._0_4_;
              fVar171 = auVar141._0_4_;
              auVar108._0_4_ = fVar171 * fVar171;
              auVar108._4_4_ = auVar141._4_4_ * auVar141._4_4_;
              auVar108._8_4_ = auVar141._8_4_ * auVar141._8_4_;
              auVar108._12_4_ = auVar141._12_4_ * auVar141._12_4_;
              auVar112 = vsubps_avx(auVar144,auVar108);
              local_aa0._0_16_ = ZEXT416((uint)fVar169);
              auVar113 = vdpps_avx(_local_9e0,_local_8d0,0x7f);
              fVar207 = auVar148._0_4_ - fVar171 * fVar169;
              fVar171 = auVar113._0_4_ - fVar171 * auVar187._0_4_;
              auVar113 = vrsqrtss_avx(auVar112,auVar112);
              fVar220 = auVar112._0_4_;
              fVar169 = auVar113._0_4_;
              fVar169 = fVar169 * 1.5 + fVar220 * -0.5 * fVar169 * fVar169 * fVar169;
              if (fVar220 < 0.0) {
                local_9a0._0_16_ = auVar187;
                local_920._0_4_ = fVar207;
                local_880._0_4_ = fVar171;
                local_8a0._0_4_ = fVar169;
                fVar220 = sqrtf(fVar220);
                fVar169 = (float)local_8a0._0_4_;
                fVar207 = (float)local_920._0_4_;
                fVar171 = (float)local_880._0_4_;
                auVar187 = local_9a0._0_16_;
                fVar135 = (float)local_a60._0_4_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar112,auVar112);
                fVar220 = auVar113._0_4_;
              }
              auVar324 = ZEXT1664(auVar144);
              auVar148 = vpermilps_avx(local_8c0._0_16_,0xff);
              auVar17 = vpermilps_avx(auVar366,0xff);
              fVar207 = fVar207 * fVar169 - auVar17._0_4_;
              auVar228._0_8_ = auVar187._0_8_ ^ 0x8000000080000000;
              auVar228._8_4_ = auVar187._8_4_ ^ 0x80000000;
              auVar228._12_4_ = auVar187._12_4_ ^ 0x80000000;
              auVar249._0_4_ = -fVar207;
              auVar249._4_4_ = 0x80000000;
              auVar249._8_4_ = 0x80000000;
              auVar249._12_4_ = 0x80000000;
              auVar113 = vinsertps_avx(ZEXT416((uint)(fVar171 * fVar169)),auVar228,0x10);
              auVar112 = vmovsldup_avx(ZEXT416((uint)(local_aa0._0_4_ * fVar171 * fVar169 -
                                                     auVar187._0_4_ * fVar207)));
              auVar113 = vdivps_avx(auVar113,auVar112);
              auVar148 = ZEXT416((uint)(fVar220 - auVar148._0_4_));
              auVar187 = vinsertps_avx(auVar141,auVar148,0x10);
              auVar212._0_4_ = auVar187._0_4_ * auVar113._0_4_;
              auVar212._4_4_ = auVar187._4_4_ * auVar113._4_4_;
              auVar212._8_4_ = auVar187._8_4_ * auVar113._8_4_;
              auVar212._12_4_ = auVar187._12_4_ * auVar113._12_4_;
              auVar113 = vinsertps_avx(auVar249,local_aa0._0_16_,0x1c);
              auVar113 = vdivps_avx(auVar113,auVar112);
              auVar112 = vhaddps_avx(auVar212,auVar212);
              auVar182._0_4_ = auVar187._0_4_ * auVar113._0_4_;
              auVar182._4_4_ = auVar187._4_4_ * auVar113._4_4_;
              auVar182._8_4_ = auVar187._8_4_ * auVar113._8_4_;
              auVar182._12_4_ = auVar187._12_4_ * auVar113._12_4_;
              auVar113 = vhaddps_avx(auVar182,auVar182);
              fVar221 = fVar221 - auVar112._0_4_;
              local_ba0 = local_ba0 - auVar113._0_4_;
              auVar238 = ZEXT464((uint)local_ba0);
              auVar229._8_4_ = 0x7fffffff;
              auVar229._0_8_ = 0x7fffffff7fffffff;
              auVar229._12_4_ = 0x7fffffff;
              auVar369 = ZEXT1664(auVar229);
              auVar141 = vandps_avx(auVar141,auVar229);
              bVar101 = true;
              fVar169 = (float)local_860._0_4_;
              fVar171 = (float)local_860._4_4_;
              fVar207 = fStack_858;
              fVar220 = fStack_854;
              fVar223 = fStack_850;
              fVar239 = fStack_84c;
              fVar241 = fStack_848;
              fVar277 = (float)local_a00._0_4_;
              fVar279 = (float)local_a00._4_4_;
              fVar281 = fStack_9f8;
              fVar283 = fStack_9f4;
              fVar285 = fStack_9f0;
              fVar287 = fStack_9ec;
              fVar314 = fStack_9e8;
              fVar242 = (float)local_840._0_4_;
              fVar246 = (float)local_840._4_4_;
              fVar259 = fStack_838;
              fVar261 = fStack_834;
              fVar263 = fStack_830;
              fVar243 = fStack_82c;
              fVar245 = fStack_828;
              if (auVar141._0_4_ < (float)local_a80._0_4_) {
                auVar141 = vandps_avx(auVar148,auVar229);
                if (auVar141._0_4_ <
                    (float)local_760._0_4_ * 1.9073486e-06 + fVar135 + (float)local_a80._0_4_) {
                  local_ba0 = local_ba0 + (float)local_810._0_4_;
                  auVar238 = ZEXT464((uint)local_ba0);
                  if (local_ba0 < fVar133) {
                    bVar101 = false;
                    uVar95 = 0;
                  }
                  else {
                    fVar135 = *(float *)(ray + k * 4 + 0x80);
                    if (fVar135 < local_ba0) {
                      bVar101 = false;
                      uVar95 = 0;
                    }
                    else {
                      bVar101 = false;
                      if (fVar221 < 0.0) {
                        uVar95 = 0;
                      }
                      else if (1.0 < fVar221) {
                        uVar95 = 0;
                        bVar101 = false;
                      }
                      else {
                        auVar144 = vrsqrtss_avx(auVar144,auVar144);
                        fVar326 = auVar144._0_4_;
                        pGVar11 = (context->scene->geometries).items[local_958].ptr;
                        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                          uVar95 = 0;
                        }
                        else {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar144 = ZEXT416((uint)(fVar326 * 1.5 +
                                                     fVar222 * -0.5 * fVar326 * fVar326 * fVar326));
                            auVar144 = vshufps_avx(auVar144,auVar144,0);
                            auVar145._0_4_ = auVar144._0_4_ * (float)local_9e0._0_4_;
                            auVar145._4_4_ = auVar144._4_4_ * (float)local_9e0._4_4_;
                            auVar145._8_4_ = auVar144._8_4_ * fStack_9d8;
                            auVar145._12_4_ = auVar144._12_4_ * fStack_9d4;
                            auVar324 = ZEXT1664(auVar366);
                            auVar109._0_4_ = auVar366._0_4_ + auVar17._0_4_ * auVar145._0_4_;
                            auVar109._4_4_ = auVar366._4_4_ + auVar17._4_4_ * auVar145._4_4_;
                            auVar109._8_4_ = auVar366._8_4_ + auVar17._8_4_ * auVar145._8_4_;
                            auVar109._12_4_ = auVar366._12_4_ + auVar17._12_4_ * auVar145._12_4_;
                            auVar144 = vshufps_avx(auVar145,auVar145,0xc9);
                            auVar141 = vshufps_avx(auVar366,auVar366,0xc9);
                            auVar146._0_4_ = auVar141._0_4_ * auVar145._0_4_;
                            auVar146._4_4_ = auVar141._4_4_ * auVar145._4_4_;
                            auVar146._8_4_ = auVar141._8_4_ * auVar145._8_4_;
                            auVar146._12_4_ = auVar141._12_4_ * auVar145._12_4_;
                            auVar183._0_4_ = auVar366._0_4_ * auVar144._0_4_;
                            auVar183._4_4_ = auVar366._4_4_ * auVar144._4_4_;
                            auVar183._8_4_ = auVar366._8_4_ * auVar144._8_4_;
                            auVar183._12_4_ = auVar366._12_4_ * auVar144._12_4_;
                            auVar113 = vsubps_avx(auVar183,auVar146);
                            auVar144 = vshufps_avx(auVar113,auVar113,0xc9);
                            auVar141 = vshufps_avx(auVar109,auVar109,0xc9);
                            auVar184._0_4_ = auVar141._0_4_ * auVar144._0_4_;
                            auVar184._4_4_ = auVar141._4_4_ * auVar144._4_4_;
                            auVar184._8_4_ = auVar141._8_4_ * auVar144._8_4_;
                            auVar184._12_4_ = auVar141._12_4_ * auVar144._12_4_;
                            auVar144 = vshufps_avx(auVar113,auVar113,0xd2);
                            auVar110._0_4_ = auVar109._0_4_ * auVar144._0_4_;
                            auVar110._4_4_ = auVar109._4_4_ * auVar144._4_4_;
                            auVar110._8_4_ = auVar109._8_4_ * auVar144._8_4_;
                            auVar110._12_4_ = auVar109._12_4_ * auVar144._12_4_;
                            auVar144 = vsubps_avx(auVar184,auVar110);
                            local_6d0 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0)
                            ;
                            local_700 = (RTCHitN  [16])vshufps_avx(auVar144,auVar144,0x55);
                            auStack_6f0 = vshufps_avx(auVar144,auVar144,0xaa);
                            local_6e0 = vshufps_avx(auVar144,auVar144,0);
                            local_6c0 = ZEXT816(0) << 0x20;
                            local_6b0 = local_720._0_8_;
                            uStack_6a8 = local_720._8_8_;
                            local_6a0 = local_710._0_8_;
                            uStack_698 = local_710._8_8_;
                            uVar91 = context->user->instID[0];
                            _local_690 = CONCAT44(uVar91,uVar91);
                            _uStack_688 = CONCAT44(uVar91,uVar91);
                            uVar91 = context->user->instPrimID[0];
                            _uStack_680 = CONCAT44(uVar91,uVar91);
                            _uStack_678 = CONCAT44(uVar91,uVar91);
                            *(float *)(ray + k * 4 + 0x80) = local_ba0;
                            local_ae0 = *local_960;
                            uStack_ad8 = local_960[1];
                            local_950.valid = (int *)&local_ae0;
                            local_950.geometryUserPtr = pGVar11->userPtr;
                            local_950.context = context->user;
                            local_950.hit = local_700;
                            local_950.N = 4;
                            local_950.ray = (RTCRayN *)ray;
                            if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar324 = ZEXT1664(auVar366);
                              (*pGVar11->occlusionFilterN)(&local_950);
                              auVar369 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar169 = (float)local_860._0_4_;
                              fVar171 = (float)local_860._4_4_;
                              fVar207 = fStack_858;
                              fVar220 = fStack_854;
                              fVar223 = fStack_850;
                              fVar239 = fStack_84c;
                              fVar241 = fStack_848;
                              fVar242 = (float)local_840._0_4_;
                              fVar246 = (float)local_840._4_4_;
                              fVar259 = fStack_838;
                              fVar261 = fStack_834;
                              fVar263 = fStack_830;
                              fVar243 = fStack_82c;
                              fVar245 = fStack_828;
                            }
                            auVar85._8_8_ = uStack_ad8;
                            auVar85._0_8_ = local_ae0;
                            if (auVar85 == (undefined1  [16])0x0) {
                              auVar144 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                              auVar144 = auVar144 ^ _DAT_01febe20;
                              fVar277 = (float)local_a00._0_4_;
                              fVar279 = (float)local_a00._4_4_;
                              fVar281 = fStack_9f8;
                              fVar283 = fStack_9f4;
                              fVar285 = fStack_9f0;
                              fVar287 = fStack_9ec;
                              fVar314 = fStack_9e8;
                            }
                            else {
                              p_Var15 = context->args->filter;
                              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar324 = ZEXT1664(auVar324._0_16_);
                                (*p_Var15)(&local_950);
                                auVar369 = ZEXT1664(CONCAT412(0x7fffffff,
                                                              CONCAT48(0x7fffffff,0x7fffffff7fffffff
                                                                      )));
                                fVar169 = (float)local_860._0_4_;
                                fVar171 = (float)local_860._4_4_;
                                fVar207 = fStack_858;
                                fVar220 = fStack_854;
                                fVar223 = fStack_850;
                                fVar239 = fStack_84c;
                                fVar241 = fStack_848;
                                fVar242 = (float)local_840._0_4_;
                                fVar246 = (float)local_840._4_4_;
                                fVar259 = fStack_838;
                                fVar261 = fStack_834;
                                fVar263 = fStack_830;
                                fVar243 = fStack_82c;
                                fVar245 = fStack_828;
                              }
                              auVar86._8_8_ = uStack_ad8;
                              auVar86._0_8_ = local_ae0;
                              auVar141 = vpcmpeqd_avx((undefined1  [16])0x0,auVar86);
                              auVar144 = auVar141 ^ _DAT_01febe20;
                              auVar185._8_4_ = 0xff800000;
                              auVar185._0_8_ = 0xff800000ff800000;
                              auVar185._12_4_ = 0xff800000;
                              auVar141 = vblendvps_avx(auVar185,*(undefined1 (*) [16])
                                                                 (local_950.ray + 0x80),auVar141);
                              *(undefined1 (*) [16])(local_950.ray + 0x80) = auVar141;
                              fVar277 = (float)local_a00._0_4_;
                              fVar279 = (float)local_a00._4_4_;
                              fVar281 = fStack_9f8;
                              fVar283 = fStack_9f4;
                              fVar285 = fStack_9f0;
                              fVar287 = fStack_9ec;
                              fVar314 = fStack_9e8;
                            }
                            auVar238 = ZEXT464((uint)local_ba0);
                            auVar147._8_8_ = 0x100000001;
                            auVar147._0_8_ = 0x100000001;
                            bVar101 = (auVar147 & auVar144) != (undefined1  [16])0x0;
                            uVar95 = (ulong)bVar101;
                            if (!bVar101) {
                              *(float *)(ray + k * 4 + 0x80) = fVar135;
                            }
                            bVar101 = false;
                            goto LAB_01071d6e;
                          }
                          uVar95 = 1;
                        }
                        bVar101 = false;
                      }
                    }
                  }
                }
              }
LAB_01071d6e:
              auVar373 = ZEXT464((uint)fVar221);
              bVar94 = (byte)uVar95;
              if (!bVar101) goto LAB_01072153;
              lVar96 = lVar96 + -1;
            } while (lVar96 != 0);
            bVar94 = 0;
            fVar277 = (float)local_a00._0_4_;
            fVar279 = (float)local_a00._4_4_;
            fVar281 = fStack_9f8;
            fVar283 = fStack_9f4;
            fVar285 = fStack_9f0;
            fVar287 = fStack_9ec;
            fVar314 = fStack_9e8;
LAB_01072153:
            uVar95 = (ulong)(bVar94 & 1);
            uVar99 = CONCAT71(local_780._1_7_,local_780[0] | bVar94 & 1);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar126._4_4_ = uVar8;
            auVar126._0_4_ = uVar8;
            auVar126._8_4_ = uVar8;
            auVar126._12_4_ = uVar8;
            auVar126._16_4_ = uVar8;
            auVar126._20_4_ = uVar8;
            auVar126._24_4_ = uVar8;
            auVar126._28_4_ = uVar8;
            auVar125 = vcmpps_avx(_local_7c0,auVar126,2);
            auVar118 = vandps_avx(auVar125,local_580);
            auVar238 = ZEXT3264(auVar118);
            auVar21 = local_580 & auVar125;
            uVar100 = local_5c0;
            auVar256 = local_ac0;
            auVar276 = local_980;
            local_580 = auVar118;
          } while ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar21 >> 0x7f,0) != '\0') ||
                     (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar21 >> 0xbf,0) != '\0') ||
                   (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar21[0x1f] < '\0');
        }
        auVar127._0_4_ =
             fVar277 * (float)local_7e0._0_4_ +
             fVar169 * (float)local_5e0._0_4_ + fVar242 * (float)local_600._0_4_;
        auVar127._4_4_ =
             fVar279 * (float)local_7e0._4_4_ +
             fVar171 * (float)local_5e0._4_4_ + fVar246 * (float)local_600._4_4_;
        auVar127._8_4_ = fVar281 * fStack_7d8 + fVar207 * fStack_5d8 + fVar259 * fStack_5f8;
        auVar127._12_4_ = fVar283 * fStack_7d4 + fVar220 * fStack_5d4 + fVar261 * fStack_5f4;
        auVar127._16_4_ = fVar285 * fStack_7d0 + fVar223 * fStack_5d0 + fVar263 * fStack_5f0;
        auVar127._20_4_ = fVar287 * fStack_7cc + fVar239 * fStack_5cc + fVar243 * fStack_5ec;
        auVar127._24_4_ = fVar314 * fStack_7c8 + fVar241 * fStack_5c8 + fVar245 * fStack_5e8;
        auVar127._28_4_ = auVar125._28_4_ + auVar125._28_4_ + auVar238._28_4_;
        auVar160._8_4_ = 0x7fffffff;
        auVar160._0_8_ = 0x7fffffff7fffffff;
        auVar160._12_4_ = 0x7fffffff;
        auVar160._16_4_ = 0x7fffffff;
        auVar160._20_4_ = 0x7fffffff;
        auVar160._24_4_ = 0x7fffffff;
        auVar160._28_4_ = 0x7fffffff;
        auVar125 = vandps_avx(auVar127,auVar160);
        auVar161._8_4_ = 0x3e99999a;
        auVar161._0_8_ = 0x3e99999a3e99999a;
        auVar161._12_4_ = 0x3e99999a;
        auVar161._16_4_ = 0x3e99999a;
        auVar161._20_4_ = 0x3e99999a;
        auVar161._24_4_ = 0x3e99999a;
        auVar161._28_4_ = 0x3e99999a;
        auVar125 = vcmpps_avx(auVar125,auVar161,1);
        auVar118 = vorps_avx(auVar125,local_520);
        auVar162._0_4_ = (float)local_900._0_4_ + auVar256._0_4_;
        auVar162._4_4_ = (float)local_900._4_4_ + auVar256._4_4_;
        auVar162._8_4_ = fStack_8f8 + auVar256._8_4_;
        auVar162._12_4_ = fStack_8f4 + auVar256._12_4_;
        auVar162._16_4_ = fStack_8f0 + auVar256._16_4_;
        auVar162._20_4_ = fStack_8ec + auVar256._20_4_;
        auVar162._24_4_ = fStack_8e8 + auVar256._24_4_;
        auVar162._28_4_ = fStack_8e4 + auVar256._28_4_;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar197._4_4_ = uVar8;
        auVar197._0_4_ = uVar8;
        auVar197._8_4_ = uVar8;
        auVar197._12_4_ = uVar8;
        auVar197._16_4_ = uVar8;
        auVar197._20_4_ = uVar8;
        auVar197._24_4_ = uVar8;
        auVar197._28_4_ = uVar8;
        auVar125 = vcmpps_avx(auVar162,auVar197,2);
        _local_7c0 = vandps_avx(auVar125,auVar276);
        auVar163._8_4_ = 3;
        auVar163._0_8_ = 0x300000003;
        auVar163._12_4_ = 3;
        auVar163._16_4_ = 3;
        auVar163._20_4_ = 3;
        auVar163._24_4_ = 3;
        auVar163._28_4_ = 3;
        auVar198._8_4_ = 2;
        auVar198._0_8_ = 0x200000002;
        auVar198._12_4_ = 2;
        auVar198._16_4_ = 2;
        auVar198._20_4_ = 2;
        auVar198._24_4_ = 2;
        auVar198._28_4_ = 2;
        auVar125 = vblendvps_avx(auVar198,auVar163,auVar118);
        auVar144 = vpcmpgtd_avx(auVar125._16_16_,local_540);
        auVar141 = vpshufd_avx(local_500._0_16_,0);
        auVar141 = vpcmpgtd_avx(auVar125._0_16_,auVar141);
        auVar164._16_16_ = auVar144;
        auVar164._0_16_ = auVar141;
        _local_7e0 = vblendps_avx(ZEXT1632(auVar141),auVar164,0xf0);
        auVar125 = vandnps_avx(_local_7e0,_local_7c0);
        auVar118 = _local_7c0 & ~_local_7e0;
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          local_8a0 = _local_2a0;
          local_760._4_4_ = (float)local_900._4_4_ + (float)local_2a0._4_4_;
          local_760._0_4_ = (float)local_900._0_4_ + (float)local_2a0._0_4_;
          fStack_758 = fStack_8f8 + fStack_298;
          fStack_754 = fStack_8f4 + fStack_294;
          fStack_750 = fStack_8f0 + fStack_290;
          fStack_74c = fStack_8ec + fStack_28c;
          fStack_748 = fStack_8e8 + fStack_288;
          fStack_744 = fStack_8e4 + fStack_284;
          do {
            auVar230 = auVar369._0_16_;
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar118 = vblendvps_avx(auVar165,local_8a0,auVar125);
            auVar21 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar21 = vminps_avx(auVar118,auVar21);
            auVar256 = vshufpd_avx(auVar21,auVar21,5);
            auVar21 = vminps_avx(auVar21,auVar256);
            auVar256 = vperm2f128_avx(auVar21,auVar21,1);
            auVar21 = vminps_avx(auVar21,auVar256);
            auVar21 = vcmpps_avx(auVar118,auVar21,0);
            auVar256 = auVar125 & auVar21;
            auVar118 = auVar125;
            if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar256 >> 0x7f,0) != '\0') ||
                  (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar256 >> 0xbf,0) != '\0') ||
                (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar256[0x1f] < '\0') {
              auVar118 = vandps_avx(auVar21,auVar125);
            }
            local_780._0_8_ = uVar99;
            uVar92 = vmovmskps_avx(auVar118);
            uVar91 = 0;
            if (uVar92 != 0) {
              for (; (uVar92 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
              }
            }
            uVar100 = (ulong)uVar91;
            local_5a0 = auVar125;
            *(undefined4 *)(local_5a0 + uVar100 * 4) = 0;
            fVar135 = local_4e0[uVar100];
            uVar91 = *(uint *)(local_280 + uVar100 * 4);
            fVar169 = local_ac8;
            if ((float)local_8e0._0_4_ < 0.0) {
              fVar169 = sqrtf((float)local_8e0._0_4_);
              auVar230._8_4_ = 0x7fffffff;
              auVar230._0_8_ = 0x7fffffff7fffffff;
              auVar230._12_4_ = 0x7fffffff;
            }
            auVar373 = ZEXT464((uint)fVar135);
            auVar238 = ZEXT464(uVar91);
            auVar141 = vminps_avx(_local_a10,_local_a30);
            auVar144 = vmaxps_avx(_local_a10,_local_a30);
            auVar113 = vminps_avx(_local_a20,_local_a40);
            auVar112 = vminps_avx(auVar141,auVar113);
            auVar141 = vmaxps_avx(_local_a20,_local_a40);
            auVar113 = vmaxps_avx(auVar144,auVar141);
            auVar144 = vandps_avx(auVar112,auVar230);
            auVar141 = vandps_avx(auVar113,auVar230);
            auVar144 = vmaxps_avx(auVar144,auVar141);
            auVar141 = vmovshdup_avx(auVar144);
            auVar141 = vmaxss_avx(auVar141,auVar144);
            auVar144 = vshufpd_avx(auVar144,auVar144,1);
            auVar144 = vmaxss_avx(auVar144,auVar141);
            local_9c0._0_4_ = auVar144._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar169 * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar113,auVar113,0xff);
            lVar96 = 5;
            do {
              local_ba0 = auVar238._0_4_;
              auVar144 = vshufps_avx(auVar238._0_16_,auVar238._0_16_,0);
              auVar111._0_4_ = auVar144._0_4_ * (float)local_8d0._0_4_ + 0.0;
              auVar111._4_4_ = auVar144._4_4_ * (float)local_8d0._4_4_ + 0.0;
              auVar111._8_4_ = auVar144._8_4_ * fStack_8c8 + 0.0;
              auVar111._12_4_ = auVar144._12_4_ * fStack_8c4 + 0.0;
              fVar221 = auVar373._0_4_;
              fVar220 = 1.0 - fVar221;
              fVar171 = fVar221 * 3.0;
              fVar135 = fVar171 + -5.0;
              fVar207 = fVar220 * fVar220;
              auVar144 = ZEXT416((uint)(fVar221 * fVar221 * -fVar220 * 0.5));
              auVar144 = vshufps_avx(auVar144,auVar144,0);
              auVar141 = ZEXT416((uint)((fVar207 * (fVar220 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar113 = ZEXT416((uint)((fVar221 * fVar221 * fVar135 + 2.0) * 0.5));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar112 = ZEXT416((uint)(fVar220 * fVar220 * -fVar221 * 0.5));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar186._0_4_ =
                   auVar112._0_4_ * (float)local_a10._0_4_ +
                   auVar113._0_4_ * (float)local_a30._0_4_ +
                   auVar141._0_4_ * (float)local_a20._0_4_ + auVar144._0_4_ * (float)local_a40._0_4_
              ;
              auVar186._4_4_ =
                   auVar112._4_4_ * (float)local_a10._4_4_ +
                   auVar113._4_4_ * (float)local_a30._4_4_ +
                   auVar141._4_4_ * (float)local_a20._4_4_ + auVar144._4_4_ * (float)local_a40._4_4_
              ;
              auVar186._8_4_ =
                   auVar112._8_4_ * fStack_a08 +
                   auVar113._8_4_ * fStack_a28 +
                   auVar141._8_4_ * fStack_a18 + auVar144._8_4_ * fStack_a38;
              auVar186._12_4_ =
                   auVar112._12_4_ * fStack_a04 +
                   auVar113._12_4_ * fStack_a24 +
                   auVar141._12_4_ * fStack_a14 + auVar144._12_4_ * fStack_a34;
              local_8c0._0_16_ = auVar186;
              auVar144 = vsubps_avx(auVar111,auVar186);
              _local_9e0 = auVar144;
              auVar144 = vdpps_avx(auVar144,auVar144,0x7f);
              fVar169 = fVar221 * -9.0 + 4.0;
              fVar222 = auVar144._0_4_;
              local_a60._0_4_ = fVar207;
              if (fVar222 < 0.0) {
                local_a80._0_16_ = ZEXT416((uint)fVar220);
                local_aa0._0_4_ = fVar171;
                local_ac0._0_4_ = fVar221 * 9.0;
                local_980._0_4_ = fVar135;
                local_9a0._0_16_ = ZEXT416((uint)fVar169);
                local_920._0_4_ = fVar220 * -2.0;
                fVar207 = sqrtf(fVar222);
                fVar239 = (float)local_ac0._0_4_;
                fVar223 = (float)local_920._0_4_;
                fVar135 = (float)local_980._0_4_;
                auVar141 = local_9a0._0_16_;
                fVar220 = (float)local_a80._0_4_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar144,auVar144);
                fVar207 = auVar141._0_4_;
                fVar239 = fVar221 * 9.0;
                fVar223 = fVar220 * -2.0;
                local_aa0._0_4_ = fVar171;
                auVar141 = ZEXT416((uint)fVar169);
              }
              auVar113 = ZEXT416((uint)((fVar221 * fVar221 + fVar221 * fVar223) * 0.5));
              auVar113 = vshufps_avx(auVar113,auVar113,0);
              auVar112 = ZEXT416((uint)(((fVar220 + fVar220) * ((float)local_aa0._0_4_ + 2.0) +
                                        fVar220 * fVar220 * -3.0) * 0.5));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar187 = ZEXT416((uint)((fVar135 * (fVar221 + fVar221) +
                                        fVar221 * (float)local_aa0._0_4_) * 0.5));
              auVar187 = vshufps_avx(auVar187,auVar187,0);
              auVar148 = ZEXT416((uint)((fVar221 * (fVar220 + fVar220) - (float)local_a60._0_4_) *
                                       0.5));
              auVar148 = vshufps_avx(auVar148,auVar148,0);
              auVar367._0_4_ =
                   (float)local_a10._0_4_ * auVar148._0_4_ +
                   (float)local_a30._0_4_ * auVar187._0_4_ +
                   (float)local_a40._0_4_ * auVar113._0_4_ + (float)local_a20._0_4_ * auVar112._0_4_
              ;
              auVar367._4_4_ =
                   (float)local_a10._4_4_ * auVar148._4_4_ +
                   (float)local_a30._4_4_ * auVar187._4_4_ +
                   (float)local_a40._4_4_ * auVar113._4_4_ + (float)local_a20._4_4_ * auVar112._4_4_
              ;
              auVar367._8_4_ =
                   fStack_a08 * auVar148._8_4_ +
                   fStack_a28 * auVar187._8_4_ +
                   fStack_a38 * auVar113._8_4_ + fStack_a18 * auVar112._8_4_;
              auVar367._12_4_ =
                   fStack_a04 * auVar148._12_4_ +
                   fStack_a24 * auVar187._12_4_ +
                   fStack_a34 * auVar113._12_4_ + fStack_a14 * auVar112._12_4_;
              auVar148 = vpermilps_avx(ZEXT416((uint)(fVar171 + -1.0)),0);
              auVar141 = vshufps_avx(auVar141,auVar141,0);
              auVar112 = vshufps_avx(ZEXT416((uint)(fVar239 + -5.0)),ZEXT416((uint)(fVar239 + -5.0))
                                     ,0);
              auVar113 = ZEXT416((uint)(fVar221 * -3.0 + 2.0));
              auVar187 = vshufps_avx(auVar113,auVar113,0);
              auVar113 = vdpps_avx(auVar367,auVar367,0x7f);
              auVar149._0_4_ =
                   (float)local_a10._0_4_ * auVar187._0_4_ +
                   (float)local_a30._0_4_ * auVar112._0_4_ +
                   (float)local_a20._0_4_ * auVar141._0_4_ + (float)local_a40._0_4_ * auVar148._0_4_
              ;
              auVar149._4_4_ =
                   (float)local_a10._4_4_ * auVar187._4_4_ +
                   (float)local_a30._4_4_ * auVar112._4_4_ +
                   (float)local_a20._4_4_ * auVar141._4_4_ + (float)local_a40._4_4_ * auVar148._4_4_
              ;
              auVar149._8_4_ =
                   fStack_a08 * auVar187._8_4_ +
                   fStack_a28 * auVar112._8_4_ +
                   fStack_a18 * auVar141._8_4_ + fStack_a38 * auVar148._8_4_;
              auVar149._12_4_ =
                   fStack_a04 * auVar187._12_4_ +
                   fStack_a24 * auVar112._12_4_ +
                   fStack_a14 * auVar141._12_4_ + fStack_a34 * auVar148._12_4_;
              auVar141 = vblendps_avx(auVar113,_DAT_01feba10,0xe);
              auVar112 = vrsqrtss_avx(auVar141,auVar141);
              fVar169 = auVar112._0_4_;
              fVar135 = auVar113._0_4_;
              auVar112 = vdpps_avx(auVar367,auVar149,0x7f);
              auVar187 = vshufps_avx(auVar113,auVar113,0);
              auVar150._0_4_ = auVar149._0_4_ * auVar187._0_4_;
              auVar150._4_4_ = auVar149._4_4_ * auVar187._4_4_;
              auVar150._8_4_ = auVar149._8_4_ * auVar187._8_4_;
              auVar150._12_4_ = auVar149._12_4_ * auVar187._12_4_;
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              auVar231._0_4_ = auVar367._0_4_ * auVar112._0_4_;
              auVar231._4_4_ = auVar367._4_4_ * auVar112._4_4_;
              auVar231._8_4_ = auVar367._8_4_ * auVar112._8_4_;
              auVar231._12_4_ = auVar367._12_4_ * auVar112._12_4_;
              auVar148 = vsubps_avx(auVar150,auVar231);
              auVar112 = vrcpss_avx(auVar141,auVar141);
              auVar141 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                    ZEXT416((uint)((float)local_740._0_4_ * local_ba0)));
              auVar112 = ZEXT416((uint)(auVar112._0_4_ * (2.0 - fVar135 * auVar112._0_4_)));
              auVar112 = vshufps_avx(auVar112,auVar112,0);
              uVar100 = CONCAT44(auVar367._4_4_,auVar367._0_4_);
              auVar297._0_8_ = uVar100 ^ 0x8000000080000000;
              auVar297._8_4_ = -auVar367._8_4_;
              auVar297._12_4_ = -auVar367._12_4_;
              auVar187 = ZEXT416((uint)(fVar169 * 1.5 + fVar135 * -0.5 * fVar169 * fVar169 * fVar169
                                       ));
              auVar187 = vshufps_avx(auVar187,auVar187,0);
              auVar213._0_4_ = auVar187._0_4_ * auVar148._0_4_ * auVar112._0_4_;
              auVar213._4_4_ = auVar187._4_4_ * auVar148._4_4_ * auVar112._4_4_;
              auVar213._8_4_ = auVar187._8_4_ * auVar148._8_4_ * auVar112._8_4_;
              auVar213._12_4_ = auVar187._12_4_ * auVar148._12_4_ * auVar112._12_4_;
              local_aa0._0_4_ = auVar367._0_4_ * auVar187._0_4_;
              local_aa0._4_4_ = auVar367._4_4_ * auVar187._4_4_;
              local_aa0._8_4_ = auVar367._8_4_ * auVar187._8_4_;
              local_aa0._12_4_ = auVar367._12_4_ * auVar187._12_4_;
              local_a60._0_4_ = auVar141._0_4_;
              if (fVar135 < 0.0) {
                local_a80._0_16_ = auVar297;
                local_ac0._0_16_ = auVar213;
                fVar169 = sqrtf(fVar135);
                auVar213 = local_ac0._0_16_;
                auVar297 = local_a80._0_16_;
                fVar135 = (float)local_a60._0_4_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                fVar169 = auVar113._0_4_;
                fVar135 = auVar141._0_4_;
              }
              auVar141 = vdpps_avx(_local_9e0,local_aa0._0_16_,0x7f);
              local_a80._0_4_ =
                   ((float)local_9c0._0_4_ / fVar169) * (fVar207 + 1.0) +
                   fVar135 + fVar207 * (float)local_9c0._0_4_;
              auVar113 = vdpps_avx(auVar297,local_aa0._0_16_,0x7f);
              auVar112 = vdpps_avx(_local_9e0,auVar213,0x7f);
              auVar187 = vdpps_avx(_local_8d0,local_aa0._0_16_,0x7f);
              auVar148 = vdpps_avx(_local_9e0,auVar297,0x7f);
              fVar169 = auVar113._0_4_ + auVar112._0_4_;
              fVar171 = auVar141._0_4_;
              auVar114._0_4_ = fVar171 * fVar171;
              auVar114._4_4_ = auVar141._4_4_ * auVar141._4_4_;
              auVar114._8_4_ = auVar141._8_4_ * auVar141._8_4_;
              auVar114._12_4_ = auVar141._12_4_ * auVar141._12_4_;
              auVar112 = vsubps_avx(auVar144,auVar114);
              local_aa0._0_16_ = ZEXT416((uint)fVar169);
              auVar113 = vdpps_avx(_local_9e0,_local_8d0,0x7f);
              fVar207 = auVar148._0_4_ - fVar171 * fVar169;
              fVar171 = auVar113._0_4_ - fVar171 * auVar187._0_4_;
              auVar113 = vrsqrtss_avx(auVar112,auVar112);
              fVar220 = auVar112._0_4_;
              fVar169 = auVar113._0_4_;
              fVar169 = fVar169 * 1.5 + fVar220 * -0.5 * fVar169 * fVar169 * fVar169;
              if (fVar220 < 0.0) {
                local_ac0._0_16_ = auVar187;
                local_980._0_4_ = fVar207;
                local_9a0._0_4_ = fVar171;
                local_920._0_4_ = fVar169;
                fVar220 = sqrtf(fVar220);
                fVar169 = (float)local_920._0_4_;
                fVar207 = (float)local_980._0_4_;
                fVar171 = (float)local_9a0._0_4_;
                auVar187 = local_ac0._0_16_;
                fVar135 = (float)local_a60._0_4_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar112,auVar112);
                fVar220 = auVar113._0_4_;
              }
              auVar324 = ZEXT1664(auVar144);
              auVar148 = vpermilps_avx(local_8c0._0_16_,0xff);
              auVar17 = vpermilps_avx(auVar367,0xff);
              fVar207 = fVar207 * fVar169 - auVar17._0_4_;
              auVar232._0_8_ = auVar187._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar187._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar187._12_4_ ^ 0x80000000;
              auVar250._0_4_ = -fVar207;
              auVar250._4_4_ = 0x80000000;
              auVar250._8_4_ = 0x80000000;
              auVar250._12_4_ = 0x80000000;
              auVar113 = vinsertps_avx(ZEXT416((uint)(fVar171 * fVar169)),auVar232,0x10);
              auVar112 = vmovsldup_avx(ZEXT416((uint)(local_aa0._0_4_ * fVar171 * fVar169 -
                                                     auVar187._0_4_ * fVar207)));
              auVar113 = vdivps_avx(auVar113,auVar112);
              auVar148 = ZEXT416((uint)(fVar220 - auVar148._0_4_));
              auVar187 = vinsertps_avx(auVar141,auVar148,0x10);
              auVar214._0_4_ = auVar187._0_4_ * auVar113._0_4_;
              auVar214._4_4_ = auVar187._4_4_ * auVar113._4_4_;
              auVar214._8_4_ = auVar187._8_4_ * auVar113._8_4_;
              auVar214._12_4_ = auVar187._12_4_ * auVar113._12_4_;
              auVar113 = vinsertps_avx(auVar250,local_aa0._0_16_,0x1c);
              auVar113 = vdivps_avx(auVar113,auVar112);
              auVar112 = vhaddps_avx(auVar214,auVar214);
              auVar188._0_4_ = auVar187._0_4_ * auVar113._0_4_;
              auVar188._4_4_ = auVar187._4_4_ * auVar113._4_4_;
              auVar188._8_4_ = auVar187._8_4_ * auVar113._8_4_;
              auVar188._12_4_ = auVar187._12_4_ * auVar113._12_4_;
              auVar113 = vhaddps_avx(auVar188,auVar188);
              fVar221 = fVar221 - auVar112._0_4_;
              local_ba0 = local_ba0 - auVar113._0_4_;
              auVar238 = ZEXT464((uint)local_ba0);
              auVar233._8_4_ = 0x7fffffff;
              auVar233._0_8_ = 0x7fffffff7fffffff;
              auVar233._12_4_ = 0x7fffffff;
              auVar369 = ZEXT1664(auVar233);
              auVar141 = vandps_avx(auVar141,auVar233);
              bVar101 = true;
              if (auVar141._0_4_ < (float)local_a80._0_4_) {
                auVar141 = vandps_avx(auVar148,auVar233);
                if (auVar141._0_4_ <
                    (float)local_880._0_4_ * 1.9073486e-06 + fVar135 + (float)local_a80._0_4_) {
                  local_ba0 = local_ba0 + (float)local_810._0_4_;
                  auVar238 = ZEXT464((uint)local_ba0);
                  if ((((fVar133 <= local_ba0) &&
                       (fVar135 = *(float *)(ray + k * 4 + 0x80), local_ba0 <= fVar135)) &&
                      (0.0 <= fVar221)) && (fVar221 <= 1.0)) {
                    auVar141 = vrsqrtss_avx(auVar144,auVar144);
                    fVar169 = auVar141._0_4_;
                    pGVar11 = (context->scene->geometries).items[local_958].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar95 = 1;
                      }
                      else {
                        auVar141 = ZEXT416((uint)(fVar169 * 1.5 +
                                                 fVar222 * -0.5 * fVar169 * fVar169 * fVar169));
                        auVar141 = vshufps_avx(auVar141,auVar141,0);
                        auVar151._0_4_ = auVar141._0_4_ * (float)local_9e0._0_4_;
                        auVar151._4_4_ = auVar141._4_4_ * (float)local_9e0._4_4_;
                        auVar151._8_4_ = auVar141._8_4_ * fStack_9d8;
                        auVar151._12_4_ = auVar141._12_4_ * fStack_9d4;
                        auVar115._0_4_ = auVar367._0_4_ + auVar17._0_4_ * auVar151._0_4_;
                        auVar115._4_4_ = auVar367._4_4_ + auVar17._4_4_ * auVar151._4_4_;
                        auVar115._8_4_ = auVar367._8_4_ + auVar17._8_4_ * auVar151._8_4_;
                        auVar115._12_4_ = auVar367._12_4_ + auVar17._12_4_ * auVar151._12_4_;
                        auVar141 = vshufps_avx(auVar151,auVar151,0xc9);
                        auVar113 = vshufps_avx(auVar367,auVar367,0xc9);
                        auVar152._0_4_ = auVar113._0_4_ * auVar151._0_4_;
                        auVar152._4_4_ = auVar113._4_4_ * auVar151._4_4_;
                        auVar152._8_4_ = auVar113._8_4_ * auVar151._8_4_;
                        auVar152._12_4_ = auVar113._12_4_ * auVar151._12_4_;
                        auVar189._0_4_ = auVar367._0_4_ * auVar141._0_4_;
                        auVar189._4_4_ = auVar367._4_4_ * auVar141._4_4_;
                        auVar189._8_4_ = auVar367._8_4_ * auVar141._8_4_;
                        auVar189._12_4_ = auVar367._12_4_ * auVar141._12_4_;
                        auVar112 = vsubps_avx(auVar189,auVar152);
                        auVar141 = vshufps_avx(auVar112,auVar112,0xc9);
                        auVar113 = vshufps_avx(auVar115,auVar115,0xc9);
                        auVar190._0_4_ = auVar113._0_4_ * auVar141._0_4_;
                        auVar190._4_4_ = auVar113._4_4_ * auVar141._4_4_;
                        auVar190._8_4_ = auVar113._8_4_ * auVar141._8_4_;
                        auVar190._12_4_ = auVar113._12_4_ * auVar141._12_4_;
                        auVar141 = vshufps_avx(auVar112,auVar112,0xd2);
                        auVar116._0_4_ = auVar115._0_4_ * auVar141._0_4_;
                        auVar116._4_4_ = auVar115._4_4_ * auVar141._4_4_;
                        auVar116._8_4_ = auVar115._8_4_ * auVar141._8_4_;
                        auVar116._12_4_ = auVar115._12_4_ * auVar141._12_4_;
                        auVar141 = vsubps_avx(auVar190,auVar116);
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar141,auVar141,0x55);
                        auStack_6f0 = vshufps_avx(auVar141,auVar141,0xaa);
                        local_6e0 = vshufps_avx(auVar141,auVar141,0);
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar91 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar91,uVar91);
                        _uStack_688 = CONCAT44(uVar91,uVar91);
                        uVar91 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar91,uVar91);
                        _uStack_678 = CONCAT44(uVar91,uVar91);
                        *(float *)(ray + k * 4 + 0x80) = local_ba0;
                        local_ae0 = *local_960;
                        uStack_ad8 = local_960[1];
                        local_950.valid = (int *)&local_ae0;
                        local_950.geometryUserPtr = pGVar11->userPtr;
                        local_950.context = context->user;
                        local_950.hit = local_700;
                        local_950.N = 4;
                        local_950.ray = (RTCRayN *)ray;
                        if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar324 = ZEXT1664(auVar144);
                          (*pGVar11->occlusionFilterN)(&local_950);
                          auVar369 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar87._8_8_ = uStack_ad8;
                        auVar87._0_8_ = local_ae0;
                        if (auVar87 == (undefined1  [16])0x0) {
                          auVar144 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar144 = auVar144 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar324 = ZEXT1664(auVar324._0_16_);
                            (*p_Var15)(&local_950);
                            auVar369 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar88._8_8_ = uStack_ad8;
                          auVar88._0_8_ = local_ae0;
                          auVar141 = vpcmpeqd_avx((undefined1  [16])0x0,auVar88);
                          auVar144 = auVar141 ^ _DAT_01febe20;
                          auVar191._8_4_ = 0xff800000;
                          auVar191._0_8_ = 0xff800000ff800000;
                          auVar191._12_4_ = 0xff800000;
                          auVar141 = vblendvps_avx(auVar191,*(undefined1 (*) [16])
                                                             (local_950.ray + 0x80),auVar141);
                          *(undefined1 (*) [16])(local_950.ray + 0x80) = auVar141;
                        }
                        auVar153._8_8_ = 0x100000001;
                        auVar153._0_8_ = 0x100000001;
                        bVar101 = (auVar153 & auVar144) != (undefined1  [16])0x0;
                        uVar95 = (ulong)bVar101;
                        if (!bVar101) {
                          *(float *)(ray + k * 4 + 0x80) = fVar135;
                        }
                      }
                      auVar238 = ZEXT464((uint)local_ba0);
                      bVar101 = false;
                      goto LAB_01072a2b;
                    }
                  }
                  bVar101 = false;
                  uVar95 = 0;
                }
              }
LAB_01072a2b:
              auVar373 = ZEXT464((uint)fVar221);
              bVar94 = (byte)uVar95;
              if (!bVar101) goto LAB_01072d5a;
              lVar96 = lVar96 + -1;
            } while (lVar96 != 0);
            bVar94 = 0;
LAB_01072d5a:
            uVar95 = (ulong)(bVar94 & 1);
            uVar99 = CONCAT71(local_780._1_7_,local_780[0] | bVar94 & 1);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar128._4_4_ = uVar8;
            auVar128._0_4_ = uVar8;
            auVar128._8_4_ = uVar8;
            auVar128._12_4_ = uVar8;
            auVar128._16_4_ = uVar8;
            auVar128._20_4_ = uVar8;
            auVar128._24_4_ = uVar8;
            auVar128._28_4_ = uVar8;
            auVar118 = vcmpps_avx(_local_760,auVar128,2);
            auVar125 = vandps_avx(auVar118,local_5a0);
            local_5a0 = local_5a0 & auVar118;
            uVar100 = local_5c0;
          } while ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(local_5a0 >> 0x7f,0) != '\0') ||
                     (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(local_5a0 >> 0xbf,0) != '\0') ||
                   (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   local_5a0[0x1f] < '\0');
        }
        auVar125 = vandps_avx(local_640,local_620);
        auVar118 = vandps_avx(_local_7e0,_local_7c0);
        auVar199._0_4_ = (float)local_900._0_4_ + local_2e0._0_4_;
        auVar199._4_4_ = (float)local_900._4_4_ + local_2e0._4_4_;
        auVar199._8_4_ = fStack_8f8 + local_2e0._8_4_;
        auVar199._12_4_ = fStack_8f4 + local_2e0._12_4_;
        auVar199._16_4_ = fStack_8f0 + local_2e0._16_4_;
        auVar199._20_4_ = fStack_8ec + local_2e0._20_4_;
        auVar199._24_4_ = fStack_8e8 + local_2e0._24_4_;
        auVar199._28_4_ = fStack_8e4 + local_2e0._28_4_;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar237._4_4_ = uVar8;
        auVar237._0_4_ = uVar8;
        auVar237._8_4_ = uVar8;
        auVar237._12_4_ = uVar8;
        auVar237._16_4_ = uVar8;
        auVar237._20_4_ = uVar8;
        auVar237._24_4_ = uVar8;
        auVar237._28_4_ = uVar8;
        auVar21 = vcmpps_avx(auVar199,auVar237,2);
        auVar125 = vandps_avx(auVar21,auVar125);
        auVar257._0_4_ = (float)local_900._0_4_ + local_2a0._0_4_;
        auVar257._4_4_ = (float)local_900._4_4_ + local_2a0._4_4_;
        auVar257._8_4_ = fStack_8f8 + local_2a0._8_4_;
        auVar257._12_4_ = fStack_8f4 + local_2a0._12_4_;
        auVar257._16_4_ = fStack_8f0 + local_2a0._16_4_;
        auVar257._20_4_ = fStack_8ec + local_2a0._20_4_;
        auVar257._24_4_ = fStack_8e8 + local_2a0._24_4_;
        auVar257._28_4_ = fStack_8e4 + local_2a0._28_4_;
        auVar21 = vcmpps_avx(auVar257,auVar237,2);
        auVar118 = vandps_avx(auVar21,auVar118);
        auVar118 = vorps_avx(auVar125,auVar118);
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar118;
          auVar125 = vblendvps_avx(_local_2a0,_local_2e0,auVar125);
          *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar125;
          uVar9 = vmovlps_avx(local_800);
          *(undefined8 *)(afStack_140 + uVar93 * 0x18) = uVar9;
          auStack_138[uVar93 * 0x18] = (int)uVar100 + 1;
          uVar93 = (ulong)((int)uVar93 + 1);
        }
        auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar369 = ZEXT3264(local_7a0);
      }
    }
    do {
      uVar91 = (uint)uVar93;
      if (uVar91 == 0) {
        if ((uVar99 & 1) != 0) {
          return local_bd1;
        }
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar117._4_4_ = uVar8;
        auVar117._0_4_ = uVar8;
        auVar117._8_4_ = uVar8;
        auVar117._12_4_ = uVar8;
        auVar293 = vcmpps_avx(local_490,auVar117,2);
        uVar91 = vmovmskps_avx(auVar293);
        uVar91 = (uint)local_7e8 - 1 & (uint)local_7e8 & uVar91;
        local_bd1 = uVar91 != 0;
        if (!local_bd1) {
          return local_bd1;
        }
        goto LAB_010700f2;
      }
      uVar93 = (ulong)(uVar91 - 1);
      lVar96 = uVar93 * 0x60;
      auVar125 = *(undefined1 (*) [32])(auStack_160 + lVar96);
      auVar123._0_4_ = (float)local_900._0_4_ + auVar125._0_4_;
      auVar123._4_4_ = (float)local_900._4_4_ + auVar125._4_4_;
      auVar123._8_4_ = fStack_8f8 + auVar125._8_4_;
      auVar123._12_4_ = fStack_8f4 + auVar125._12_4_;
      auVar123._16_4_ = fStack_8f0 + auVar125._16_4_;
      auVar123._20_4_ = fStack_8ec + auVar125._20_4_;
      auVar123._24_4_ = fStack_8e8 + auVar125._24_4_;
      auVar123._28_4_ = fStack_8e4 + auVar125._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar218._4_4_ = uVar8;
      auVar218._0_4_ = uVar8;
      auVar218._8_4_ = uVar8;
      auVar218._12_4_ = uVar8;
      auVar218._16_4_ = uVar8;
      auVar218._20_4_ = uVar8;
      auVar218._24_4_ = uVar8;
      auVar218._28_4_ = uVar8;
      auVar118 = vcmpps_avx(auVar123,auVar218,2);
      _local_700 = vandps_avx(auVar118,*(undefined1 (*) [32])(auStack_180 + lVar96));
      auVar118 = *(undefined1 (*) [32])(auStack_180 + lVar96) & auVar118;
      bVar78 = (auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar79 = (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar77 = (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar76 = SUB321(auVar118 >> 0x7f,0) == '\0';
      bVar75 = (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar74 = SUB321(auVar118 >> 0xbf,0) == '\0';
      bVar72 = (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar101 = -1 < auVar118[0x1f];
      if (((((((!bVar78 || !bVar79) || !bVar77) || !bVar76) || !bVar75) || !bVar74) || !bVar72) ||
          !bVar101) {
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar125 = vblendvps_avx(auVar193,auVar125,_local_700);
        auVar118 = vshufps_avx(auVar125,auVar125,0xb1);
        auVar118 = vminps_avx(auVar125,auVar118);
        auVar21 = vshufpd_avx(auVar118,auVar118,5);
        auVar118 = vminps_avx(auVar118,auVar21);
        auVar21 = vperm2f128_avx(auVar118,auVar118,1);
        auVar118 = vminps_avx(auVar118,auVar21);
        auVar118 = vcmpps_avx(auVar125,auVar118,0);
        auVar21 = _local_700 & auVar118;
        auVar125 = _local_700;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0x7f,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0xbf,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar21[0x1f] < '\0') {
          auVar125 = vandps_avx(auVar118,_local_700);
        }
        fVar135 = afStack_140[uVar93 * 0x18 + 1];
        uVar100 = (ulong)auStack_138[uVar93 * 0x18];
        uVar97 = vmovmskps_avx(auVar125);
        uVar92 = 0;
        if (uVar97 != 0) {
          for (; (uVar97 >> uVar92 & 1) == 0; uVar92 = uVar92 + 1) {
          }
        }
        fVar169 = afStack_140[uVar93 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar92 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar96) = _local_700;
        uVar97 = uVar91 - 1;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar97 = uVar91;
        }
        auVar144 = vshufps_avx(ZEXT416((uint)(fVar135 - fVar169)),ZEXT416((uint)(fVar135 - fVar169))
                               ,0);
        local_2e0._4_4_ = fVar169 + auVar144._4_4_ * 0.14285715;
        local_2e0._0_4_ = fVar169 + auVar144._0_4_ * 0.0;
        fStack_2d8 = fVar169 + auVar144._8_4_ * 0.2857143;
        fStack_2d4 = fVar169 + auVar144._12_4_ * 0.42857146;
        fStack_2d0 = fVar169 + auVar144._0_4_ * 0.5714286;
        fStack_2cc = fVar169 + auVar144._4_4_ * 0.71428573;
        fStack_2c8 = fVar169 + auVar144._8_4_ * 0.8571429;
        fStack_2c4 = fVar169 + auVar144._12_4_;
        local_800._8_8_ = 0;
        local_800._0_8_ = *(ulong *)(local_2e0 + (ulong)uVar92 * 4);
        uVar93 = (ulong)uVar97;
      }
    } while (((((((bVar78 && bVar79) && bVar77) && bVar76) && bVar75) && bVar74) && bVar72) &&
             bVar101);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }